

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O3

bool embree::avx::CurveNiMBIntersector1<4>::
     occluded_n<embree::avx::OrientedCurve1Intersector1<embree::CatmullRomCurveT,7,8>,embree::avx::Occluded1Epilog1<true>>
               (Precalculations *pre,Ray *ray,RayQueryContext *context,Primitive *prim)

{
  long lVar1;
  long lVar2;
  float *pfVar3;
  undefined4 uVar4;
  undefined8 uVar5;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar6;
  Primitive PVar7;
  Geometry *pGVar8;
  __int_type_conflict _Var9;
  long lVar10;
  long lVar11;
  long lVar12;
  RTCFilterFunctionN p_Var13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  byte bVar58;
  uint uVar59;
  ulong uVar60;
  long lVar61;
  uint uVar62;
  bool bVar64;
  uint uVar65;
  long lVar66;
  undefined1 auVar67 [8];
  ulong uVar68;
  float fVar69;
  float fVar108;
  float fVar109;
  vint4 bi_1;
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar102 [32];
  undefined1 auVar86 [16];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  vint4 bi;
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar120 [16];
  undefined1 auVar139 [32];
  undefined1 auVar121 [16];
  undefined1 auVar140 [32];
  undefined1 auVar141 [32];
  undefined1 auVar142 [32];
  vint4 bi_2;
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [32];
  undefined1 auVar170 [32];
  float fVar171;
  float fVar172;
  float fVar185;
  float fVar187;
  vint4 ai_1;
  undefined1 auVar173 [16];
  float fVar189;
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  float fVar186;
  float fVar188;
  float fVar190;
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [32];
  float fVar191;
  float fVar192;
  float fVar193;
  float fVar214;
  float fVar217;
  vint4 ai_2;
  undefined1 auVar194 [16];
  float fVar220;
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  float fVar215;
  float fVar216;
  float fVar218;
  float fVar219;
  float fVar221;
  float fVar222;
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [32];
  undefined1 auVar213 [32];
  float fVar223;
  float fVar236;
  float fVar237;
  undefined1 auVar224 [16];
  float fVar238;
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  float fVar239;
  undefined1 auVar234 [32];
  undefined1 auVar235 [32];
  float fVar240;
  float fVar251;
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  undefined1 auVar252 [16];
  vint4 ai;
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  undefined1 auVar255 [16];
  undefined1 auVar256 [16];
  undefined1 auVar257 [16];
  undefined1 auVar258 [16];
  undefined1 auVar259 [16];
  undefined1 auVar260 [16];
  undefined1 auVar261 [16];
  undefined1 auVar262 [16];
  undefined1 auVar263 [32];
  float fVar264;
  undefined1 auVar265 [16];
  undefined1 auVar266 [16];
  undefined1 auVar267 [16];
  undefined1 auVar268 [16];
  undefined1 auVar269 [16];
  undefined1 auVar270 [16];
  undefined1 auVar271 [16];
  undefined1 auVar272 [16];
  undefined1 auVar273 [16];
  undefined1 auVar274 [16];
  undefined1 auVar275 [16];
  undefined1 auVar276 [16];
  undefined1 auVar277 [16];
  undefined1 auVar279 [16];
  undefined1 auVar280 [16];
  undefined1 auVar278 [16];
  undefined1 auVar281 [16];
  float fVar283;
  undefined1 auVar282 [32];
  float fVar284;
  undefined1 auVar285 [16];
  undefined1 auVar286 [16];
  undefined1 auVar288 [16];
  undefined1 auVar289 [16];
  undefined1 auVar290 [16];
  undefined1 auVar291 [16];
  undefined1 auVar292 [16];
  undefined1 auVar287 [16];
  undefined1 auVar293 [32];
  undefined1 auVar294 [32];
  undefined1 auVar295 [16];
  undefined1 auVar296 [16];
  undefined1 auVar297 [16];
  undefined1 auVar298 [16];
  undefined1 auVar299 [16];
  undefined1 auVar300 [16];
  undefined1 auVar302 [16];
  undefined1 auVar303 [16];
  undefined1 auVar304 [16];
  undefined1 auVar301 [16];
  undefined1 auVar305 [32];
  undefined1 auVar306 [16];
  undefined1 auVar307 [16];
  undefined1 auVar308 [16];
  undefined1 auVar309 [16];
  undefined1 auVar310 [16];
  undefined1 auVar311 [16];
  undefined1 auVar312 [32];
  float fVar318;
  undefined1 auVar313 [16];
  undefined1 auVar314 [16];
  undefined1 auVar315 [16];
  undefined1 auVar316 [16];
  float fVar319;
  undefined1 auVar317 [16];
  float fVar320;
  float fVar321;
  float fVar322;
  float fVar323;
  undefined1 auVar324 [16];
  undefined1 auVar325 [16];
  undefined1 auVar326 [16];
  float fVar327;
  undefined1 auVar328 [16];
  undefined1 auVar329 [16];
  undefined1 auVar330 [16];
  undefined1 auVar331 [16];
  undefined1 auVar332 [16];
  float fVar336;
  vfloat4 a0;
  undefined1 auVar334 [16];
  undefined1 auVar335 [16];
  vfloat_impl<4> p00;
  vfloat_impl<4> p02;
  vfloat_impl<4> p01;
  RTCFilterFunctionNArguments args;
  vfloat_impl<4> p03;
  uint mask_stack [4];
  BBox1f cu_stack [4];
  BBox1f cv_stack [4];
  undefined1 local_4e8 [8];
  float fStack_4e0;
  float fStack_4dc;
  undefined1 local_4d8 [8];
  float fStack_4d0;
  float fStack_4cc;
  undefined1 local_4c8 [8];
  float fStack_4c0;
  float fStack_4bc;
  int local_4ac;
  undefined1 local_4a8 [8];
  float fStack_4a0;
  float fStack_49c;
  float fStack_498;
  float fStack_494;
  float fStack_490;
  undefined1 local_488 [8];
  float fStack_480;
  float fStack_47c;
  undefined1 local_478 [8];
  float fStack_470;
  float fStack_46c;
  undefined1 local_468 [8];
  float fStack_460;
  float fStack_45c;
  undefined1 auStack_458 [16];
  undefined1 local_448 [8];
  float fStack_440;
  float fStack_43c;
  undefined1 local_438 [8];
  float fStack_430;
  float fStack_42c;
  undefined1 local_428 [8];
  float fStack_420;
  float fStack_41c;
  float fStack_418;
  float fStack_414;
  float fStack_410;
  ulong local_400;
  float local_3f8;
  float fStack_3f4;
  float fStack_3f0;
  float fStack_3ec;
  undefined1 local_3e8 [8];
  float fStack_3e0;
  float fStack_3dc;
  float fStack_3d8;
  float fStack_3d4;
  float fStack_3d0;
  undefined1 local_3c8 [8];
  float fStack_3c0;
  float fStack_3bc;
  float local_3b8;
  float fStack_3b4;
  float fStack_3b0;
  float fStack_3ac;
  undefined1 local_3a8 [8];
  float fStack_3a0;
  float fStack_39c;
  undefined1 local_398 [8];
  float fStack_390;
  float fStack_38c;
  undefined1 local_388 [8];
  float fStack_380;
  float fStack_37c;
  undefined1 local_378 [8];
  float fStack_370;
  float fStack_36c;
  undefined1 local_368 [8];
  float fStack_360;
  float fStack_35c;
  undefined1 local_358 [8];
  float fStack_350;
  float fStack_34c;
  undefined1 local_348 [8];
  float fStack_340;
  float fStack_33c;
  undefined1 local_338 [8];
  float fStack_330;
  float fStack_32c;
  undefined1 local_328 [8];
  float fStack_320;
  float fStack_31c;
  undefined1 local_318 [8];
  float fStack_310;
  float fStack_30c;
  undefined1 local_308 [8];
  float fStack_300;
  float fStack_2fc;
  undefined1 auStack_2f8 [16];
  ulong local_2e8;
  Primitive *local_2e0;
  RTCFilterFunctionNArguments local_2d8;
  undefined1 local_2a8 [16];
  undefined1 local_298 [8];
  float fStack_290;
  float fStack_28c;
  uint auStack_288 [4];
  undefined8 local_278;
  undefined4 local_270;
  undefined8 local_26c;
  undefined4 local_264;
  undefined4 local_260;
  uint local_25c;
  uint local_258;
  undefined1 local_248 [8];
  float fStack_240;
  float fStack_23c;
  undefined1 local_238 [8];
  float fStack_230;
  float fStack_22c;
  undefined1 local_228 [8];
  float fStack_220;
  float fStack_21c;
  undefined1 local_218 [8];
  float fStack_210;
  float fStack_20c;
  undefined1 local_208 [16];
  undefined1 local_1f8 [16];
  undefined1 local_1e8 [8];
  float fStack_1e0;
  float fStack_1dc;
  undefined1 local_1d8 [8];
  float fStack_1d0;
  float fStack_1cc;
  undefined1 local_1c8 [8];
  float fStack_1c0;
  float fStack_1bc;
  undefined1 local_1b8 [32];
  undefined1 local_198 [32];
  float afStack_178 [8];
  undefined1 local_158 [32];
  float local_138;
  float fStack_134;
  float fStack_130;
  float fStack_12c;
  float fStack_128;
  float fStack_124;
  float fStack_120;
  float fStack_11c;
  float local_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  float fStack_108;
  float fStack_104;
  float fStack_100;
  float fStack_fc;
  float local_f8;
  float fStack_f4;
  float fStack_f0;
  float fStack_ec;
  float fStack_e8;
  float fStack_e4;
  float fStack_e0;
  float fStack_dc;
  float local_d8;
  float fStack_d4;
  float fStack_d0;
  float fStack_cc;
  float fStack_c8;
  float fStack_c4;
  float fStack_c0;
  float fStack_bc;
  undefined1 local_b8 [32];
  undefined1 local_98 [32];
  undefined1 local_78 [32];
  ulong auStack_58 [5];
  ulong uVar63;
  undefined1 auVar250 [32];
  undefined1 auVar333 [32];
  
  PVar7 = prim[1];
  uVar60 = (ulong)(byte)PVar7;
  lVar61 = uVar60 * 0x25;
  fVar264 = *(float *)(prim + lVar61 + 0x12);
  auVar90 = vsubps_avx((undefined1  [16])(ray->org).field_0,
                       *(undefined1 (*) [16])(prim + lVar61 + 6));
  auVar110._0_4_ = fVar264 * auVar90._0_4_;
  auVar110._4_4_ = fVar264 * auVar90._4_4_;
  auVar110._8_4_ = fVar264 * auVar90._8_4_;
  auVar110._12_4_ = fVar264 * auVar90._12_4_;
  auVar253._0_4_ = fVar264 * (ray->dir).field_0.m128[0];
  auVar253._4_4_ = fVar264 * (ray->dir).field_0.m128[1];
  auVar253._8_4_ = fVar264 * (ray->dir).field_0.m128[2];
  auVar253._12_4_ = fVar264 * (ray->dir).field_0.m128[3];
  auVar90 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar60 * 4 + 6)));
  auVar90 = vcvtdq2ps_avx(auVar90);
  auVar247 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar60 * 5 + 6)));
  auVar247 = vcvtdq2ps_avx(auVar247);
  auVar167 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar60 * 6 + 6)));
  auVar167 = vcvtdq2ps_avx(auVar167);
  auVar275 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar60 * 0xf + 6)));
  auVar134 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar7 * 0x10 + 6)));
  auVar275 = vcvtdq2ps_avx(auVar275);
  auVar123 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar7 * 0x10 + uVar60 + 6)));
  auVar134 = vcvtdq2ps_avx(auVar134);
  auVar123 = vcvtdq2ps_avx(auVar123);
  auVar157 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar60 * 0x1a + 6)));
  auVar157 = vcvtdq2ps_avx(auVar157);
  auVar124 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar60 * 0x1b + 6)));
  auVar124 = vcvtdq2ps_avx(auVar124);
  auVar252 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar60 * 0x1c + 6)));
  auVar252 = vcvtdq2ps_avx(auVar252);
  auVar274 = vshufps_avx(auVar253,auVar253,0);
  auVar14 = vshufps_avx(auVar253,auVar253,0x55);
  auVar302 = vshufps_avx(auVar253,auVar253,0xaa);
  fVar264 = auVar302._0_4_;
  fVar69 = auVar302._4_4_;
  fVar108 = auVar302._8_4_;
  fVar109 = auVar302._12_4_;
  fVar191 = auVar14._0_4_;
  fVar214 = auVar14._4_4_;
  fVar217 = auVar14._8_4_;
  fVar220 = auVar14._12_4_;
  fVar171 = auVar274._0_4_;
  fVar185 = auVar274._4_4_;
  fVar187 = auVar274._8_4_;
  fVar189 = auVar274._12_4_;
  auVar313._0_4_ = fVar171 * auVar90._0_4_ + fVar191 * auVar247._0_4_ + fVar264 * auVar167._0_4_;
  auVar313._4_4_ = fVar185 * auVar90._4_4_ + fVar214 * auVar247._4_4_ + fVar69 * auVar167._4_4_;
  auVar313._8_4_ = fVar187 * auVar90._8_4_ + fVar217 * auVar247._8_4_ + fVar108 * auVar167._8_4_;
  auVar313._12_4_ = fVar189 * auVar90._12_4_ + fVar220 * auVar247._12_4_ + fVar109 * auVar167._12_4_
  ;
  auVar324._0_4_ = fVar171 * auVar275._0_4_ + fVar191 * auVar134._0_4_ + auVar123._0_4_ * fVar264;
  auVar324._4_4_ = fVar185 * auVar275._4_4_ + fVar214 * auVar134._4_4_ + auVar123._4_4_ * fVar69;
  auVar324._8_4_ = fVar187 * auVar275._8_4_ + fVar217 * auVar134._8_4_ + auVar123._8_4_ * fVar108;
  auVar324._12_4_ =
       fVar189 * auVar275._12_4_ + fVar220 * auVar134._12_4_ + auVar123._12_4_ * fVar109;
  auVar254._0_4_ = fVar171 * auVar157._0_4_ + fVar191 * auVar124._0_4_ + auVar252._0_4_ * fVar264;
  auVar254._4_4_ = fVar185 * auVar157._4_4_ + fVar214 * auVar124._4_4_ + auVar252._4_4_ * fVar69;
  auVar254._8_4_ = fVar187 * auVar157._8_4_ + fVar217 * auVar124._8_4_ + auVar252._8_4_ * fVar108;
  auVar254._12_4_ =
       fVar189 * auVar157._12_4_ + fVar220 * auVar124._12_4_ + auVar252._12_4_ * fVar109;
  auVar274 = vshufps_avx(auVar110,auVar110,0);
  auVar14 = vshufps_avx(auVar110,auVar110,0x55);
  auVar302 = vshufps_avx(auVar110,auVar110,0xaa);
  fVar264 = auVar302._0_4_;
  fVar69 = auVar302._4_4_;
  fVar108 = auVar302._8_4_;
  fVar109 = auVar302._12_4_;
  fVar191 = auVar14._0_4_;
  fVar214 = auVar14._4_4_;
  fVar217 = auVar14._8_4_;
  fVar220 = auVar14._12_4_;
  fVar171 = auVar274._0_4_;
  fVar185 = auVar274._4_4_;
  fVar187 = auVar274._8_4_;
  fVar189 = auVar274._12_4_;
  auVar111._0_4_ = fVar171 * auVar90._0_4_ + fVar191 * auVar247._0_4_ + fVar264 * auVar167._0_4_;
  auVar111._4_4_ = fVar185 * auVar90._4_4_ + fVar214 * auVar247._4_4_ + fVar69 * auVar167._4_4_;
  auVar111._8_4_ = fVar187 * auVar90._8_4_ + fVar217 * auVar247._8_4_ + fVar108 * auVar167._8_4_;
  auVar111._12_4_ = fVar189 * auVar90._12_4_ + fVar220 * auVar247._12_4_ + fVar109 * auVar167._12_4_
  ;
  auVar70._0_4_ = fVar171 * auVar275._0_4_ + auVar123._0_4_ * fVar264 + fVar191 * auVar134._0_4_;
  auVar70._4_4_ = fVar185 * auVar275._4_4_ + auVar123._4_4_ * fVar69 + fVar214 * auVar134._4_4_;
  auVar70._8_4_ = fVar187 * auVar275._8_4_ + auVar123._8_4_ * fVar108 + fVar217 * auVar134._8_4_;
  auVar70._12_4_ = fVar189 * auVar275._12_4_ + auVar123._12_4_ * fVar109 + fVar220 * auVar134._12_4_
  ;
  auVar265._8_4_ = 0x7fffffff;
  auVar265._0_8_ = 0x7fffffff7fffffff;
  auVar265._12_4_ = 0x7fffffff;
  auVar90 = vandps_avx(auVar313,auVar265);
  auVar194._8_4_ = 0x219392ef;
  auVar194._0_8_ = 0x219392ef219392ef;
  auVar194._12_4_ = 0x219392ef;
  auVar90 = vcmpps_avx(auVar90,auVar194,1);
  auVar247 = vblendvps_avx(auVar313,auVar194,auVar90);
  auVar90 = vandps_avx(auVar324,auVar265);
  auVar90 = vcmpps_avx(auVar90,auVar194,1);
  auVar167 = vblendvps_avx(auVar324,auVar194,auVar90);
  auVar90 = vandps_avx(auVar265,auVar254);
  auVar90 = vcmpps_avx(auVar90,auVar194,1);
  auVar90 = vblendvps_avx(auVar254,auVar194,auVar90);
  auVar143._0_4_ = fVar171 * auVar157._0_4_ + fVar191 * auVar124._0_4_ + auVar252._0_4_ * fVar264;
  auVar143._4_4_ = fVar185 * auVar157._4_4_ + fVar214 * auVar124._4_4_ + auVar252._4_4_ * fVar69;
  auVar143._8_4_ = fVar187 * auVar157._8_4_ + fVar217 * auVar124._8_4_ + auVar252._8_4_ * fVar108;
  auVar143._12_4_ =
       fVar189 * auVar157._12_4_ + fVar220 * auVar124._12_4_ + auVar252._12_4_ * fVar109;
  auVar275 = vrcpps_avx(auVar247);
  fVar171 = auVar275._0_4_;
  auVar173._0_4_ = fVar171 * auVar247._0_4_;
  fVar185 = auVar275._4_4_;
  auVar173._4_4_ = fVar185 * auVar247._4_4_;
  fVar187 = auVar275._8_4_;
  auVar173._8_4_ = fVar187 * auVar247._8_4_;
  fVar189 = auVar275._12_4_;
  auVar173._12_4_ = fVar189 * auVar247._12_4_;
  auVar266._8_4_ = 0x3f800000;
  auVar266._0_8_ = 0x3f8000003f800000;
  auVar266._12_4_ = 0x3f800000;
  auVar247 = vsubps_avx(auVar266,auVar173);
  fVar171 = fVar171 + fVar171 * auVar247._0_4_;
  fVar185 = fVar185 + fVar185 * auVar247._4_4_;
  fVar187 = fVar187 + fVar187 * auVar247._8_4_;
  fVar189 = fVar189 + fVar189 * auVar247._12_4_;
  auVar247 = vrcpps_avx(auVar167);
  fVar191 = auVar247._0_4_;
  auVar224._0_4_ = fVar191 * auVar167._0_4_;
  fVar214 = auVar247._4_4_;
  auVar224._4_4_ = fVar214 * auVar167._4_4_;
  fVar217 = auVar247._8_4_;
  auVar224._8_4_ = fVar217 * auVar167._8_4_;
  fVar220 = auVar247._12_4_;
  auVar224._12_4_ = fVar220 * auVar167._12_4_;
  auVar247 = vsubps_avx(auVar266,auVar224);
  fVar191 = fVar191 + fVar191 * auVar247._0_4_;
  fVar214 = fVar214 + fVar214 * auVar247._4_4_;
  fVar217 = fVar217 + fVar217 * auVar247._8_4_;
  fVar220 = fVar220 + fVar220 * auVar247._12_4_;
  auVar247 = vrcpps_avx(auVar90);
  fVar223 = auVar247._0_4_;
  auVar241._0_4_ = fVar223 * auVar90._0_4_;
  fVar236 = auVar247._4_4_;
  auVar241._4_4_ = fVar236 * auVar90._4_4_;
  fVar237 = auVar247._8_4_;
  auVar241._8_4_ = fVar237 * auVar90._8_4_;
  fVar238 = auVar247._12_4_;
  auVar241._12_4_ = fVar238 * auVar90._12_4_;
  auVar90 = vsubps_avx(auVar266,auVar241);
  fVar223 = fVar223 + fVar223 * auVar90._0_4_;
  fVar236 = fVar236 + fVar236 * auVar90._4_4_;
  fVar237 = fVar237 + fVar237 * auVar90._8_4_;
  fVar238 = fVar238 + fVar238 * auVar90._12_4_;
  auVar90 = ZEXT416((uint)(((ray->dir).field_0.m128[3] - *(float *)(prim + lVar61 + 0x16)) *
                          *(float *)(prim + lVar61 + 0x1a)));
  auVar167 = vshufps_avx(auVar90,auVar90,0);
  auVar90._8_8_ = 0;
  auVar90._0_8_ = *(ulong *)(prim + uVar60 * 7 + 6);
  auVar90 = vpmovsxwd_avx(auVar90);
  auVar90 = vcvtdq2ps_avx(auVar90);
  auVar247._8_8_ = 0;
  auVar247._0_8_ = *(ulong *)(prim + uVar60 * 0xb + 6);
  auVar247 = vpmovsxwd_avx(auVar247);
  auVar247 = vcvtdq2ps_avx(auVar247);
  auVar275 = vsubps_avx(auVar247,auVar90);
  fVar264 = auVar167._0_4_;
  fVar69 = auVar167._4_4_;
  fVar108 = auVar167._8_4_;
  fVar109 = auVar167._12_4_;
  auVar167._8_8_ = 0;
  auVar167._0_8_ = *(ulong *)(prim + uVar60 * 9 + 6);
  auVar247 = vpmovsxwd_avx(auVar167);
  auVar255._0_4_ = auVar275._0_4_ * fVar264 + auVar90._0_4_;
  auVar255._4_4_ = auVar275._4_4_ * fVar69 + auVar90._4_4_;
  auVar255._8_4_ = auVar275._8_4_ * fVar108 + auVar90._8_4_;
  auVar255._12_4_ = auVar275._12_4_ * fVar109 + auVar90._12_4_;
  auVar275._8_8_ = 0;
  auVar275._0_8_ = *(ulong *)(prim + uVar60 * 0xd + 6);
  auVar167 = vpmovsxwd_avx(auVar275);
  auVar90 = vcvtdq2ps_avx(auVar247);
  auVar247 = vcvtdq2ps_avx(auVar167);
  auVar247 = vsubps_avx(auVar247,auVar90);
  auVar267._0_4_ = auVar247._0_4_ * fVar264 + auVar90._0_4_;
  auVar267._4_4_ = auVar247._4_4_ * fVar69 + auVar90._4_4_;
  auVar267._8_4_ = auVar247._8_4_ * fVar108 + auVar90._8_4_;
  auVar267._12_4_ = auVar247._12_4_ * fVar109 + auVar90._12_4_;
  auVar134._8_8_ = 0;
  auVar134._0_8_ = *(ulong *)(prim + uVar60 * 0x12 + 6);
  auVar90 = vpmovsxwd_avx(auVar134);
  uVar68 = (ulong)(uint)((int)(uVar60 * 5) << 2);
  auVar123._8_8_ = 0;
  auVar123._0_8_ = *(ulong *)(prim + uVar60 * 2 + uVar68 + 6);
  auVar247 = vpmovsxwd_avx(auVar123);
  auVar90 = vcvtdq2ps_avx(auVar90);
  auVar247 = vcvtdq2ps_avx(auVar247);
  auVar247 = vsubps_avx(auVar247,auVar90);
  auVar285._0_4_ = auVar247._0_4_ * fVar264 + auVar90._0_4_;
  auVar285._4_4_ = auVar247._4_4_ * fVar69 + auVar90._4_4_;
  auVar285._8_4_ = auVar247._8_4_ * fVar108 + auVar90._8_4_;
  auVar285._12_4_ = auVar247._12_4_ * fVar109 + auVar90._12_4_;
  auVar157._8_8_ = 0;
  auVar157._0_8_ = *(ulong *)(prim + uVar68 + 6);
  auVar90 = vpmovsxwd_avx(auVar157);
  auVar90 = vcvtdq2ps_avx(auVar90);
  auVar124._8_8_ = 0;
  auVar124._0_8_ = *(ulong *)(prim + uVar60 * 0x18 + 6);
  auVar247 = vpmovsxwd_avx(auVar124);
  auVar247 = vcvtdq2ps_avx(auVar247);
  auVar167 = vsubps_avx(auVar247,auVar90);
  auVar252._8_8_ = 0;
  auVar252._0_8_ = *(ulong *)(prim + uVar60 * 0x1d + 6);
  auVar247 = vpmovsxwd_avx(auVar252);
  auVar295._0_4_ = auVar167._0_4_ * fVar264 + auVar90._0_4_;
  auVar295._4_4_ = auVar167._4_4_ * fVar69 + auVar90._4_4_;
  auVar295._8_4_ = auVar167._8_4_ * fVar108 + auVar90._8_4_;
  auVar295._12_4_ = auVar167._12_4_ * fVar109 + auVar90._12_4_;
  auVar90 = vcvtdq2ps_avx(auVar247);
  auVar274._8_8_ = 0;
  auVar274._0_8_ = *(ulong *)(prim + uVar60 + (ulong)(byte)PVar7 * 0x20 + 6);
  auVar247 = vpmovsxwd_avx(auVar274);
  auVar247 = vcvtdq2ps_avx(auVar247);
  auVar247 = vsubps_avx(auVar247,auVar90);
  auVar306._0_4_ = auVar247._0_4_ * fVar264 + auVar90._0_4_;
  auVar306._4_4_ = auVar247._4_4_ * fVar69 + auVar90._4_4_;
  auVar306._8_4_ = auVar247._8_4_ * fVar108 + auVar90._8_4_;
  auVar306._12_4_ = auVar247._12_4_ * fVar109 + auVar90._12_4_;
  auVar14._8_8_ = 0;
  auVar14._0_8_ = *(ulong *)(prim + ((ulong)(byte)PVar7 * 0x20 - uVar60) + 6);
  auVar90 = vpmovsxwd_avx(auVar14);
  auVar90 = vcvtdq2ps_avx(auVar90);
  auVar302._8_8_ = 0;
  auVar302._0_8_ = *(ulong *)(prim + uVar60 * 0x23 + 6);
  auVar247 = vpmovsxwd_avx(auVar302);
  auVar247 = vcvtdq2ps_avx(auVar247);
  auVar247 = vsubps_avx(auVar247,auVar90);
  auVar242._0_4_ = auVar90._0_4_ + auVar247._0_4_ * fVar264;
  auVar242._4_4_ = auVar90._4_4_ + auVar247._4_4_ * fVar69;
  auVar242._8_4_ = auVar90._8_4_ + auVar247._8_4_ * fVar108;
  auVar242._12_4_ = auVar90._12_4_ + auVar247._12_4_ * fVar109;
  auVar90 = vsubps_avx(auVar255,auVar111);
  auVar256._0_4_ = fVar171 * auVar90._0_4_;
  auVar256._4_4_ = fVar185 * auVar90._4_4_;
  auVar256._8_4_ = fVar187 * auVar90._8_4_;
  auVar256._12_4_ = fVar189 * auVar90._12_4_;
  auVar90 = vsubps_avx(auVar267,auVar111);
  auVar112._0_4_ = fVar171 * auVar90._0_4_;
  auVar112._4_4_ = fVar185 * auVar90._4_4_;
  auVar112._8_4_ = fVar187 * auVar90._8_4_;
  auVar112._12_4_ = fVar189 * auVar90._12_4_;
  auVar90 = vsubps_avx(auVar285,auVar70);
  auVar174._0_4_ = fVar191 * auVar90._0_4_;
  auVar174._4_4_ = fVar214 * auVar90._4_4_;
  auVar174._8_4_ = fVar217 * auVar90._8_4_;
  auVar174._12_4_ = fVar220 * auVar90._12_4_;
  auVar90 = vsubps_avx(auVar295,auVar70);
  auVar71._0_4_ = fVar191 * auVar90._0_4_;
  auVar71._4_4_ = fVar214 * auVar90._4_4_;
  auVar71._8_4_ = fVar217 * auVar90._8_4_;
  auVar71._12_4_ = fVar220 * auVar90._12_4_;
  auVar90 = vsubps_avx(auVar306,auVar143);
  auVar195._0_4_ = fVar223 * auVar90._0_4_;
  auVar195._4_4_ = fVar236 * auVar90._4_4_;
  auVar195._8_4_ = fVar237 * auVar90._8_4_;
  auVar195._12_4_ = fVar238 * auVar90._12_4_;
  auVar90 = vsubps_avx(auVar242,auVar143);
  auVar144._0_4_ = fVar223 * auVar90._0_4_;
  auVar144._4_4_ = fVar236 * auVar90._4_4_;
  auVar144._8_4_ = fVar237 * auVar90._8_4_;
  auVar144._12_4_ = fVar238 * auVar90._12_4_;
  auVar90 = vpminsd_avx(auVar256,auVar112);
  auVar247 = vpminsd_avx(auVar174,auVar71);
  auVar90 = vmaxps_avx(auVar90,auVar247);
  auVar247 = vpminsd_avx(auVar195,auVar144);
  uVar4 = *(undefined4 *)((long)&(ray->org).field_0 + 0xc);
  auVar268._4_4_ = uVar4;
  auVar268._0_4_ = uVar4;
  auVar268._8_4_ = uVar4;
  auVar268._12_4_ = uVar4;
  auVar247 = vmaxps_avx(auVar247,auVar268);
  auVar90 = vmaxps_avx(auVar90,auVar247);
  local_208._0_4_ = auVar90._0_4_ * 0.99999964;
  local_208._4_4_ = auVar90._4_4_ * 0.99999964;
  local_208._8_4_ = auVar90._8_4_ * 0.99999964;
  local_208._12_4_ = auVar90._12_4_ * 0.99999964;
  auVar90 = vpmaxsd_avx(auVar256,auVar112);
  auVar247 = vpmaxsd_avx(auVar174,auVar71);
  auVar90 = vminps_avx(auVar90,auVar247);
  auVar247 = vpmaxsd_avx(auVar195,auVar144);
  fVar264 = ray->tfar;
  auVar145._4_4_ = fVar264;
  auVar145._0_4_ = fVar264;
  auVar145._8_4_ = fVar264;
  auVar145._12_4_ = fVar264;
  auVar247 = vminps_avx(auVar247,auVar145);
  auVar90 = vminps_avx(auVar90,auVar247);
  auVar72._0_4_ = auVar90._0_4_ * 1.0000004;
  auVar72._4_4_ = auVar90._4_4_ * 1.0000004;
  auVar72._8_4_ = auVar90._8_4_ * 1.0000004;
  auVar72._12_4_ = auVar90._12_4_ * 1.0000004;
  auVar90 = vpshufd_avx(ZEXT116((byte)PVar7),0);
  auVar247 = vpcmpgtd_avx(auVar90,_DAT_01f7fcf0);
  auVar90 = vcmpps_avx(local_208,auVar72,2);
  auVar90 = vandps_avx(auVar90,auVar247);
  uVar59 = vmovmskps_avx(auVar90);
  if (uVar59 == 0) {
    return false;
  }
  auVar102._16_16_ = mm_lookupmask_ps._240_16_;
  auVar102._0_16_ = mm_lookupmask_ps._240_16_;
  uVar59 = uVar59 & 0xff;
  local_158 = vblendps_avx(auVar102,ZEXT832(0) << 0x20,0x80);
  local_2e0 = prim;
LAB_00fb3e09:
  lVar61 = 0;
  if ((ulong)uVar59 != 0) {
    for (; (uVar59 >> lVar61 & 1) == 0; lVar61 = lVar61 + 1) {
    }
  }
  local_400 = (ulong)*(uint *)(local_2e0 + 2);
  local_2e8 = (ulong)*(uint *)(local_2e0 + lVar61 * 4 + 6);
  pGVar8 = (context->scene->geometries).items[local_400].ptr;
  fVar264 = (pGVar8->time_range).lower;
  fVar264 = pGVar8->fnumTimeSegments *
            (((ray->dir).field_0.m128[3] - fVar264) / ((pGVar8->time_range).upper - fVar264));
  auVar90 = vroundss_avx(ZEXT416((uint)fVar264),ZEXT416((uint)fVar264),9);
  auVar90 = vminss_avx(auVar90,ZEXT416((uint)(pGVar8->fnumTimeSegments + -1.0)));
  auVar90 = vmaxss_avx(ZEXT816(0) << 0x20,auVar90);
  uVar60 = (ulong)*(uint *)(*(long *)&pGVar8->field_0x58 +
                           local_2e8 *
                           pGVar8[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i);
  _Var9 = pGVar8[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  lVar66 = (long)(int)auVar90._0_4_ * 0x38;
  lVar10 = *(long *)(_Var9 + lVar66);
  lVar11 = *(long *)(_Var9 + 0x10 + lVar66);
  pfVar3 = (float *)(lVar10 + lVar11 * uVar60);
  fVar69 = *pfVar3;
  fVar108 = pfVar3[1];
  fVar109 = pfVar3[2];
  fVar171 = pfVar3[3];
  lVar61 = uVar60 + 1;
  pfVar3 = (float *)(lVar10 + lVar11 * lVar61);
  fVar185 = *pfVar3;
  fVar187 = pfVar3[1];
  fVar189 = pfVar3[2];
  fVar191 = pfVar3[3];
  lVar1 = uVar60 + 2;
  pfVar3 = (float *)(lVar10 + lVar11 * lVar1);
  fVar214 = *pfVar3;
  fVar217 = pfVar3[1];
  fVar220 = pfVar3[2];
  fVar223 = pfVar3[3];
  lVar2 = uVar60 + 3;
  pfVar3 = (float *)(lVar10 + lVar11 * lVar2);
  fVar236 = *pfVar3;
  fVar237 = pfVar3[1];
  fVar238 = pfVar3[2];
  fVar239 = pfVar3[3];
  lVar10 = *(long *)&pGVar8[4].fnumTimeSegments;
  lVar11 = *(long *)(lVar10 + lVar66);
  lVar12 = *(long *)(lVar10 + 0x10 + lVar66);
  pfVar3 = (float *)(lVar11 + lVar12 * uVar60);
  fVar172 = *pfVar3;
  fVar186 = pfVar3[1];
  fVar188 = pfVar3[2];
  fVar190 = pfVar3[3];
  pfVar3 = (float *)(lVar11 + lVar12 * lVar61);
  fVar192 = *pfVar3;
  fVar215 = pfVar3[1];
  fVar218 = pfVar3[2];
  fVar221 = pfVar3[3];
  pfVar3 = (float *)(lVar11 + lVar12 * lVar1);
  fVar318 = *pfVar3;
  fVar283 = pfVar3[1];
  fVar319 = pfVar3[2];
  fVar284 = pfVar3[3];
  fVar264 = fVar264 - auVar90._0_4_;
  pfVar3 = (float *)(lVar11 + lVar12 * lVar2);
  fVar193 = *pfVar3;
  fVar216 = pfVar3[1];
  fVar219 = pfVar3[2];
  fVar222 = pfVar3[3];
  auVar73._0_4_ = fVar185 * 0.0 + fVar214 * 0.5 + fVar236 * 0.0;
  auVar73._4_4_ = fVar187 * 0.0 + fVar217 * 0.5 + fVar237 * 0.0;
  auVar73._8_4_ = fVar189 * 0.0 + fVar220 * 0.5 + fVar238 * 0.0;
  auVar73._12_4_ = fVar191 * 0.0 + fVar223 * 0.5 + fVar239 * 0.0;
  auVar146._0_4_ = fVar69 * 0.5;
  auVar146._4_4_ = fVar108 * 0.5;
  auVar146._8_4_ = fVar109 * 0.5;
  auVar146._12_4_ = fVar171 * 0.5;
  auVar124 = vsubps_avx(auVar73,auVar146);
  auVar74._0_4_ = fVar192 * 0.0 + fVar318 * 0.5 + fVar193 * 0.0;
  auVar74._4_4_ = fVar215 * 0.0 + fVar283 * 0.5 + fVar216 * 0.0;
  auVar74._8_4_ = fVar218 * 0.0 + fVar319 * 0.5 + fVar219 * 0.0;
  auVar74._12_4_ = fVar221 * 0.0 + fVar284 * 0.5 + fVar222 * 0.0;
  auVar328._0_4_ = fVar172 * 0.5;
  auVar328._4_4_ = fVar186 * 0.5;
  auVar328._8_4_ = fVar188 * 0.5;
  auVar328._12_4_ = fVar190 * 0.5;
  auVar275 = vsubps_avx(auVar74,auVar328);
  local_4a8._0_4_ = fVar69 * -0.0 + fVar214 * 0.0 + fVar236 * -0.0 + fVar185;
  local_4a8._4_4_ = fVar108 * -0.0 + fVar217 * 0.0 + fVar237 * -0.0 + fVar187;
  fStack_4a0 = fVar109 * -0.0 + fVar220 * 0.0 + fVar238 * -0.0 + fVar189;
  fStack_49c = fVar171 * -0.0 + fVar223 * 0.0 + fVar239 * -0.0 + fVar191;
  local_4c8._0_4_ = fVar69 * -0.0 + fVar185 * 0.0 + fVar214 + fVar236 * -0.0;
  local_4c8._4_4_ = fVar108 * -0.0 + fVar187 * 0.0 + fVar217 + fVar237 * -0.0;
  fStack_4c0 = fVar109 * -0.0 + fVar189 * 0.0 + fVar220 + fVar238 * -0.0;
  fStack_4bc = fVar171 * -0.0 + fVar191 * 0.0 + fVar223 + fVar239 * -0.0;
  auVar269._0_4_ = fVar214 * 0.0 + fVar236 * 0.5;
  auVar269._4_4_ = fVar217 * 0.0 + fVar237 * 0.5;
  auVar269._8_4_ = fVar220 * 0.0 + fVar238 * 0.5;
  auVar269._12_4_ = fVar223 * 0.0 + fVar239 * 0.5;
  auVar196._0_4_ = fVar185 * 0.5;
  auVar196._4_4_ = fVar187 * 0.5;
  auVar196._8_4_ = fVar189 * 0.5;
  auVar196._12_4_ = fVar191 * 0.5;
  auVar90 = vsubps_avx(auVar269,auVar196);
  auVar334._0_4_ = fVar172 * -0.0 + fVar318 * 0.0 + fVar193 * -0.0 + fVar192;
  auVar334._4_4_ = fVar186 * -0.0 + fVar283 * 0.0 + fVar216 * -0.0 + fVar215;
  auVar334._8_4_ = fVar188 * -0.0 + fVar319 * 0.0 + fVar219 * -0.0 + fVar218;
  auVar334._12_4_ = fVar190 * -0.0 + fVar284 * 0.0 + fVar222 * -0.0 + fVar221;
  auVar286._0_4_ = fVar69 * 0.0 + auVar90._0_4_;
  auVar286._4_4_ = fVar108 * 0.0 + auVar90._4_4_;
  auVar286._8_4_ = fVar109 * 0.0 + auVar90._8_4_;
  auVar286._12_4_ = fVar171 * 0.0 + auVar90._12_4_;
  auVar175._0_4_ = fVar172 * -0.0 + fVar192 * 0.0 + fVar318 + fVar193 * -0.0;
  auVar175._4_4_ = fVar186 * -0.0 + fVar215 * 0.0 + fVar283 + fVar216 * -0.0;
  auVar175._8_4_ = fVar188 * -0.0 + fVar218 * 0.0 + fVar319 + fVar219 * -0.0;
  auVar175._12_4_ = fVar190 * -0.0 + fVar221 * 0.0 + fVar284 + fVar222 * -0.0;
  auVar197._0_4_ = fVar318 * 0.0 + fVar193 * 0.5;
  auVar197._4_4_ = fVar283 * 0.0 + fVar216 * 0.5;
  auVar197._8_4_ = fVar319 * 0.0 + fVar219 * 0.5;
  auVar197._12_4_ = fVar284 * 0.0 + fVar222 * 0.5;
  auVar257._0_4_ = fVar192 * 0.5;
  auVar257._4_4_ = fVar215 * 0.5;
  auVar257._8_4_ = fVar218 * 0.5;
  auVar257._12_4_ = fVar221 * 0.5;
  auVar90 = vsubps_avx(auVar197,auVar257);
  auVar198._0_4_ = fVar172 * 0.0 + auVar90._0_4_;
  auVar198._4_4_ = fVar186 * 0.0 + auVar90._4_4_;
  auVar198._8_4_ = fVar188 * 0.0 + auVar90._8_4_;
  auVar198._12_4_ = fVar190 * 0.0 + auVar90._12_4_;
  auVar90 = vshufps_avx(auVar124,auVar124,0xc9);
  auVar247 = vshufps_avx(auVar334,auVar334,0xc9);
  fVar240 = auVar124._0_4_;
  auVar225._0_4_ = fVar240 * auVar247._0_4_;
  fVar251 = auVar124._4_4_;
  auVar225._4_4_ = fVar251 * auVar247._4_4_;
  fVar320 = auVar124._8_4_;
  auVar225._8_4_ = fVar320 * auVar247._8_4_;
  fVar321 = auVar124._12_4_;
  auVar225._12_4_ = fVar321 * auVar247._12_4_;
  auVar270._0_4_ = auVar334._0_4_ * auVar90._0_4_;
  auVar270._4_4_ = auVar334._4_4_ * auVar90._4_4_;
  auVar270._8_4_ = auVar334._8_4_ * auVar90._8_4_;
  auVar270._12_4_ = auVar334._12_4_ * auVar90._12_4_;
  auVar247 = vsubps_avx(auVar270,auVar225);
  auVar167 = vshufps_avx(auVar247,auVar247,0xc9);
  auVar247 = vshufps_avx(auVar275,auVar275,0xc9);
  auVar271._0_4_ = auVar247._0_4_ * fVar240;
  auVar271._4_4_ = auVar247._4_4_ * fVar251;
  auVar271._8_4_ = auVar247._8_4_ * fVar320;
  auVar271._12_4_ = auVar247._12_4_ * fVar321;
  auVar75._0_4_ = auVar90._0_4_ * auVar275._0_4_;
  auVar75._4_4_ = auVar90._4_4_ * auVar275._4_4_;
  auVar75._8_4_ = auVar90._8_4_ * auVar275._8_4_;
  auVar75._12_4_ = auVar90._12_4_ * auVar275._12_4_;
  auVar90 = vsubps_avx(auVar75,auVar271);
  auVar275 = vshufps_avx(auVar90,auVar90,0xc9);
  auVar90 = vshufps_avx(auVar286,auVar286,0xc9);
  auVar247 = vshufps_avx(auVar175,auVar175,0xc9);
  auVar272._0_4_ = auVar286._0_4_ * auVar247._0_4_;
  auVar272._4_4_ = auVar286._4_4_ * auVar247._4_4_;
  auVar272._8_4_ = auVar286._8_4_ * auVar247._8_4_;
  auVar272._12_4_ = auVar286._12_4_ * auVar247._12_4_;
  auVar176._0_4_ = auVar90._0_4_ * auVar175._0_4_;
  auVar176._4_4_ = auVar90._4_4_ * auVar175._4_4_;
  auVar176._8_4_ = auVar90._8_4_ * auVar175._8_4_;
  auVar176._12_4_ = auVar90._12_4_ * auVar175._12_4_;
  auVar247 = vsubps_avx(auVar176,auVar272);
  auVar134 = vshufps_avx(auVar247,auVar247,0xc9);
  auVar247 = vshufps_avx(auVar198,auVar198,0xc9);
  auVar273._0_4_ = auVar286._0_4_ * auVar247._0_4_;
  auVar273._4_4_ = auVar286._4_4_ * auVar247._4_4_;
  auVar273._8_4_ = auVar286._8_4_ * auVar247._8_4_;
  auVar273._12_4_ = auVar286._12_4_ * auVar247._12_4_;
  auVar199._0_4_ = auVar90._0_4_ * auVar198._0_4_;
  auVar199._4_4_ = auVar90._4_4_ * auVar198._4_4_;
  auVar199._8_4_ = auVar90._8_4_ * auVar198._8_4_;
  auVar199._12_4_ = auVar90._12_4_ * auVar198._12_4_;
  auVar90 = vsubps_avx(auVar199,auVar273);
  auVar123 = vshufps_avx(auVar90,auVar90,0xc9);
  auVar90 = vdpps_avx(auVar167,auVar167,0x7f);
  fVar108 = auVar90._0_4_;
  auVar274 = ZEXT416((uint)fVar108);
  auVar247 = vrsqrtss_avx(auVar274,auVar274);
  fVar69 = auVar247._0_4_;
  auVar247 = vdpps_avx(auVar167,auVar275,0x7f);
  auVar157 = ZEXT416((uint)(fVar69 * 1.5 - fVar108 * 0.5 * fVar69 * fVar69 * fVar69));
  auVar157 = vshufps_avx(auVar157,auVar157,0);
  fVar192 = auVar157._0_4_ * auVar167._0_4_;
  fVar215 = auVar157._4_4_ * auVar167._4_4_;
  fVar218 = auVar157._8_4_ * auVar167._8_4_;
  fVar221 = auVar157._12_4_ * auVar167._12_4_;
  auVar90 = vshufps_avx(auVar90,auVar90,0);
  auVar76._0_4_ = auVar90._0_4_ * auVar275._0_4_;
  auVar76._4_4_ = auVar90._4_4_ * auVar275._4_4_;
  auVar76._8_4_ = auVar90._8_4_ * auVar275._8_4_;
  auVar76._12_4_ = auVar90._12_4_ * auVar275._12_4_;
  auVar90 = vshufps_avx(auVar247,auVar247,0);
  auVar226._0_4_ = auVar90._0_4_ * auVar167._0_4_;
  auVar226._4_4_ = auVar90._4_4_ * auVar167._4_4_;
  auVar226._8_4_ = auVar90._8_4_ * auVar167._8_4_;
  auVar226._12_4_ = auVar90._12_4_ * auVar167._12_4_;
  auVar252 = vsubps_avx(auVar76,auVar226);
  auVar90 = vrcpss_avx(auVar274,auVar274);
  auVar90 = ZEXT416((uint)(auVar90._0_4_ * (2.0 - fVar108 * auVar90._0_4_)));
  auVar167 = vshufps_avx(auVar90,auVar90,0);
  auVar90 = vdpps_avx(auVar134,auVar134,0x7f);
  fVar318 = auVar90._0_4_;
  auVar275 = ZEXT416((uint)fVar318);
  auVar247 = vrsqrtss_avx(auVar275,auVar275);
  fVar172 = auVar247._0_4_;
  auVar247 = vdpps_avx(auVar134,auVar123,0x7f);
  auVar90 = vshufps_avx(auVar90,auVar90,0);
  auVar335._0_4_ = auVar123._0_4_ * auVar90._0_4_;
  auVar335._4_4_ = auVar123._4_4_ * auVar90._4_4_;
  auVar335._8_4_ = auVar123._8_4_ * auVar90._8_4_;
  auVar335._12_4_ = auVar123._12_4_ * auVar90._12_4_;
  lVar11 = *(long *)(_Var9 + 0x38 + lVar66);
  lVar12 = *(long *)(_Var9 + 0x48 + lVar66);
  pfVar3 = (float *)(lVar11 + lVar12 * uVar60);
  fVar69 = *pfVar3;
  fVar108 = pfVar3[1];
  fVar109 = pfVar3[2];
  fVar171 = pfVar3[3];
  pfVar3 = (float *)(lVar11 + lVar12 * lVar61);
  fVar185 = *pfVar3;
  fVar187 = pfVar3[1];
  fVar189 = pfVar3[2];
  fVar191 = pfVar3[3];
  pfVar3 = (float *)(lVar11 + lVar12 * lVar1);
  fVar214 = *pfVar3;
  fVar217 = pfVar3[1];
  fVar220 = pfVar3[2];
  fVar223 = pfVar3[3];
  auVar90 = vshufps_avx(auVar247,auVar247,0);
  auVar77._0_4_ = auVar90._0_4_ * auVar134._0_4_;
  auVar77._4_4_ = auVar90._4_4_ * auVar134._4_4_;
  auVar77._8_4_ = auVar90._8_4_ * auVar134._8_4_;
  auVar77._12_4_ = auVar90._12_4_ * auVar134._12_4_;
  auVar123 = vsubps_avx(auVar335,auVar77);
  pfVar3 = (float *)(lVar11 + lVar12 * lVar2);
  fVar236 = *pfVar3;
  fVar237 = pfVar3[1];
  fVar238 = pfVar3[2];
  fVar239 = pfVar3[3];
  lVar11 = *(long *)(lVar10 + 0x38 + lVar66);
  lVar10 = *(long *)(lVar10 + 0x48 + lVar66);
  auVar90 = ZEXT416((uint)(fVar172 * 1.5 - fVar318 * 0.5 * fVar172 * fVar172 * fVar172));
  auVar247 = vshufps_avx(auVar90,auVar90,0);
  fVar172 = auVar247._0_4_ * auVar134._0_4_;
  fVar186 = auVar247._4_4_ * auVar134._4_4_;
  fVar188 = auVar247._8_4_ * auVar134._8_4_;
  fVar190 = auVar247._12_4_ * auVar134._12_4_;
  auVar90 = vrcpss_avx(auVar275,auVar275);
  auVar90 = ZEXT416((uint)(auVar90._0_4_ * (2.0 - auVar90._0_4_ * fVar318)));
  auVar90 = vshufps_avx(auVar90,auVar90,0);
  auVar275 = vshufps_avx(_local_4a8,_local_4a8,0xff);
  auVar314._0_4_ = auVar275._0_4_ * fVar192;
  auVar314._4_4_ = auVar275._4_4_ * fVar215;
  auVar314._8_4_ = auVar275._8_4_ * fVar218;
  auVar314._12_4_ = auVar275._12_4_ * fVar221;
  auVar134 = vshufps_avx(auVar124,auVar124,0xff);
  auVar274 = vsubps_avx(_local_4a8,auVar314);
  auVar258._0_4_ =
       auVar134._0_4_ * fVar192 + auVar275._0_4_ * auVar157._0_4_ * auVar252._0_4_ * auVar167._0_4_;
  auVar258._4_4_ =
       auVar134._4_4_ * fVar215 + auVar275._4_4_ * auVar157._4_4_ * auVar252._4_4_ * auVar167._4_4_;
  auVar258._8_4_ =
       auVar134._8_4_ * fVar218 + auVar275._8_4_ * auVar157._8_4_ * auVar252._8_4_ * auVar167._8_4_;
  auVar258._12_4_ =
       auVar134._12_4_ * fVar221 +
       auVar275._12_4_ * auVar157._12_4_ * auVar252._12_4_ * auVar167._12_4_;
  auVar252 = vsubps_avx(auVar124,auVar258);
  local_4a8._0_4_ = auVar314._0_4_ + (float)local_4a8._0_4_;
  local_4a8._4_4_ = auVar314._4_4_ + (float)local_4a8._4_4_;
  fStack_4a0 = auVar314._8_4_ + fStack_4a0;
  fStack_49c = auVar314._12_4_ + fStack_49c;
  auVar167 = vshufps_avx(_local_4c8,_local_4c8,0xff);
  auVar147._0_4_ = auVar167._0_4_ * fVar172;
  auVar147._4_4_ = auVar167._4_4_ * fVar186;
  auVar147._8_4_ = auVar167._8_4_ * fVar188;
  auVar147._12_4_ = auVar167._12_4_ * fVar190;
  auVar275 = vshufps_avx(auVar286,auVar286,0xff);
  auVar14 = vsubps_avx(_local_4c8,auVar147);
  auVar78._0_4_ =
       auVar275._0_4_ * fVar172 + auVar167._0_4_ * auVar247._0_4_ * auVar123._0_4_ * auVar90._0_4_;
  auVar78._4_4_ =
       auVar275._4_4_ * fVar186 + auVar167._4_4_ * auVar247._4_4_ * auVar123._4_4_ * auVar90._4_4_;
  auVar78._8_4_ =
       auVar275._8_4_ * fVar188 + auVar167._8_4_ * auVar247._8_4_ * auVar123._8_4_ * auVar90._8_4_;
  auVar78._12_4_ =
       auVar275._12_4_ * fVar190 +
       auVar167._12_4_ * auVar247._12_4_ * auVar123._12_4_ * auVar90._12_4_;
  auVar302 = vsubps_avx(auVar286,auVar78);
  local_4c8._0_4_ = (float)local_4c8._0_4_ + auVar147._0_4_;
  local_4c8._4_4_ = (float)local_4c8._4_4_ + auVar147._4_4_;
  fStack_4c0 = fStack_4c0 + auVar147._8_4_;
  fStack_4bc = fStack_4bc + auVar147._12_4_;
  auVar79._0_4_ = fVar185 * 0.0 + fVar214 * 0.5 + fVar236 * 0.0;
  auVar79._4_4_ = fVar187 * 0.0 + fVar217 * 0.5 + fVar237 * 0.0;
  auVar79._8_4_ = fVar189 * 0.0 + fVar220 * 0.5 + fVar238 * 0.0;
  auVar79._12_4_ = fVar191 * 0.0 + fVar223 * 0.5 + fVar239 * 0.0;
  auVar113._0_4_ = fVar69 * 0.5;
  auVar113._4_4_ = fVar108 * 0.5;
  auVar113._8_4_ = fVar109 * 0.5;
  auVar113._12_4_ = fVar171 * 0.5;
  auVar70 = vsubps_avx(auVar79,auVar113);
  pfVar3 = (float *)(lVar11 + lVar1 * lVar10);
  fVar172 = *pfVar3;
  fVar186 = pfVar3[1];
  fVar188 = pfVar3[2];
  fVar190 = pfVar3[3];
  auVar90 = *(undefined1 (*) [16])(lVar11 + lVar10 * lVar2);
  fVar193 = auVar90._0_4_;
  fVar216 = auVar90._4_4_;
  fVar219 = auVar90._8_4_;
  fVar222 = auVar90._12_4_;
  pfVar3 = (float *)(lVar11 + lVar61 * lVar10);
  fVar192 = *pfVar3;
  fVar215 = pfVar3[1];
  fVar218 = pfVar3[2];
  fVar221 = pfVar3[3];
  auVar243._0_4_ = fVar192 * 0.0 + fVar193 * 0.0 + fVar172 * 0.5;
  auVar243._4_4_ = fVar215 * 0.0 + fVar216 * 0.0 + fVar186 * 0.5;
  auVar243._8_4_ = fVar218 * 0.0 + fVar219 * 0.0 + fVar188 * 0.5;
  auVar243._12_4_ = fVar221 * 0.0 + fVar222 * 0.0 + fVar190 * 0.5;
  pfVar3 = (float *)(lVar11 + uVar60 * lVar10);
  fVar318 = *pfVar3;
  fVar283 = pfVar3[1];
  fVar319 = pfVar3[2];
  fVar284 = pfVar3[3];
  auVar276._0_4_ = fVar318 * 0.5;
  auVar276._4_4_ = fVar283 * 0.5;
  auVar276._8_4_ = fVar319 * 0.5;
  auVar276._12_4_ = fVar284 * 0.5;
  auVar247 = vsubps_avx(auVar243,auVar276);
  auVar277._0_4_ = fVar69 * -0.0 + fVar185 + fVar214 * 0.0 + fVar236 * -0.0;
  auVar277._4_4_ = fVar108 * -0.0 + fVar187 + fVar217 * 0.0 + fVar237 * -0.0;
  auVar277._8_4_ = fVar109 * -0.0 + fVar189 + fVar220 * 0.0 + fVar238 * -0.0;
  auVar277._12_4_ = fVar171 * -0.0 + fVar191 + fVar223 * 0.0 + fVar239 * -0.0;
  local_4d8._0_4_ = fVar69 * -0.0 + fVar185 * 0.0 + fVar214 + fVar236 * -0.0;
  local_4d8._4_4_ = fVar108 * -0.0 + fVar187 * 0.0 + fVar217 + fVar237 * -0.0;
  fStack_4d0 = fVar109 * -0.0 + fVar189 * 0.0 + fVar220 + fVar238 * -0.0;
  fStack_4cc = fVar171 * -0.0 + fVar191 * 0.0 + fVar223 + fVar239 * -0.0;
  auVar296._0_4_ = fVar214 * 0.0 + fVar236 * 0.5;
  auVar296._4_4_ = fVar217 * 0.0 + fVar237 * 0.5;
  auVar296._8_4_ = fVar220 * 0.0 + fVar238 * 0.5;
  auVar296._12_4_ = fVar223 * 0.0 + fVar239 * 0.5;
  auVar315._0_4_ = fVar185 * 0.5;
  auVar315._4_4_ = fVar187 * 0.5;
  auVar315._8_4_ = fVar189 * 0.5;
  auVar315._12_4_ = fVar191 * 0.5;
  auVar90 = vsubps_avx(auVar296,auVar315);
  auVar307._0_4_ = fVar69 * 0.0 + auVar90._0_4_;
  auVar307._4_4_ = fVar108 * 0.0 + auVar90._4_4_;
  auVar307._8_4_ = fVar109 * 0.0 + auVar90._8_4_;
  auVar307._12_4_ = fVar171 * 0.0 + auVar90._12_4_;
  auVar297._0_4_ = fVar318 * -0.0 + fVar192 + fVar193 * -0.0 + fVar172 * 0.0;
  auVar297._4_4_ = fVar283 * -0.0 + fVar215 + fVar216 * -0.0 + fVar186 * 0.0;
  auVar297._8_4_ = fVar319 * -0.0 + fVar218 + fVar219 * -0.0 + fVar188 * 0.0;
  auVar297._12_4_ = fVar284 * -0.0 + fVar221 + fVar222 * -0.0 + fVar190 * 0.0;
  auVar114._0_4_ = fVar318 * -0.0 + fVar193 * -0.0 + fVar172 + fVar192 * 0.0;
  auVar114._4_4_ = fVar283 * -0.0 + fVar216 * -0.0 + fVar186 + fVar215 * 0.0;
  auVar114._8_4_ = fVar319 * -0.0 + fVar219 * -0.0 + fVar188 + fVar218 * 0.0;
  auVar114._12_4_ = fVar284 * -0.0 + fVar222 * -0.0 + fVar190 + fVar221 * 0.0;
  auVar148._0_4_ = fVar172 * 0.0 + fVar193 * 0.5;
  auVar148._4_4_ = fVar186 * 0.0 + fVar216 * 0.5;
  auVar148._8_4_ = fVar188 * 0.0 + fVar219 * 0.5;
  auVar148._12_4_ = fVar190 * 0.0 + fVar222 * 0.5;
  auVar177._0_4_ = fVar192 * 0.5;
  auVar177._4_4_ = fVar215 * 0.5;
  auVar177._8_4_ = fVar218 * 0.5;
  auVar177._12_4_ = fVar221 * 0.5;
  auVar90 = vsubps_avx(auVar148,auVar177);
  auVar149._0_4_ = fVar318 * 0.0 + auVar90._0_4_;
  auVar149._4_4_ = fVar283 * 0.0 + auVar90._4_4_;
  auVar149._8_4_ = fVar319 * 0.0 + auVar90._8_4_;
  auVar149._12_4_ = fVar284 * 0.0 + auVar90._12_4_;
  auVar90 = vshufps_avx(auVar297,auVar297,0xc9);
  fVar214 = auVar70._0_4_;
  auVar80._0_4_ = fVar214 * auVar90._0_4_;
  fVar217 = auVar70._4_4_;
  auVar80._4_4_ = fVar217 * auVar90._4_4_;
  fVar220 = auVar70._8_4_;
  auVar80._8_4_ = fVar220 * auVar90._8_4_;
  fVar223 = auVar70._12_4_;
  auVar80._12_4_ = fVar223 * auVar90._12_4_;
  auVar90 = vshufps_avx(auVar70,auVar70,0xc9);
  auVar298._0_4_ = auVar297._0_4_ * auVar90._0_4_;
  auVar298._4_4_ = auVar297._4_4_ * auVar90._4_4_;
  auVar298._8_4_ = auVar297._8_4_ * auVar90._8_4_;
  auVar298._12_4_ = auVar297._12_4_ * auVar90._12_4_;
  auVar167 = vsubps_avx(auVar298,auVar80);
  auVar81._0_4_ = auVar90._0_4_ * auVar247._0_4_;
  auVar81._4_4_ = auVar90._4_4_ * auVar247._4_4_;
  auVar81._8_4_ = auVar90._8_4_ * auVar247._8_4_;
  auVar81._12_4_ = auVar90._12_4_ * auVar247._12_4_;
  auVar90 = vshufps_avx(auVar247,auVar247,0xc9);
  auVar178._0_4_ = fVar214 * auVar90._0_4_;
  auVar178._4_4_ = fVar217 * auVar90._4_4_;
  auVar178._8_4_ = fVar220 * auVar90._8_4_;
  auVar178._12_4_ = fVar223 * auVar90._12_4_;
  auVar275 = vsubps_avx(auVar81,auVar178);
  auVar90 = vshufps_avx(auVar114,auVar114,0xc9);
  auVar82._0_4_ = auVar307._0_4_ * auVar90._0_4_;
  auVar82._4_4_ = auVar307._4_4_ * auVar90._4_4_;
  auVar82._8_4_ = auVar307._8_4_ * auVar90._8_4_;
  auVar82._12_4_ = auVar307._12_4_ * auVar90._12_4_;
  auVar90 = vshufps_avx(auVar307,auVar307,0xc9);
  auVar115._0_4_ = auVar90._0_4_ * auVar114._0_4_;
  auVar115._4_4_ = auVar90._4_4_ * auVar114._4_4_;
  auVar115._8_4_ = auVar90._8_4_ * auVar114._8_4_;
  auVar115._12_4_ = auVar90._12_4_ * auVar114._12_4_;
  auVar134 = vsubps_avx(auVar115,auVar82);
  auVar167 = vshufps_avx(auVar167,auVar167,0xc9);
  auVar116._0_4_ = auVar90._0_4_ * auVar149._0_4_;
  auVar116._4_4_ = auVar90._4_4_ * auVar149._4_4_;
  auVar116._8_4_ = auVar90._8_4_ * auVar149._8_4_;
  auVar116._12_4_ = auVar90._12_4_ * auVar149._12_4_;
  auVar247 = vshufps_avx(auVar149,auVar149,0xc9);
  auVar90 = vdpps_avx(auVar167,auVar167,0x7f);
  auVar150._0_4_ = auVar307._0_4_ * auVar247._0_4_;
  auVar150._4_4_ = auVar307._4_4_ * auVar247._4_4_;
  auVar150._8_4_ = auVar307._8_4_ * auVar247._8_4_;
  auVar150._12_4_ = auVar307._12_4_ * auVar247._12_4_;
  auVar157 = vsubps_avx(auVar116,auVar150);
  auVar275 = vshufps_avx(auVar275,auVar275,0xc9);
  fVar108 = auVar90._0_4_;
  auVar123 = ZEXT416((uint)fVar108);
  auVar247 = vrsqrtss_avx(auVar123,auVar123);
  fVar69 = auVar247._0_4_;
  auVar247 = vdpps_avx(auVar167,auVar275,0x7f);
  auVar90 = vshufps_avx(auVar90,auVar90,0);
  auVar117._0_4_ = auVar90._0_4_ * auVar275._0_4_;
  auVar117._4_4_ = auVar90._4_4_ * auVar275._4_4_;
  auVar117._8_4_ = auVar90._8_4_ * auVar275._8_4_;
  auVar117._12_4_ = auVar90._12_4_ * auVar275._12_4_;
  auVar90 = vshufps_avx(auVar247,auVar247,0);
  auVar299._0_4_ = auVar90._0_4_ * auVar167._0_4_;
  auVar299._4_4_ = auVar90._4_4_ * auVar167._4_4_;
  auVar299._8_4_ = auVar90._8_4_ * auVar167._8_4_;
  auVar299._12_4_ = auVar90._12_4_ * auVar167._12_4_;
  auVar71 = vsubps_avx(auVar117,auVar299);
  auVar90 = vrcpss_avx(auVar123,auVar123);
  auVar90 = ZEXT416((uint)(auVar90._0_4_ * (2.0 - fVar108 * auVar90._0_4_)));
  auVar275 = vshufps_avx(auVar90,auVar90,0);
  auVar134 = vshufps_avx(auVar134,auVar134,0xc9);
  auVar90 = ZEXT416((uint)(fVar69 * 1.5 - fVar108 * 0.5 * fVar69 * fVar69 * fVar69));
  auVar123 = vshufps_avx(auVar90,auVar90,0);
  auVar247 = vdpps_avx(auVar134,auVar134,0x7f);
  fVar69 = auVar167._0_4_ * auVar123._0_4_;
  fVar108 = auVar167._4_4_ * auVar123._4_4_;
  fVar109 = auVar167._8_4_ * auVar123._8_4_;
  fVar171 = auVar167._12_4_ * auVar123._12_4_;
  auVar157 = vshufps_avx(auVar157,auVar157,0xc9);
  auVar90 = vblendps_avx(auVar247,_DAT_01f7aa10,0xe);
  auVar167 = vrsqrtss_avx(auVar90,auVar90);
  fVar185 = auVar167._0_4_;
  auVar167 = vdpps_avx(auVar134,auVar157,0x7f);
  auVar124 = vshufps_avx(auVar247,auVar247,0);
  auVar151._0_4_ = auVar124._0_4_ * auVar157._0_4_;
  auVar151._4_4_ = auVar124._4_4_ * auVar157._4_4_;
  auVar151._8_4_ = auVar124._8_4_ * auVar157._8_4_;
  auVar151._12_4_ = auVar124._12_4_ * auVar157._12_4_;
  auVar167 = vshufps_avx(auVar167,auVar167,0);
  auVar316._0_4_ = auVar167._0_4_ * auVar134._0_4_;
  auVar316._4_4_ = auVar167._4_4_ * auVar134._4_4_;
  auVar316._8_4_ = auVar167._8_4_ * auVar134._8_4_;
  auVar316._12_4_ = auVar167._12_4_ * auVar134._12_4_;
  auVar157 = vsubps_avx(auVar151,auVar316);
  auVar90 = vrcpss_avx(auVar90,auVar90);
  auVar90 = ZEXT416((uint)(auVar90._0_4_ * (2.0 - auVar247._0_4_ * auVar90._0_4_)));
  auVar90 = vshufps_avx(auVar90,auVar90,0);
  auVar247 = ZEXT416((uint)(fVar185 * 1.5 - auVar247._0_4_ * 0.5 * fVar185 * fVar185 * fVar185));
  auVar247 = vshufps_avx(auVar247,auVar247,0);
  fVar185 = auVar134._0_4_ * auVar247._0_4_;
  fVar187 = auVar134._4_4_ * auVar247._4_4_;
  fVar189 = auVar134._8_4_ * auVar247._8_4_;
  fVar191 = auVar134._12_4_ * auVar247._12_4_;
  auVar167 = vshufps_avx(auVar70,auVar70,0xff);
  auVar134 = vshufps_avx(auVar277,auVar277,0xff);
  auVar83._0_4_ = auVar134._0_4_ * fVar69;
  auVar83._4_4_ = auVar134._4_4_ * fVar108;
  auVar83._8_4_ = auVar134._8_4_ * fVar109;
  auVar83._12_4_ = auVar134._12_4_ * fVar171;
  auVar118._0_4_ =
       auVar167._0_4_ * fVar69 + auVar134._0_4_ * auVar123._0_4_ * auVar71._0_4_ * auVar275._0_4_;
  auVar118._4_4_ =
       auVar167._4_4_ * fVar108 + auVar134._4_4_ * auVar123._4_4_ * auVar71._4_4_ * auVar275._4_4_;
  auVar118._8_4_ =
       auVar167._8_4_ * fVar109 + auVar134._8_4_ * auVar123._8_4_ * auVar71._8_4_ * auVar275._8_4_;
  auVar118._12_4_ =
       auVar167._12_4_ * fVar171 +
       auVar134._12_4_ * auVar123._12_4_ * auVar71._12_4_ * auVar275._12_4_;
  auVar134 = vsubps_avx(auVar277,auVar83);
  auVar123 = vsubps_avx(auVar70,auVar118);
  auVar167 = vshufps_avx(auVar307,auVar307,0xff);
  auVar275 = vshufps_avx(_local_4d8,_local_4d8,0xff);
  auVar244._0_4_ = auVar275._0_4_ * fVar185;
  auVar244._4_4_ = auVar275._4_4_ * fVar187;
  auVar244._8_4_ = auVar275._8_4_ * fVar189;
  auVar244._12_4_ = auVar275._12_4_ * fVar191;
  auVar119._0_4_ =
       auVar167._0_4_ * fVar185 + auVar275._0_4_ * auVar247._0_4_ * auVar157._0_4_ * auVar90._0_4_;
  auVar119._4_4_ =
       auVar167._4_4_ * fVar187 + auVar275._4_4_ * auVar247._4_4_ * auVar157._4_4_ * auVar90._4_4_;
  auVar119._8_4_ =
       auVar167._8_4_ * fVar189 + auVar275._8_4_ * auVar247._8_4_ * auVar157._8_4_ * auVar90._8_4_;
  auVar119._12_4_ =
       auVar167._12_4_ * fVar191 +
       auVar275._12_4_ * auVar247._12_4_ * auVar157._12_4_ * auVar90._12_4_;
  auVar167 = vsubps_avx(_local_4d8,auVar244);
  local_4d8._0_4_ = (float)local_4d8._0_4_ + auVar244._0_4_;
  local_4d8._4_4_ = (float)local_4d8._4_4_ + auVar244._4_4_;
  fStack_4d0 = fStack_4d0 + auVar244._8_4_;
  fStack_4cc = fStack_4cc + auVar244._12_4_;
  auVar275 = vsubps_avx(auVar307,auVar119);
  local_3e8._0_4_ = auVar252._0_4_;
  local_3e8._4_4_ = auVar252._4_4_;
  fStack_3e0 = auVar252._8_4_;
  fStack_3dc = auVar252._12_4_;
  local_308._0_4_ = auVar274._0_4_;
  local_308._4_4_ = auVar274._4_4_;
  fStack_300 = auVar274._8_4_;
  fStack_2fc = auVar274._12_4_;
  auVar90 = vshufps_avx(ZEXT416((uint)fVar264),ZEXT416((uint)fVar264),0);
  auVar247 = vshufps_avx(ZEXT416((uint)(1.0 - fVar264)),ZEXT416((uint)(1.0 - fVar264)),0);
  fVar171 = auVar90._0_4_;
  fVar185 = auVar90._4_4_;
  fVar187 = auVar90._8_4_;
  fVar189 = auVar90._12_4_;
  fVar264 = auVar247._0_4_;
  fVar69 = auVar247._4_4_;
  fVar108 = auVar247._8_4_;
  fVar109 = auVar247._12_4_;
  local_368._0_4_ = fVar264 * (float)local_308._0_4_ + fVar171 * auVar134._0_4_;
  local_368._4_4_ = fVar69 * (float)local_308._4_4_ + fVar185 * auVar134._4_4_;
  fStack_360 = fVar108 * fStack_300 + fVar187 * auVar134._8_4_;
  fStack_35c = fVar109 * fStack_2fc + fVar189 * auVar134._12_4_;
  local_378._0_4_ =
       fVar264 * ((float)local_308._0_4_ + (float)local_3e8._0_4_ * 0.33333334) +
       fVar171 * (auVar134._0_4_ + auVar123._0_4_ * 0.33333334);
  local_378._4_4_ =
       fVar69 * ((float)local_308._4_4_ + (float)local_3e8._4_4_ * 0.33333334) +
       fVar185 * (auVar134._4_4_ + auVar123._4_4_ * 0.33333334);
  fStack_370 = fVar108 * (fStack_300 + fStack_3e0 * 0.33333334) +
               fVar187 * (auVar134._8_4_ + auVar123._8_4_ * 0.33333334);
  fStack_36c = fVar109 * (fStack_2fc + fStack_3dc * 0.33333334) +
               fVar189 * (auVar134._12_4_ + auVar123._12_4_ * 0.33333334);
  local_468._0_4_ = auVar302._0_4_;
  local_468._4_4_ = auVar302._4_4_;
  fStack_460 = auVar302._8_4_;
  fStack_45c = auVar302._12_4_;
  auVar179._0_4_ = (float)local_468._0_4_ * 0.33333334;
  auVar179._4_4_ = (float)local_468._4_4_ * 0.33333334;
  auVar179._8_4_ = fStack_460 * 0.33333334;
  auVar179._12_4_ = fStack_45c * 0.33333334;
  auVar90 = vsubps_avx(auVar14,auVar179);
  auVar245._0_4_ = (auVar286._0_4_ + auVar78._0_4_) * 0.33333334;
  auVar245._4_4_ = (auVar286._4_4_ + auVar78._4_4_) * 0.33333334;
  auVar245._8_4_ = (auVar286._8_4_ + auVar78._8_4_) * 0.33333334;
  auVar245._12_4_ = (auVar286._12_4_ + auVar78._12_4_) * 0.33333334;
  auVar247 = vsubps_avx(_local_4c8,auVar245);
  auVar152._0_4_ = auVar275._0_4_ * 0.33333334;
  auVar152._4_4_ = auVar275._4_4_ * 0.33333334;
  auVar152._8_4_ = auVar275._8_4_ * 0.33333334;
  auVar152._12_4_ = auVar275._12_4_ * 0.33333334;
  auVar275 = vsubps_avx(auVar167,auVar152);
  auVar300._0_4_ = (auVar307._0_4_ + auVar119._0_4_) * 0.33333334;
  auVar300._4_4_ = (auVar307._4_4_ + auVar119._4_4_) * 0.33333334;
  auVar300._8_4_ = (auVar307._8_4_ + auVar119._8_4_) * 0.33333334;
  auVar300._12_4_ = (auVar307._12_4_ + auVar119._12_4_) * 0.33333334;
  auVar134 = vsubps_avx(_local_4d8,auVar300);
  local_388._0_4_ = fVar264 * auVar90._0_4_ + fVar171 * auVar275._0_4_;
  local_388._4_4_ = fVar69 * auVar90._4_4_ + fVar185 * auVar275._4_4_;
  fStack_380 = fVar108 * auVar90._8_4_ + fVar187 * auVar275._8_4_;
  fStack_37c = fVar109 * auVar90._12_4_ + fVar189 * auVar275._12_4_;
  local_3f8 = fVar171 * auVar167._0_4_ + fVar264 * auVar14._0_4_;
  fStack_3f4 = fVar185 * auVar167._4_4_ + fVar69 * auVar14._4_4_;
  fStack_3f0 = fVar187 * auVar167._8_4_ + fVar108 * auVar14._8_4_;
  fStack_3ec = fVar189 * auVar167._12_4_ + fVar109 * auVar14._12_4_;
  local_398._0_4_ = (float)local_4a8._0_4_ * fVar264 + fVar171 * (auVar277._0_4_ + auVar83._0_4_);
  local_398._4_4_ = (float)local_4a8._4_4_ * fVar69 + fVar185 * (auVar277._4_4_ + auVar83._4_4_);
  fStack_390 = fStack_4a0 * fVar108 + fVar187 * (auVar277._8_4_ + auVar83._8_4_);
  fStack_38c = fStack_49c * fVar109 + fVar189 * (auVar277._12_4_ + auVar83._12_4_);
  local_3a8._0_4_ =
       fVar264 * ((float)local_4a8._0_4_ + (fVar240 + auVar258._0_4_) * 0.33333334) +
       fVar171 * (auVar277._0_4_ + auVar83._0_4_ + (fVar214 + auVar118._0_4_) * 0.33333334);
  local_3a8._4_4_ =
       fVar69 * ((float)local_4a8._4_4_ + (fVar251 + auVar258._4_4_) * 0.33333334) +
       fVar185 * (auVar277._4_4_ + auVar83._4_4_ + (fVar217 + auVar118._4_4_) * 0.33333334);
  fStack_3a0 = fVar108 * (fStack_4a0 + (fVar320 + auVar258._8_4_) * 0.33333334) +
               fVar187 * (auVar277._8_4_ + auVar83._8_4_ + (fVar220 + auVar118._8_4_) * 0.33333334);
  fStack_39c = fVar109 * (fStack_49c + (fVar321 + auVar258._12_4_) * 0.33333334) +
               fVar189 * (auVar277._12_4_ + auVar83._12_4_ +
                         (fVar223 + auVar118._12_4_) * 0.33333334);
  local_3b8 = fVar264 * auVar247._0_4_ + fVar171 * auVar134._0_4_;
  fStack_3b4 = fVar69 * auVar247._4_4_ + fVar185 * auVar134._4_4_;
  fStack_3b0 = fVar108 * auVar247._8_4_ + fVar187 * auVar134._8_4_;
  fStack_3ac = fVar109 * auVar247._12_4_ + fVar189 * auVar134._12_4_;
  local_3c8._0_4_ = (float)local_4c8._0_4_ * fVar264 + fVar171 * (float)local_4d8._0_4_;
  local_3c8._4_4_ = (float)local_4c8._4_4_ * fVar69 + fVar185 * (float)local_4d8._4_4_;
  fStack_3c0 = fStack_4c0 * fVar108 + fVar187 * fStack_4d0;
  fStack_3bc = fStack_4bc * fVar109 + fVar189 * fStack_4cc;
  aVar6 = (ray->org).field_0;
  auVar167 = vsubps_avx(_local_368,(undefined1  [16])aVar6);
  auVar247 = vmovsldup_avx(auVar167);
  auVar90 = vmovshdup_avx(auVar167);
  auVar167 = vshufps_avx(auVar167,auVar167,0xaa);
  fVar264 = (pre->ray_space).vx.field_0.m128[0];
  fVar69 = (pre->ray_space).vx.field_0.m128[1];
  fVar108 = (pre->ray_space).vx.field_0.m128[2];
  fVar109 = (pre->ray_space).vx.field_0.m128[3];
  fVar171 = (pre->ray_space).vy.field_0.m128[0];
  fVar185 = (pre->ray_space).vy.field_0.m128[1];
  fVar187 = (pre->ray_space).vy.field_0.m128[2];
  fVar189 = (pre->ray_space).vy.field_0.m128[3];
  fVar191 = (pre->ray_space).vz.field_0.m128[0];
  fVar214 = (pre->ray_space).vz.field_0.m128[1];
  fVar217 = (pre->ray_space).vz.field_0.m128[2];
  fVar220 = (pre->ray_space).vz.field_0.m128[3];
  local_4e8._0_4_ = fVar264 * auVar247._0_4_ + fVar171 * auVar90._0_4_ + fVar191 * auVar167._0_4_;
  local_4e8._4_4_ = fVar69 * auVar247._4_4_ + fVar185 * auVar90._4_4_ + fVar214 * auVar167._4_4_;
  fStack_4e0 = fVar108 * auVar247._8_4_ + fVar187 * auVar90._8_4_ + fVar217 * auVar167._8_4_;
  fStack_4dc = fVar109 * auVar247._12_4_ + fVar189 * auVar90._12_4_ + fVar220 * auVar167._12_4_;
  auVar167 = vsubps_avx(_local_378,(undefined1  [16])aVar6);
  auVar247 = vmovsldup_avx(auVar167);
  auVar90 = vmovshdup_avx(auVar167);
  auVar167 = vshufps_avx(auVar167,auVar167,0xaa);
  auVar120._0_8_ =
       CONCAT44(fVar69 * auVar247._4_4_ + fVar185 * auVar90._4_4_ + fVar214 * auVar167._4_4_,
                fVar264 * auVar247._0_4_ + fVar171 * auVar90._0_4_ + fVar191 * auVar167._0_4_);
  auVar120._8_4_ = fVar108 * auVar247._8_4_ + fVar187 * auVar90._8_4_ + fVar217 * auVar167._8_4_;
  auVar120._12_4_ = fVar109 * auVar247._12_4_ + fVar189 * auVar90._12_4_ + fVar220 * auVar167._12_4_
  ;
  auVar247 = vsubps_avx(_local_388,(undefined1  [16])aVar6);
  auVar167 = vshufps_avx(auVar247,auVar247,0xaa);
  auVar90 = vmovshdup_avx(auVar247);
  auVar247 = vmovsldup_avx(auVar247);
  auVar180._0_8_ =
       CONCAT44(fVar69 * auVar247._4_4_ + auVar90._4_4_ * fVar185 + fVar214 * auVar167._4_4_,
                fVar264 * auVar247._0_4_ + auVar90._0_4_ * fVar171 + fVar191 * auVar167._0_4_);
  auVar180._8_4_ = fVar108 * auVar247._8_4_ + auVar90._8_4_ * fVar187 + fVar217 * auVar167._8_4_;
  auVar180._12_4_ = fVar109 * auVar247._12_4_ + auVar90._12_4_ * fVar189 + fVar220 * auVar167._12_4_
  ;
  auVar53._4_4_ = fStack_3f4;
  auVar53._0_4_ = local_3f8;
  auVar53._8_4_ = fStack_3f0;
  auVar53._12_4_ = fStack_3ec;
  auVar247 = vsubps_avx(auVar53,(undefined1  [16])aVar6);
  auVar167 = vshufps_avx(auVar247,auVar247,0xaa);
  auVar90 = vmovshdup_avx(auVar247);
  auVar247 = vmovsldup_avx(auVar247);
  auVar259._0_8_ =
       CONCAT44(auVar90._4_4_ * fVar185 + auVar167._4_4_ * fVar214 + fVar69 * auVar247._4_4_,
                auVar90._0_4_ * fVar171 + auVar167._0_4_ * fVar191 + fVar264 * auVar247._0_4_);
  auVar259._8_4_ = auVar90._8_4_ * fVar187 + auVar167._8_4_ * fVar217 + fVar108 * auVar247._8_4_;
  auVar259._12_4_ = auVar90._12_4_ * fVar189 + auVar167._12_4_ * fVar220 + fVar109 * auVar247._12_4_
  ;
  auVar247 = vsubps_avx(_local_398,(undefined1  [16])aVar6);
  auVar167 = vshufps_avx(auVar247,auVar247,0xaa);
  auVar90 = vmovshdup_avx(auVar247);
  auVar247 = vmovsldup_avx(auVar247);
  auVar278._0_8_ =
       CONCAT44(auVar247._4_4_ * fVar69 + auVar90._4_4_ * fVar185 + auVar167._4_4_ * fVar214,
                auVar247._0_4_ * fVar264 + auVar90._0_4_ * fVar171 + auVar167._0_4_ * fVar191);
  auVar278._8_4_ = auVar247._8_4_ * fVar108 + auVar90._8_4_ * fVar187 + auVar167._8_4_ * fVar217;
  auVar278._12_4_ = auVar247._12_4_ * fVar109 + auVar90._12_4_ * fVar189 + auVar167._12_4_ * fVar220
  ;
  auVar247 = vsubps_avx(_local_3a8,(undefined1  [16])aVar6);
  auVar167 = vshufps_avx(auVar247,auVar247,0xaa);
  auVar90 = vmovshdup_avx(auVar247);
  auVar247 = vmovsldup_avx(auVar247);
  auVar287._0_8_ =
       CONCAT44(auVar247._4_4_ * fVar69 + auVar90._4_4_ * fVar185 + auVar167._4_4_ * fVar214,
                auVar247._0_4_ * fVar264 + auVar90._0_4_ * fVar171 + auVar167._0_4_ * fVar191);
  auVar287._8_4_ = auVar247._8_4_ * fVar108 + auVar90._8_4_ * fVar187 + auVar167._8_4_ * fVar217;
  auVar287._12_4_ = auVar247._12_4_ * fVar109 + auVar90._12_4_ * fVar189 + auVar167._12_4_ * fVar220
  ;
  auVar56._4_4_ = fStack_3b4;
  auVar56._0_4_ = local_3b8;
  auVar56._8_4_ = fStack_3b0;
  auVar56._12_4_ = fStack_3ac;
  auVar247 = vsubps_avx(auVar56,(undefined1  [16])aVar6);
  auVar167 = vshufps_avx(auVar247,auVar247,0xaa);
  auVar90 = vmovshdup_avx(auVar247);
  auVar247 = vmovsldup_avx(auVar247);
  auVar301._0_8_ =
       CONCAT44(auVar247._4_4_ * fVar69 + auVar90._4_4_ * fVar185 + auVar167._4_4_ * fVar214,
                auVar247._0_4_ * fVar264 + auVar90._0_4_ * fVar171 + auVar167._0_4_ * fVar191);
  auVar301._8_4_ = auVar247._8_4_ * fVar108 + auVar90._8_4_ * fVar187 + auVar167._8_4_ * fVar217;
  auVar301._12_4_ = auVar247._12_4_ * fVar109 + auVar90._12_4_ * fVar189 + auVar167._12_4_ * fVar220
  ;
  auVar247 = vsubps_avx(_local_3c8,(undefined1  [16])aVar6);
  auVar167 = vshufps_avx(auVar247,auVar247,0xaa);
  auVar90 = vmovshdup_avx(auVar247);
  auVar247 = vmovsldup_avx(auVar247);
  auVar84._0_8_ =
       CONCAT44(fVar69 * auVar247._4_4_ + auVar90._4_4_ * fVar185 + auVar167._4_4_ * fVar214,
                fVar264 * auVar247._0_4_ + auVar90._0_4_ * fVar171 + auVar167._0_4_ * fVar191);
  auVar84._8_4_ = fVar108 * auVar247._8_4_ + auVar90._8_4_ * fVar187 + auVar167._8_4_ * fVar217;
  auVar84._12_4_ = fVar109 * auVar247._12_4_ + auVar90._12_4_ * fVar189 + auVar167._12_4_ * fVar220;
  auVar275 = vmovlhps_avx(_local_4e8,auVar278);
  _local_438 = vmovlhps_avx(auVar120,auVar287);
  _local_448 = vmovlhps_avx(auVar180,auVar301);
  _local_298 = vmovlhps_avx(auVar259,auVar84);
  auVar90 = vminps_avx(auVar275,_local_438);
  auVar247 = vminps_avx(_local_448,_local_298);
  auVar167 = vminps_avx(auVar90,auVar247);
  auVar90 = vmaxps_avx(auVar275,_local_438);
  auVar247 = vmaxps_avx(_local_448,_local_298);
  auVar90 = vmaxps_avx(auVar90,auVar247);
  auVar247 = vshufpd_avx(auVar167,auVar167,3);
  auVar167 = vminps_avx(auVar167,auVar247);
  auVar247 = vshufpd_avx(auVar90,auVar90,3);
  auVar247 = vmaxps_avx(auVar90,auVar247);
  auVar246._8_4_ = 0x7fffffff;
  auVar246._0_8_ = 0x7fffffff7fffffff;
  auVar246._12_4_ = 0x7fffffff;
  auVar90 = vandps_avx(auVar167,auVar246);
  auVar247 = vandps_avx(auVar247,auVar246);
  auVar90 = vmaxps_avx(auVar90,auVar247);
  auVar247 = vmovshdup_avx(auVar90);
  auVar90 = vmaxss_avx(auVar247,auVar90);
  auVar67 = (undefined1  [8])((ulong)uVar59 + 0xf);
  fVar264 = auVar90._0_4_ * 9.536743e-07;
  register0x00001388 = auVar120._0_8_;
  local_478 = auVar120._0_8_;
  register0x000012c8 = auVar180._0_8_;
  local_488 = auVar180._0_8_;
  register0x000013c8 = auVar259._0_8_;
  local_318 = auVar259._0_8_;
  register0x00001408 = auVar278._0_8_;
  local_328 = auVar278._0_8_;
  register0x00001448 = auVar287._0_8_;
  local_338 = auVar287._0_8_;
  register0x00001488 = auVar301._0_8_;
  local_348 = auVar301._0_8_;
  register0x00001548 = auVar84._0_8_;
  local_358 = auVar84._0_8_;
  local_2a8 = ZEXT416((uint)fVar264);
  auVar90 = vshufps_avx(local_2a8,ZEXT416((uint)fVar264),0);
  local_198._16_16_ = auVar90;
  local_198._0_16_ = auVar90;
  auVar85._0_8_ = auVar90._0_8_ ^ 0x8000000080000000;
  auVar85._8_4_ = auVar90._8_4_ ^ 0x80000000;
  auVar85._12_4_ = auVar90._12_4_ ^ 0x80000000;
  local_1b8._16_16_ = auVar85;
  local_1b8._0_16_ = auVar85;
  bVar64 = false;
  uVar60 = 0;
  _local_1c8 = vsubps_avx(_local_438,auVar275);
  _local_1d8 = vsubps_avx(_local_448,_local_438);
  _local_1e8 = vsubps_avx(_local_298,_local_448);
  _local_218 = vsubps_avx(_local_398,_local_368);
  _local_228 = vsubps_avx(_local_3a8,_local_378);
  _local_238 = vsubps_avx(auVar56,_local_388);
  auVar54._4_4_ = fStack_3f4;
  auVar54._0_4_ = local_3f8;
  auVar54._8_4_ = fStack_3f0;
  auVar54._12_4_ = fStack_3ec;
  _local_248 = vsubps_avx(_local_3c8,auVar54);
  auVar86 = ZEXT816(0x3f80000000000000);
  auVar90 = auVar86;
LAB_00fb4a15:
  do {
    local_1f8 = auVar90;
    auVar247 = vshufps_avx(auVar86,auVar86,0x50);
    auVar329._8_4_ = 0x3f800000;
    auVar329._0_8_ = 0x3f8000003f800000;
    auVar329._12_4_ = 0x3f800000;
    auVar333._16_4_ = 0x3f800000;
    auVar333._0_16_ = auVar329;
    auVar333._20_4_ = 0x3f800000;
    auVar333._24_4_ = 0x3f800000;
    auVar333._28_4_ = 0x3f800000;
    auVar167 = vsubps_avx(auVar329,auVar247);
    fVar264 = auVar247._0_4_;
    fVar69 = auVar247._4_4_;
    fVar108 = auVar247._8_4_;
    fVar109 = auVar247._12_4_;
    fVar171 = auVar167._0_4_;
    fVar185 = auVar167._4_4_;
    fVar187 = auVar167._8_4_;
    fVar189 = auVar167._12_4_;
    auVar181._0_4_ = local_328._0_4_ * fVar264 + fVar171 * (float)local_4e8._0_4_;
    auVar181._4_4_ = local_328._4_4_ * fVar69 + fVar185 * (float)local_4e8._4_4_;
    auVar181._8_4_ = local_328._8_4_ * fVar108 + fVar187 * (float)local_4e8._0_4_;
    auVar181._12_4_ = local_328._12_4_ * fVar109 + fVar189 * (float)local_4e8._4_4_;
    auVar153._0_4_ = local_338._0_4_ * fVar264 + fVar171 * local_478._0_4_;
    auVar153._4_4_ = local_338._4_4_ * fVar69 + fVar185 * local_478._4_4_;
    auVar153._8_4_ = local_338._8_4_ * fVar108 + fVar187 * local_478._8_4_;
    auVar153._12_4_ = local_338._12_4_ * fVar109 + fVar189 * local_478._12_4_;
    auVar260._0_4_ = local_348._0_4_ * fVar264 + fVar171 * local_488._0_4_;
    auVar260._4_4_ = local_348._4_4_ * fVar69 + fVar185 * local_488._4_4_;
    auVar260._8_4_ = local_348._8_4_ * fVar108 + fVar187 * local_488._8_4_;
    auVar260._12_4_ = local_348._12_4_ * fVar109 + fVar189 * local_488._12_4_;
    auVar200._0_4_ = local_358._0_4_ * fVar264 + local_318._0_4_ * fVar171;
    auVar200._4_4_ = local_358._4_4_ * fVar69 + local_318._4_4_ * fVar185;
    auVar200._8_4_ = local_358._8_4_ * fVar108 + local_318._8_4_ * fVar187;
    auVar200._12_4_ = local_358._12_4_ * fVar109 + local_318._12_4_ * fVar189;
    auVar247 = vmovshdup_avx(auVar90);
    auVar167 = vshufps_avx(auVar90,auVar90,0);
    auVar293._16_16_ = auVar167;
    auVar293._0_16_ = auVar167;
    auVar134 = vshufps_avx(auVar90,auVar90,0x55);
    auVar103._16_16_ = auVar134;
    auVar103._0_16_ = auVar134;
    auVar102 = vsubps_avx(auVar103,auVar293);
    auVar134 = vshufps_avx(auVar181,auVar181,0);
    auVar123 = vshufps_avx(auVar181,auVar181,0x55);
    auVar157 = vshufps_avx(auVar153,auVar153,0);
    auVar124 = vshufps_avx(auVar153,auVar153,0x55);
    auVar252 = vshufps_avx(auVar260,auVar260,0);
    auVar274 = vshufps_avx(auVar260,auVar260,0x55);
    auVar14 = vshufps_avx(auVar200,auVar200,0);
    auVar302 = vshufps_avx(auVar200,auVar200,0x55);
    auVar247 = ZEXT416((uint)((auVar247._0_4_ - auVar90._0_4_) * 0.04761905));
    auVar247 = vshufps_avx(auVar247,auVar247,0);
    auVar305._0_4_ = auVar167._0_4_ + auVar102._0_4_ * 0.0;
    auVar305._4_4_ = auVar167._4_4_ + auVar102._4_4_ * 0.14285715;
    auVar305._8_4_ = auVar167._8_4_ + auVar102._8_4_ * 0.2857143;
    auVar305._12_4_ = auVar167._12_4_ + auVar102._12_4_ * 0.42857146;
    auVar305._16_4_ = auVar167._0_4_ + auVar102._16_4_ * 0.5714286;
    auVar305._20_4_ = auVar167._4_4_ + auVar102._20_4_ * 0.71428573;
    auVar305._24_4_ = auVar167._8_4_ + auVar102._24_4_ * 0.8571429;
    auVar305._28_4_ = auVar167._12_4_ + auVar102._28_4_;
    auVar15 = vsubps_avx(auVar333,auVar305);
    fVar264 = auVar157._0_4_;
    fVar108 = auVar157._4_4_;
    fVar171 = auVar157._8_4_;
    fVar187 = auVar157._12_4_;
    fVar284 = auVar15._0_4_;
    fVar193 = auVar15._4_4_;
    fVar216 = auVar15._8_4_;
    fVar219 = auVar15._12_4_;
    fVar222 = auVar15._16_4_;
    fVar240 = auVar15._20_4_;
    fVar251 = auVar15._24_4_;
    fVar190 = auVar124._0_4_;
    fVar215 = auVar124._4_4_;
    fVar221 = auVar124._8_4_;
    fVar283 = auVar124._12_4_;
    fVar327 = auVar123._12_4_ + 1.0;
    fVar239 = auVar252._0_4_;
    fVar172 = auVar252._4_4_;
    fVar186 = auVar252._8_4_;
    fVar188 = auVar252._12_4_;
    fVar191 = fVar239 * auVar305._0_4_ + fVar284 * fVar264;
    fVar214 = fVar172 * auVar305._4_4_ + fVar193 * fVar108;
    fVar217 = fVar186 * auVar305._8_4_ + fVar216 * fVar171;
    fVar220 = fVar188 * auVar305._12_4_ + fVar219 * fVar187;
    fVar223 = fVar239 * auVar305._16_4_ + fVar222 * fVar264;
    fVar236 = fVar172 * auVar305._20_4_ + fVar240 * fVar108;
    fVar237 = fVar186 * auVar305._24_4_ + fVar251 * fVar171;
    fVar69 = auVar274._0_4_;
    fVar109 = auVar274._4_4_;
    fVar185 = auVar274._8_4_;
    fVar189 = auVar274._12_4_;
    fVar192 = fVar190 * fVar284 + auVar305._0_4_ * fVar69;
    fVar218 = fVar215 * fVar193 + auVar305._4_4_ * fVar109;
    fVar318 = fVar221 * fVar216 + auVar305._8_4_ * fVar185;
    fVar319 = fVar283 * fVar219 + auVar305._12_4_ * fVar189;
    fVar320 = fVar190 * fVar222 + auVar305._16_4_ * fVar69;
    fVar321 = fVar215 * fVar240 + auVar305._20_4_ * fVar109;
    fVar322 = fVar221 * fVar251 + auVar305._24_4_ * fVar185;
    fVar323 = fVar283 + fVar187;
    auVar167 = vshufps_avx(auVar181,auVar181,0xaa);
    auVar157 = vshufps_avx(auVar181,auVar181,0xff);
    fVar238 = fVar188 + 0.0;
    auVar124 = vshufps_avx(auVar153,auVar153,0xaa);
    auVar252 = vshufps_avx(auVar153,auVar153,0xff);
    auVar212._0_4_ =
         fVar284 * (auVar305._0_4_ * fVar264 + fVar284 * auVar134._0_4_) + auVar305._0_4_ * fVar191;
    auVar212._4_4_ =
         fVar193 * (auVar305._4_4_ * fVar108 + fVar193 * auVar134._4_4_) + auVar305._4_4_ * fVar214;
    auVar212._8_4_ =
         fVar216 * (auVar305._8_4_ * fVar171 + fVar216 * auVar134._8_4_) + auVar305._8_4_ * fVar217;
    auVar212._12_4_ =
         fVar219 * (auVar305._12_4_ * fVar187 + fVar219 * auVar134._12_4_) +
         auVar305._12_4_ * fVar220;
    auVar212._16_4_ =
         fVar222 * (auVar305._16_4_ * fVar264 + fVar222 * auVar134._0_4_) +
         auVar305._16_4_ * fVar223;
    auVar212._20_4_ =
         fVar240 * (auVar305._20_4_ * fVar108 + fVar240 * auVar134._4_4_) +
         auVar305._20_4_ * fVar236;
    auVar212._24_4_ =
         fVar251 * (auVar305._24_4_ * fVar171 + fVar251 * auVar134._8_4_) +
         auVar305._24_4_ * fVar237;
    auVar212._28_4_ = auVar134._12_4_ + 1.0 + fVar189;
    auVar234._0_4_ =
         fVar284 * (fVar190 * auVar305._0_4_ + auVar123._0_4_ * fVar284) + auVar305._0_4_ * fVar192;
    auVar234._4_4_ =
         fVar193 * (fVar215 * auVar305._4_4_ + auVar123._4_4_ * fVar193) + auVar305._4_4_ * fVar218;
    auVar234._8_4_ =
         fVar216 * (fVar221 * auVar305._8_4_ + auVar123._8_4_ * fVar216) + auVar305._8_4_ * fVar318;
    auVar234._12_4_ =
         fVar219 * (fVar283 * auVar305._12_4_ + auVar123._12_4_ * fVar219) +
         auVar305._12_4_ * fVar319;
    auVar234._16_4_ =
         fVar222 * (fVar190 * auVar305._16_4_ + auVar123._0_4_ * fVar222) +
         auVar305._16_4_ * fVar320;
    auVar234._20_4_ =
         fVar240 * (fVar215 * auVar305._20_4_ + auVar123._4_4_ * fVar240) +
         auVar305._20_4_ * fVar321;
    auVar234._24_4_ =
         fVar251 * (fVar221 * auVar305._24_4_ + auVar123._8_4_ * fVar251) +
         auVar305._24_4_ * fVar322;
    auVar234._28_4_ = auVar302._12_4_ + fVar189;
    auVar104._0_4_ =
         fVar284 * fVar191 + auVar305._0_4_ * (fVar239 * fVar284 + auVar14._0_4_ * auVar305._0_4_);
    auVar104._4_4_ =
         fVar193 * fVar214 + auVar305._4_4_ * (fVar172 * fVar193 + auVar14._4_4_ * auVar305._4_4_);
    auVar104._8_4_ =
         fVar216 * fVar217 + auVar305._8_4_ * (fVar186 * fVar216 + auVar14._8_4_ * auVar305._8_4_);
    auVar104._12_4_ =
         fVar219 * fVar220 +
         auVar305._12_4_ * (fVar188 * fVar219 + auVar14._12_4_ * auVar305._12_4_);
    auVar104._16_4_ =
         fVar222 * fVar223 + auVar305._16_4_ * (fVar239 * fVar222 + auVar14._0_4_ * auVar305._16_4_)
    ;
    auVar104._20_4_ =
         fVar240 * fVar236 + auVar305._20_4_ * (fVar172 * fVar240 + auVar14._4_4_ * auVar305._20_4_)
    ;
    auVar104._24_4_ =
         fVar251 * fVar237 + auVar305._24_4_ * (fVar186 * fVar251 + auVar14._8_4_ * auVar305._24_4_)
    ;
    auVar104._28_4_ = fVar187 + 1.0 + fVar238;
    auVar312._0_4_ =
         fVar284 * fVar192 + auVar305._0_4_ * (auVar302._0_4_ * auVar305._0_4_ + fVar284 * fVar69);
    auVar312._4_4_ =
         fVar193 * fVar218 + auVar305._4_4_ * (auVar302._4_4_ * auVar305._4_4_ + fVar193 * fVar109);
    auVar312._8_4_ =
         fVar216 * fVar318 + auVar305._8_4_ * (auVar302._8_4_ * auVar305._8_4_ + fVar216 * fVar185);
    auVar312._12_4_ =
         fVar219 * fVar319 +
         auVar305._12_4_ * (auVar302._12_4_ * auVar305._12_4_ + fVar219 * fVar189);
    auVar312._16_4_ =
         fVar222 * fVar320 + auVar305._16_4_ * (auVar302._0_4_ * auVar305._16_4_ + fVar222 * fVar69)
    ;
    auVar312._20_4_ =
         fVar240 * fVar321 +
         auVar305._20_4_ * (auVar302._4_4_ * auVar305._20_4_ + fVar240 * fVar109);
    auVar312._24_4_ =
         fVar251 * fVar322 +
         auVar305._24_4_ * (auVar302._8_4_ * auVar305._24_4_ + fVar251 * fVar185);
    auVar312._28_4_ = fVar238 + fVar189 + 0.0;
    local_98._0_4_ = fVar284 * auVar212._0_4_ + auVar305._0_4_ * auVar104._0_4_;
    local_98._4_4_ = fVar193 * auVar212._4_4_ + auVar305._4_4_ * auVar104._4_4_;
    local_98._8_4_ = fVar216 * auVar212._8_4_ + auVar305._8_4_ * auVar104._8_4_;
    local_98._12_4_ = fVar219 * auVar212._12_4_ + auVar305._12_4_ * auVar104._12_4_;
    local_98._16_4_ = fVar222 * auVar212._16_4_ + auVar305._16_4_ * auVar104._16_4_;
    local_98._20_4_ = fVar240 * auVar212._20_4_ + auVar305._20_4_ * auVar104._20_4_;
    local_98._24_4_ = fVar251 * auVar212._24_4_ + auVar305._24_4_ * auVar104._24_4_;
    local_98._28_4_ = fVar323 + fVar189 + 0.0;
    auVar184._0_4_ = fVar284 * auVar234._0_4_ + auVar305._0_4_ * auVar312._0_4_;
    auVar184._4_4_ = fVar193 * auVar234._4_4_ + auVar305._4_4_ * auVar312._4_4_;
    auVar184._8_4_ = fVar216 * auVar234._8_4_ + auVar305._8_4_ * auVar312._8_4_;
    auVar184._12_4_ = fVar219 * auVar234._12_4_ + auVar305._12_4_ * auVar312._12_4_;
    auVar184._16_4_ = fVar222 * auVar234._16_4_ + auVar305._16_4_ * auVar312._16_4_;
    auVar184._20_4_ = fVar240 * auVar234._20_4_ + auVar305._20_4_ * auVar312._20_4_;
    auVar184._24_4_ = fVar251 * auVar234._24_4_ + auVar305._24_4_ * auVar312._24_4_;
    auVar184._28_4_ = fVar323 + fVar238;
    auVar16 = vsubps_avx(auVar104,auVar212);
    auVar102 = vsubps_avx(auVar312,auVar234);
    local_3e8._0_4_ = auVar247._0_4_;
    local_3e8._4_4_ = auVar247._4_4_;
    fStack_3e0 = auVar247._8_4_;
    fStack_3dc = auVar247._12_4_;
    local_d8 = (float)local_3e8._0_4_ * auVar16._0_4_ * 3.0;
    fStack_d4 = (float)local_3e8._4_4_ * auVar16._4_4_ * 3.0;
    auVar17._4_4_ = fStack_d4;
    auVar17._0_4_ = local_d8;
    fStack_d0 = fStack_3e0 * auVar16._8_4_ * 3.0;
    auVar17._8_4_ = fStack_d0;
    fStack_cc = fStack_3dc * auVar16._12_4_ * 3.0;
    auVar17._12_4_ = fStack_cc;
    fStack_c8 = (float)local_3e8._0_4_ * auVar16._16_4_ * 3.0;
    auVar17._16_4_ = fStack_c8;
    fStack_c4 = (float)local_3e8._4_4_ * auVar16._20_4_ * 3.0;
    auVar17._20_4_ = fStack_c4;
    fStack_c0 = fStack_3e0 * auVar16._24_4_ * 3.0;
    auVar17._24_4_ = fStack_c0;
    auVar17._28_4_ = auVar16._28_4_;
    local_f8 = (float)local_3e8._0_4_ * auVar102._0_4_ * 3.0;
    fStack_f4 = (float)local_3e8._4_4_ * auVar102._4_4_ * 3.0;
    auVar18._4_4_ = fStack_f4;
    auVar18._0_4_ = local_f8;
    fStack_f0 = fStack_3e0 * auVar102._8_4_ * 3.0;
    auVar18._8_4_ = fStack_f0;
    fStack_ec = fStack_3dc * auVar102._12_4_ * 3.0;
    auVar18._12_4_ = fStack_ec;
    fStack_e8 = (float)local_3e8._0_4_ * auVar102._16_4_ * 3.0;
    auVar18._16_4_ = fStack_e8;
    fStack_e4 = (float)local_3e8._4_4_ * auVar102._20_4_ * 3.0;
    auVar18._20_4_ = fStack_e4;
    fStack_e0 = fStack_3e0 * auVar102._24_4_ * 3.0;
    auVar18._24_4_ = fStack_e0;
    auVar18._28_4_ = fVar323;
    auVar17 = vsubps_avx(local_98,auVar17);
    auVar102 = vperm2f128_avx(auVar17,auVar17,1);
    auVar102 = vshufps_avx(auVar102,auVar17,0x30);
    auVar102 = vshufps_avx(auVar17,auVar102,0x29);
    auVar18 = vsubps_avx(auVar184,auVar18);
    auVar17 = vperm2f128_avx(auVar18,auVar18,1);
    auVar17 = vshufps_avx(auVar17,auVar18,0x30);
    _local_428 = vshufps_avx(auVar18,auVar17,0x29);
    fVar321 = auVar124._0_4_;
    fVar322 = auVar124._4_4_;
    fVar336 = auVar124._8_4_;
    fVar187 = auVar167._12_4_;
    fVar172 = auVar252._0_4_;
    fVar188 = auVar252._4_4_;
    fVar192 = auVar252._8_4_;
    fVar218 = auVar252._12_4_;
    auVar247 = vshufps_avx(auVar260,auVar260,0xaa);
    fVar264 = auVar247._0_4_;
    fVar108 = auVar247._4_4_;
    fVar171 = auVar247._8_4_;
    fVar189 = auVar247._12_4_;
    fVar217 = auVar305._0_4_ * fVar264 + fVar321 * fVar284;
    fVar220 = auVar305._4_4_ * fVar108 + fVar322 * fVar193;
    fVar223 = auVar305._8_4_ * fVar171 + fVar336 * fVar216;
    fVar236 = auVar305._12_4_ * fVar189 + auVar124._12_4_ * fVar219;
    fVar237 = auVar305._16_4_ * fVar264 + fVar321 * fVar222;
    fVar238 = auVar305._20_4_ * fVar108 + fVar322 * fVar240;
    fVar239 = auVar305._24_4_ * fVar171 + fVar336 * fVar251;
    auVar247 = vshufps_avx(auVar260,auVar260,0xff);
    fVar69 = auVar247._0_4_;
    fVar109 = auVar247._4_4_;
    fVar185 = auVar247._8_4_;
    fVar191 = auVar247._12_4_;
    fVar186 = auVar305._0_4_ * fVar69 + fVar172 * fVar284;
    fVar190 = auVar305._4_4_ * fVar109 + fVar188 * fVar193;
    fVar215 = auVar305._8_4_ * fVar185 + fVar192 * fVar216;
    fVar221 = auVar305._12_4_ * fVar191 + fVar218 * fVar219;
    fVar318 = auVar305._16_4_ * fVar69 + fVar172 * fVar222;
    fVar283 = auVar305._20_4_ * fVar109 + fVar188 * fVar240;
    fVar319 = auVar305._24_4_ * fVar185 + fVar192 * fVar251;
    auVar247 = vshufps_avx(auVar200,auVar200,0xaa);
    fVar320 = auVar247._12_4_ + fVar189;
    auVar134 = vshufps_avx(auVar200,auVar200,0xff);
    fVar214 = auVar134._12_4_;
    auVar105._0_4_ =
         fVar284 * (fVar321 * auVar305._0_4_ + fVar284 * auVar167._0_4_) + auVar305._0_4_ * fVar217;
    auVar105._4_4_ =
         fVar193 * (fVar322 * auVar305._4_4_ + fVar193 * auVar167._4_4_) + auVar305._4_4_ * fVar220;
    auVar105._8_4_ =
         fVar216 * (fVar336 * auVar305._8_4_ + fVar216 * auVar167._8_4_) + auVar305._8_4_ * fVar223;
    auVar105._12_4_ =
         fVar219 * (auVar124._12_4_ * auVar305._12_4_ + fVar219 * fVar187) +
         auVar305._12_4_ * fVar236;
    auVar105._16_4_ =
         fVar222 * (fVar321 * auVar305._16_4_ + fVar222 * auVar167._0_4_) +
         auVar305._16_4_ * fVar237;
    auVar105._20_4_ =
         fVar240 * (fVar322 * auVar305._20_4_ + fVar240 * auVar167._4_4_) +
         auVar305._20_4_ * fVar238;
    auVar105._24_4_ =
         fVar251 * (fVar336 * auVar305._24_4_ + fVar251 * auVar167._8_4_) +
         auVar305._24_4_ * fVar239;
    auVar105._28_4_ = local_428._28_4_ + fVar187 + fVar214;
    auVar139._0_4_ =
         fVar284 * (fVar172 * auVar305._0_4_ + auVar157._0_4_ * fVar284) + auVar305._0_4_ * fVar186;
    auVar139._4_4_ =
         fVar193 * (fVar188 * auVar305._4_4_ + auVar157._4_4_ * fVar193) + auVar305._4_4_ * fVar190;
    auVar139._8_4_ =
         fVar216 * (fVar192 * auVar305._8_4_ + auVar157._8_4_ * fVar216) + auVar305._8_4_ * fVar215;
    auVar139._12_4_ =
         fVar219 * (fVar218 * auVar305._12_4_ + auVar157._12_4_ * fVar219) +
         auVar305._12_4_ * fVar221;
    auVar139._16_4_ =
         fVar222 * (fVar172 * auVar305._16_4_ + auVar157._0_4_ * fVar222) +
         auVar305._16_4_ * fVar318;
    auVar139._20_4_ =
         fVar240 * (fVar188 * auVar305._20_4_ + auVar157._4_4_ * fVar240) +
         auVar305._20_4_ * fVar283;
    auVar139._24_4_ =
         fVar251 * (fVar192 * auVar305._24_4_ + auVar157._8_4_ * fVar251) +
         auVar305._24_4_ * fVar319;
    auVar139._28_4_ = fVar187 + auVar17._28_4_ + fVar214;
    auVar17 = vperm2f128_avx(local_98,local_98,1);
    auVar17 = vshufps_avx(auVar17,local_98,0x30);
    _local_308 = vshufps_avx(local_98,auVar17,0x29);
    auVar235._0_4_ =
         auVar305._0_4_ * (auVar247._0_4_ * auVar305._0_4_ + fVar284 * fVar264) + fVar284 * fVar217;
    auVar235._4_4_ =
         auVar305._4_4_ * (auVar247._4_4_ * auVar305._4_4_ + fVar193 * fVar108) + fVar193 * fVar220;
    auVar235._8_4_ =
         auVar305._8_4_ * (auVar247._8_4_ * auVar305._8_4_ + fVar216 * fVar171) + fVar216 * fVar223;
    auVar235._12_4_ =
         auVar305._12_4_ * (auVar247._12_4_ * auVar305._12_4_ + fVar219 * fVar189) +
         fVar219 * fVar236;
    auVar235._16_4_ =
         auVar305._16_4_ * (auVar247._0_4_ * auVar305._16_4_ + fVar222 * fVar264) +
         fVar222 * fVar237;
    auVar235._20_4_ =
         auVar305._20_4_ * (auVar247._4_4_ * auVar305._20_4_ + fVar240 * fVar108) +
         fVar240 * fVar238;
    auVar235._24_4_ =
         auVar305._24_4_ * (auVar247._8_4_ * auVar305._24_4_ + fVar251 * fVar171) +
         fVar251 * fVar239;
    auVar235._28_4_ = fVar320 + fVar327 + auVar234._28_4_;
    auVar282._0_4_ =
         fVar284 * fVar186 + auVar305._0_4_ * (auVar305._0_4_ * auVar134._0_4_ + fVar284 * fVar69);
    auVar282._4_4_ =
         fVar193 * fVar190 + auVar305._4_4_ * (auVar305._4_4_ * auVar134._4_4_ + fVar193 * fVar109);
    auVar282._8_4_ =
         fVar216 * fVar215 + auVar305._8_4_ * (auVar305._8_4_ * auVar134._8_4_ + fVar216 * fVar185);
    auVar282._12_4_ =
         fVar219 * fVar221 + auVar305._12_4_ * (auVar305._12_4_ * fVar214 + fVar219 * fVar191);
    auVar282._16_4_ =
         fVar222 * fVar318 + auVar305._16_4_ * (auVar305._16_4_ * auVar134._0_4_ + fVar222 * fVar69)
    ;
    auVar282._20_4_ =
         fVar240 * fVar283 +
         auVar305._20_4_ * (auVar305._20_4_ * auVar134._4_4_ + fVar240 * fVar109);
    auVar282._24_4_ =
         fVar251 * fVar319 +
         auVar305._24_4_ * (auVar305._24_4_ * auVar134._8_4_ + fVar251 * fVar185);
    auVar282._28_4_ = fVar327 + fVar218 + fVar214 + fVar191;
    auVar263._0_4_ = fVar284 * auVar105._0_4_ + auVar305._0_4_ * auVar235._0_4_;
    auVar263._4_4_ = fVar193 * auVar105._4_4_ + auVar305._4_4_ * auVar235._4_4_;
    auVar263._8_4_ = fVar216 * auVar105._8_4_ + auVar305._8_4_ * auVar235._8_4_;
    auVar263._12_4_ = fVar219 * auVar105._12_4_ + auVar305._12_4_ * auVar235._12_4_;
    auVar263._16_4_ = fVar222 * auVar105._16_4_ + auVar305._16_4_ * auVar235._16_4_;
    auVar263._20_4_ = fVar240 * auVar105._20_4_ + auVar305._20_4_ * auVar235._20_4_;
    auVar263._24_4_ = fVar251 * auVar105._24_4_ + auVar305._24_4_ * auVar235._24_4_;
    auVar263._28_4_ = fVar320 + fVar214 + fVar191;
    auVar294._0_4_ = fVar284 * auVar139._0_4_ + auVar305._0_4_ * auVar282._0_4_;
    auVar294._4_4_ = fVar193 * auVar139._4_4_ + auVar305._4_4_ * auVar282._4_4_;
    auVar294._8_4_ = fVar216 * auVar139._8_4_ + auVar305._8_4_ * auVar282._8_4_;
    auVar294._12_4_ = fVar219 * auVar139._12_4_ + auVar305._12_4_ * auVar282._12_4_;
    auVar294._16_4_ = fVar222 * auVar139._16_4_ + auVar305._16_4_ * auVar282._16_4_;
    auVar294._20_4_ = fVar240 * auVar139._20_4_ + auVar305._20_4_ * auVar282._20_4_;
    auVar294._24_4_ = fVar251 * auVar139._24_4_ + auVar305._24_4_ * auVar282._24_4_;
    auVar294._28_4_ = auVar15._28_4_ + auVar305._28_4_;
    auVar15 = vsubps_avx(auVar235,auVar105);
    auVar17 = vsubps_avx(auVar282,auVar139);
    local_118 = (float)local_3e8._0_4_ * auVar15._0_4_ * 3.0;
    fStack_114 = (float)local_3e8._4_4_ * auVar15._4_4_ * 3.0;
    auVar19._4_4_ = fStack_114;
    auVar19._0_4_ = local_118;
    fStack_110 = fStack_3e0 * auVar15._8_4_ * 3.0;
    auVar19._8_4_ = fStack_110;
    fStack_10c = fStack_3dc * auVar15._12_4_ * 3.0;
    auVar19._12_4_ = fStack_10c;
    fStack_108 = (float)local_3e8._0_4_ * auVar15._16_4_ * 3.0;
    auVar19._16_4_ = fStack_108;
    fStack_104 = (float)local_3e8._4_4_ * auVar15._20_4_ * 3.0;
    auVar19._20_4_ = fStack_104;
    fStack_100 = fStack_3e0 * auVar15._24_4_ * 3.0;
    auVar19._24_4_ = fStack_100;
    auVar19._28_4_ = auVar15._28_4_;
    local_138 = (float)local_3e8._0_4_ * auVar17._0_4_ * 3.0;
    fStack_134 = (float)local_3e8._4_4_ * auVar17._4_4_ * 3.0;
    auVar20._4_4_ = fStack_134;
    auVar20._0_4_ = local_138;
    fStack_130 = fStack_3e0 * auVar17._8_4_ * 3.0;
    auVar20._8_4_ = fStack_130;
    fStack_12c = fStack_3dc * auVar17._12_4_ * 3.0;
    auVar20._12_4_ = fStack_12c;
    fStack_128 = (float)local_3e8._0_4_ * auVar17._16_4_ * 3.0;
    auVar20._16_4_ = fStack_128;
    fStack_124 = (float)local_3e8._4_4_ * auVar17._20_4_ * 3.0;
    auVar20._20_4_ = fStack_124;
    fStack_120 = fStack_3e0 * auVar17._24_4_ * 3.0;
    auVar20._24_4_ = fStack_120;
    auVar20._28_4_ = auVar235._28_4_;
    auVar17 = vperm2f128_avx(auVar263,auVar263,1);
    auVar17 = vshufps_avx(auVar17,auVar263,0x30);
    auVar103 = vshufps_avx(auVar263,auVar17,0x29);
    auVar18 = vsubps_avx(auVar263,auVar19);
    auVar17 = vperm2f128_avx(auVar18,auVar18,1);
    auVar17 = vshufps_avx(auVar17,auVar18,0x30);
    _local_3e8 = vshufps_avx(auVar18,auVar17,0x29);
    auVar18 = vsubps_avx(auVar294,auVar20);
    auVar17 = vperm2f128_avx(auVar18,auVar18,1);
    auVar17 = vshufps_avx(auVar17,auVar18,0x30);
    _local_468 = vshufps_avx(auVar18,auVar17,0x29);
    auVar18 = vsubps_avx(auVar263,local_98);
    auVar19 = vsubps_avx(auVar103,_local_308);
    fVar264 = auVar19._0_4_ + auVar18._0_4_;
    fVar69 = auVar19._4_4_ + auVar18._4_4_;
    fVar108 = auVar19._8_4_ + auVar18._8_4_;
    fVar109 = auVar19._12_4_ + auVar18._12_4_;
    fVar171 = auVar19._16_4_ + auVar18._16_4_;
    fVar185 = auVar19._20_4_ + auVar18._20_4_;
    fVar187 = auVar19._24_4_ + auVar18._24_4_;
    auVar17 = vperm2f128_avx(auVar184,auVar184,1);
    auVar17 = vshufps_avx(auVar17,auVar184,0x30);
    local_b8 = vshufps_avx(auVar184,auVar17,0x29);
    auVar17 = vperm2f128_avx(auVar294,auVar294,1);
    auVar17 = vshufps_avx(auVar17,auVar294,0x30);
    local_78 = vshufps_avx(auVar294,auVar17,0x29);
    auVar17 = vsubps_avx(auVar294,auVar184);
    auVar20 = vsubps_avx(local_78,local_b8);
    fVar189 = auVar20._0_4_ + auVar17._0_4_;
    fVar191 = auVar20._4_4_ + auVar17._4_4_;
    fVar214 = auVar20._8_4_ + auVar17._8_4_;
    fVar217 = auVar20._12_4_ + auVar17._12_4_;
    fVar220 = auVar20._16_4_ + auVar17._16_4_;
    fVar223 = auVar20._20_4_ + auVar17._20_4_;
    fVar236 = auVar20._24_4_ + auVar17._24_4_;
    auVar21._4_4_ = fVar69 * auVar184._4_4_;
    auVar21._0_4_ = fVar264 * auVar184._0_4_;
    auVar21._8_4_ = fVar108 * auVar184._8_4_;
    auVar21._12_4_ = fVar109 * auVar184._12_4_;
    auVar21._16_4_ = fVar171 * auVar184._16_4_;
    auVar21._20_4_ = fVar185 * auVar184._20_4_;
    auVar21._24_4_ = fVar187 * auVar184._24_4_;
    auVar21._28_4_ = auVar17._28_4_;
    auVar22._4_4_ = fVar191 * local_98._4_4_;
    auVar22._0_4_ = fVar189 * local_98._0_4_;
    auVar22._8_4_ = fVar214 * local_98._8_4_;
    auVar22._12_4_ = fVar217 * local_98._12_4_;
    auVar22._16_4_ = fVar220 * local_98._16_4_;
    auVar22._20_4_ = fVar223 * local_98._20_4_;
    auVar22._24_4_ = fVar236 * local_98._24_4_;
    auVar22._28_4_ = fVar320;
    auVar21 = vsubps_avx(auVar21,auVar22);
    local_d8 = local_98._0_4_ + local_d8;
    fStack_d4 = local_98._4_4_ + fStack_d4;
    fStack_d0 = local_98._8_4_ + fStack_d0;
    fStack_cc = local_98._12_4_ + fStack_cc;
    fStack_c8 = local_98._16_4_ + fStack_c8;
    fStack_c4 = local_98._20_4_ + fStack_c4;
    fStack_c0 = local_98._24_4_ + fStack_c0;
    fStack_bc = local_98._28_4_ + auVar16._28_4_;
    local_f8 = local_f8 + auVar184._0_4_;
    fStack_f4 = fStack_f4 + auVar184._4_4_;
    fStack_f0 = fStack_f0 + auVar184._8_4_;
    fStack_ec = fStack_ec + auVar184._12_4_;
    fStack_e8 = fStack_e8 + auVar184._16_4_;
    fStack_e4 = fStack_e4 + auVar184._20_4_;
    fStack_e0 = fStack_e0 + auVar184._24_4_;
    fStack_dc = fVar323 + auVar184._28_4_;
    auVar16._4_4_ = fVar69 * fStack_f4;
    auVar16._0_4_ = fVar264 * local_f8;
    auVar16._8_4_ = fVar108 * fStack_f0;
    auVar16._12_4_ = fVar109 * fStack_ec;
    auVar16._16_4_ = fVar171 * fStack_e8;
    auVar16._20_4_ = fVar185 * fStack_e4;
    auVar16._24_4_ = fVar187 * fStack_e0;
    auVar16._28_4_ = fVar323;
    auVar23._4_4_ = fVar191 * fStack_d4;
    auVar23._0_4_ = fVar189 * local_d8;
    auVar23._8_4_ = fVar214 * fStack_d0;
    auVar23._12_4_ = fVar217 * fStack_cc;
    auVar23._16_4_ = fVar220 * fStack_c8;
    auVar23._20_4_ = fVar223 * fStack_c4;
    auVar23._24_4_ = fVar236 * fStack_c0;
    auVar23._28_4_ = fVar323 + auVar184._28_4_;
    auVar16 = vsubps_avx(auVar16,auVar23);
    auVar24._4_4_ = fVar69 * (float)local_428._4_4_;
    auVar24._0_4_ = fVar264 * (float)local_428._0_4_;
    auVar24._8_4_ = fVar108 * fStack_420;
    auVar24._12_4_ = fVar109 * fStack_41c;
    auVar24._16_4_ = fVar171 * fStack_418;
    auVar24._20_4_ = fVar185 * fStack_414;
    auVar24._24_4_ = fVar187 * fStack_410;
    auVar24._28_4_ = fVar323;
    local_4a8._0_4_ = auVar102._0_4_;
    local_4a8._4_4_ = auVar102._4_4_;
    fStack_4a0 = auVar102._8_4_;
    fStack_49c = auVar102._12_4_;
    fStack_498 = auVar102._16_4_;
    fStack_494 = auVar102._20_4_;
    fStack_490 = auVar102._24_4_;
    auVar25._4_4_ = fVar191 * (float)local_4a8._4_4_;
    auVar25._0_4_ = fVar189 * (float)local_4a8._0_4_;
    auVar25._8_4_ = fVar214 * fStack_4a0;
    auVar25._12_4_ = fVar217 * fStack_49c;
    auVar25._16_4_ = fVar220 * fStack_498;
    auVar25._20_4_ = fVar223 * fStack_494;
    auVar25._24_4_ = fVar236 * fStack_490;
    auVar25._28_4_ = local_98._28_4_;
    auVar22 = vsubps_avx(auVar24,auVar25);
    auVar26._4_4_ = local_b8._4_4_ * fVar69;
    auVar26._0_4_ = local_b8._0_4_ * fVar264;
    auVar26._8_4_ = local_b8._8_4_ * fVar108;
    auVar26._12_4_ = local_b8._12_4_ * fVar109;
    auVar26._16_4_ = local_b8._16_4_ * fVar171;
    auVar26._20_4_ = local_b8._20_4_ * fVar185;
    auVar26._24_4_ = local_b8._24_4_ * fVar187;
    auVar26._28_4_ = fVar323;
    auVar27._4_4_ = local_308._4_4_ * fVar191;
    auVar27._0_4_ = local_308._0_4_ * fVar189;
    auVar27._8_4_ = local_308._8_4_ * fVar214;
    auVar27._12_4_ = local_308._12_4_ * fVar217;
    auVar27._16_4_ = local_308._16_4_ * fVar220;
    auVar27._20_4_ = local_308._20_4_ * fVar223;
    auVar27._24_4_ = local_308._24_4_ * fVar236;
    auVar27._28_4_ = local_b8._28_4_;
    auVar23 = vsubps_avx(auVar26,auVar27);
    auVar28._4_4_ = auVar294._4_4_ * fVar69;
    auVar28._0_4_ = auVar294._0_4_ * fVar264;
    auVar28._8_4_ = auVar294._8_4_ * fVar108;
    auVar28._12_4_ = auVar294._12_4_ * fVar109;
    auVar28._16_4_ = auVar294._16_4_ * fVar171;
    auVar28._20_4_ = auVar294._20_4_ * fVar185;
    auVar28._24_4_ = auVar294._24_4_ * fVar187;
    auVar28._28_4_ = fVar323;
    auVar29._4_4_ = fVar191 * auVar263._4_4_;
    auVar29._0_4_ = fVar189 * auVar263._0_4_;
    auVar29._8_4_ = fVar214 * auVar263._8_4_;
    auVar29._12_4_ = fVar217 * auVar263._12_4_;
    auVar29._16_4_ = fVar220 * auVar263._16_4_;
    auVar29._20_4_ = fVar223 * auVar263._20_4_;
    auVar29._24_4_ = fVar236 * auVar263._24_4_;
    auVar29._28_4_ = fStack_bc;
    auVar24 = vsubps_avx(auVar28,auVar29);
    local_118 = auVar263._0_4_ + local_118;
    fStack_114 = auVar263._4_4_ + fStack_114;
    fStack_110 = auVar263._8_4_ + fStack_110;
    fStack_10c = auVar263._12_4_ + fStack_10c;
    fStack_108 = auVar263._16_4_ + fStack_108;
    fStack_104 = auVar263._20_4_ + fStack_104;
    fStack_100 = auVar263._24_4_ + fStack_100;
    fStack_fc = auVar263._28_4_ + auVar15._28_4_;
    local_138 = auVar294._0_4_ + local_138;
    fStack_134 = auVar294._4_4_ + fStack_134;
    fStack_130 = auVar294._8_4_ + fStack_130;
    fStack_12c = auVar294._12_4_ + fStack_12c;
    fStack_128 = auVar294._16_4_ + fStack_128;
    fStack_124 = auVar294._20_4_ + fStack_124;
    fStack_120 = auVar294._24_4_ + fStack_120;
    fStack_11c = auVar294._28_4_ + auVar235._28_4_;
    auVar15._4_4_ = fVar69 * fStack_134;
    auVar15._0_4_ = fVar264 * local_138;
    auVar15._8_4_ = fVar108 * fStack_130;
    auVar15._12_4_ = fVar109 * fStack_12c;
    auVar15._16_4_ = fVar171 * fStack_128;
    auVar15._20_4_ = fVar185 * fStack_124;
    auVar15._24_4_ = fVar187 * fStack_120;
    auVar15._28_4_ = auVar294._28_4_ + auVar235._28_4_;
    auVar30._4_4_ = fStack_114 * fVar191;
    auVar30._0_4_ = local_118 * fVar189;
    auVar30._8_4_ = fStack_110 * fVar214;
    auVar30._12_4_ = fStack_10c * fVar217;
    auVar30._16_4_ = fStack_108 * fVar220;
    auVar30._20_4_ = fStack_104 * fVar223;
    auVar30._24_4_ = fStack_100 * fVar236;
    auVar30._28_4_ = fStack_fc;
    auVar25 = vsubps_avx(auVar15,auVar30);
    auVar31._4_4_ = fVar69 * local_468._4_4_;
    auVar31._0_4_ = fVar264 * local_468._0_4_;
    auVar31._8_4_ = fVar108 * local_468._8_4_;
    auVar31._12_4_ = fVar109 * local_468._12_4_;
    auVar31._16_4_ = fVar171 * local_468._16_4_;
    auVar31._20_4_ = fVar185 * local_468._20_4_;
    auVar31._24_4_ = fVar187 * local_468._24_4_;
    auVar31._28_4_ = fStack_fc;
    auVar32._4_4_ = fVar191 * (float)local_3e8._4_4_;
    auVar32._0_4_ = fVar189 * (float)local_3e8._0_4_;
    auVar32._8_4_ = fVar214 * fStack_3e0;
    auVar32._12_4_ = fVar217 * fStack_3dc;
    auVar32._16_4_ = fVar220 * fStack_3d8;
    auVar32._20_4_ = fVar223 * fStack_3d4;
    auVar32._24_4_ = fVar236 * fStack_3d0;
    auVar32._28_4_ = local_468._28_4_;
    auVar26 = vsubps_avx(auVar31,auVar32);
    auVar33._4_4_ = fVar69 * local_78._4_4_;
    auVar33._0_4_ = fVar264 * local_78._0_4_;
    auVar33._8_4_ = fVar108 * local_78._8_4_;
    auVar33._12_4_ = fVar109 * local_78._12_4_;
    auVar33._16_4_ = fVar171 * local_78._16_4_;
    auVar33._20_4_ = fVar185 * local_78._20_4_;
    auVar33._24_4_ = fVar187 * local_78._24_4_;
    auVar33._28_4_ = auVar19._28_4_ + auVar18._28_4_;
    auVar34._4_4_ = auVar103._4_4_ * fVar191;
    auVar34._0_4_ = auVar103._0_4_ * fVar189;
    auVar34._8_4_ = auVar103._8_4_ * fVar214;
    auVar34._12_4_ = auVar103._12_4_ * fVar217;
    auVar34._16_4_ = auVar103._16_4_ * fVar220;
    auVar34._20_4_ = auVar103._20_4_ * fVar223;
    auVar34._24_4_ = auVar103._24_4_ * fVar236;
    auVar34._28_4_ = auVar20._28_4_ + auVar17._28_4_;
    auVar19 = vsubps_avx(auVar33,auVar34);
    auVar17 = vminps_avx(auVar21,auVar16);
    auVar102 = vmaxps_avx(auVar21,auVar16);
    auVar15 = vminps_avx(auVar22,auVar23);
    auVar15 = vminps_avx(auVar17,auVar15);
    auVar17 = vmaxps_avx(auVar22,auVar23);
    auVar102 = vmaxps_avx(auVar102,auVar17);
    auVar16 = vminps_avx(auVar24,auVar25);
    auVar17 = vmaxps_avx(auVar24,auVar25);
    auVar18 = vminps_avx(auVar26,auVar19);
    auVar18 = vminps_avx(auVar16,auVar18);
    auVar18 = vminps_avx(auVar15,auVar18);
    auVar15 = vmaxps_avx(auVar26,auVar19);
    auVar17 = vmaxps_avx(auVar17,auVar15);
    auVar17 = vmaxps_avx(auVar102,auVar17);
    auVar102 = vcmpps_avx(auVar18,local_198,2);
    auVar17 = vcmpps_avx(auVar17,local_1b8,5);
    auVar102 = vandps_avx(auVar17,auVar102);
    auVar17 = local_158 & auVar102;
    if ((((((((auVar17 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar17 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar17 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar17 >> 0x7f,0) != '\0') ||
          (auVar17 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar17 >> 0xbf,0) != '\0') ||
        (auVar17 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar17[0x1f] < '\0')
    {
      auVar17 = vsubps_avx(_local_308,local_98);
      auVar15 = vsubps_avx(auVar103,auVar263);
      fVar69 = auVar17._0_4_ + auVar15._0_4_;
      fVar108 = auVar17._4_4_ + auVar15._4_4_;
      fVar109 = auVar17._8_4_ + auVar15._8_4_;
      fVar171 = auVar17._12_4_ + auVar15._12_4_;
      fVar185 = auVar17._16_4_ + auVar15._16_4_;
      fVar187 = auVar17._20_4_ + auVar15._20_4_;
      fVar189 = auVar17._24_4_ + auVar15._24_4_;
      auVar18 = vsubps_avx(local_b8,auVar184);
      auVar19 = vsubps_avx(local_78,auVar294);
      fVar191 = auVar18._0_4_ + auVar19._0_4_;
      fVar214 = auVar18._4_4_ + auVar19._4_4_;
      fVar217 = auVar18._8_4_ + auVar19._8_4_;
      fVar220 = auVar18._12_4_ + auVar19._12_4_;
      fVar223 = auVar18._16_4_ + auVar19._16_4_;
      fVar236 = auVar18._20_4_ + auVar19._20_4_;
      fVar237 = auVar18._24_4_ + auVar19._24_4_;
      fVar264 = auVar19._28_4_;
      auVar35._4_4_ = auVar184._4_4_ * fVar108;
      auVar35._0_4_ = auVar184._0_4_ * fVar69;
      auVar35._8_4_ = auVar184._8_4_ * fVar109;
      auVar35._12_4_ = auVar184._12_4_ * fVar171;
      auVar35._16_4_ = auVar184._16_4_ * fVar185;
      auVar35._20_4_ = auVar184._20_4_ * fVar187;
      auVar35._24_4_ = auVar184._24_4_ * fVar189;
      auVar35._28_4_ = auVar184._28_4_;
      auVar36._4_4_ = local_98._4_4_ * fVar214;
      auVar36._0_4_ = local_98._0_4_ * fVar191;
      auVar36._8_4_ = local_98._8_4_ * fVar217;
      auVar36._12_4_ = local_98._12_4_ * fVar220;
      auVar36._16_4_ = local_98._16_4_ * fVar223;
      auVar36._20_4_ = local_98._20_4_ * fVar236;
      auVar36._24_4_ = local_98._24_4_ * fVar237;
      auVar36._28_4_ = local_98._28_4_;
      auVar19 = vsubps_avx(auVar35,auVar36);
      auVar37._4_4_ = fVar108 * fStack_f4;
      auVar37._0_4_ = fVar69 * local_f8;
      auVar37._8_4_ = fVar109 * fStack_f0;
      auVar37._12_4_ = fVar171 * fStack_ec;
      auVar37._16_4_ = fVar185 * fStack_e8;
      auVar37._20_4_ = fVar187 * fStack_e4;
      auVar37._24_4_ = fVar189 * fStack_e0;
      auVar37._28_4_ = auVar184._28_4_;
      auVar38._4_4_ = fVar214 * fStack_d4;
      auVar38._0_4_ = fVar191 * local_d8;
      auVar38._8_4_ = fVar217 * fStack_d0;
      auVar38._12_4_ = fVar220 * fStack_cc;
      auVar38._16_4_ = fVar223 * fStack_c8;
      auVar38._20_4_ = fVar236 * fStack_c4;
      auVar38._24_4_ = fVar237 * fStack_c0;
      auVar38._28_4_ = fVar264;
      auVar20 = vsubps_avx(auVar37,auVar38);
      auVar39._4_4_ = fVar108 * (float)local_428._4_4_;
      auVar39._0_4_ = fVar69 * (float)local_428._0_4_;
      auVar39._8_4_ = fVar109 * fStack_420;
      auVar39._12_4_ = fVar171 * fStack_41c;
      auVar39._16_4_ = fVar185 * fStack_418;
      auVar39._20_4_ = fVar187 * fStack_414;
      auVar39._24_4_ = fVar189 * fStack_410;
      auVar39._28_4_ = fVar264;
      auVar40._4_4_ = fVar214 * (float)local_4a8._4_4_;
      auVar40._0_4_ = fVar191 * (float)local_4a8._0_4_;
      auVar40._8_4_ = fVar217 * fStack_4a0;
      auVar40._12_4_ = fVar220 * fStack_49c;
      auVar40._16_4_ = fVar223 * fStack_498;
      auVar40._20_4_ = fVar236 * fStack_494;
      auVar40._24_4_ = fVar237 * fStack_490;
      auVar40._28_4_ = auVar16._28_4_;
      auVar21 = vsubps_avx(auVar39,auVar40);
      auVar41._4_4_ = local_b8._4_4_ * fVar108;
      auVar41._0_4_ = local_b8._0_4_ * fVar69;
      auVar41._8_4_ = local_b8._8_4_ * fVar109;
      auVar41._12_4_ = local_b8._12_4_ * fVar171;
      auVar41._16_4_ = local_b8._16_4_ * fVar185;
      auVar41._20_4_ = local_b8._20_4_ * fVar187;
      auVar41._24_4_ = local_b8._24_4_ * fVar189;
      auVar41._28_4_ = auVar16._28_4_;
      auVar42._4_4_ = local_308._4_4_ * fVar214;
      auVar42._0_4_ = local_308._0_4_ * fVar191;
      auVar42._8_4_ = local_308._8_4_ * fVar217;
      auVar42._12_4_ = local_308._12_4_ * fVar220;
      auVar42._16_4_ = local_308._16_4_ * fVar223;
      auVar42._20_4_ = local_308._20_4_ * fVar236;
      uVar4 = local_308._28_4_;
      auVar42._24_4_ = local_308._24_4_ * fVar237;
      auVar42._28_4_ = uVar4;
      auVar22 = vsubps_avx(auVar41,auVar42);
      auVar43._4_4_ = auVar294._4_4_ * fVar108;
      auVar43._0_4_ = auVar294._0_4_ * fVar69;
      auVar43._8_4_ = auVar294._8_4_ * fVar109;
      auVar43._12_4_ = auVar294._12_4_ * fVar171;
      auVar43._16_4_ = auVar294._16_4_ * fVar185;
      auVar43._20_4_ = auVar294._20_4_ * fVar187;
      auVar43._24_4_ = auVar294._24_4_ * fVar189;
      auVar43._28_4_ = uVar4;
      auVar44._4_4_ = auVar263._4_4_ * fVar214;
      auVar44._0_4_ = auVar263._0_4_ * fVar191;
      auVar44._8_4_ = auVar263._8_4_ * fVar217;
      auVar44._12_4_ = auVar263._12_4_ * fVar220;
      auVar44._16_4_ = auVar263._16_4_ * fVar223;
      auVar44._20_4_ = auVar263._20_4_ * fVar236;
      auVar44._24_4_ = auVar263._24_4_ * fVar237;
      auVar44._28_4_ = auVar263._28_4_;
      auVar23 = vsubps_avx(auVar43,auVar44);
      auVar45._4_4_ = fVar108 * fStack_134;
      auVar45._0_4_ = fVar69 * local_138;
      auVar45._8_4_ = fVar109 * fStack_130;
      auVar45._12_4_ = fVar171 * fStack_12c;
      auVar45._16_4_ = fVar185 * fStack_128;
      auVar45._20_4_ = fVar187 * fStack_124;
      auVar45._24_4_ = fVar189 * fStack_120;
      auVar45._28_4_ = uVar4;
      auVar46._4_4_ = fVar214 * fStack_114;
      auVar46._0_4_ = fVar191 * local_118;
      auVar46._8_4_ = fVar217 * fStack_110;
      auVar46._12_4_ = fVar220 * fStack_10c;
      auVar46._16_4_ = fVar223 * fStack_108;
      auVar46._20_4_ = fVar236 * fStack_104;
      auVar46._24_4_ = fVar237 * fStack_100;
      auVar46._28_4_ = auVar294._28_4_;
      auVar24 = vsubps_avx(auVar45,auVar46);
      auVar47._4_4_ = fVar108 * local_468._4_4_;
      auVar47._0_4_ = fVar69 * local_468._0_4_;
      auVar47._8_4_ = fVar109 * local_468._8_4_;
      auVar47._12_4_ = fVar171 * local_468._12_4_;
      auVar47._16_4_ = fVar185 * local_468._16_4_;
      auVar47._20_4_ = fVar187 * local_468._20_4_;
      auVar47._24_4_ = fVar189 * local_468._24_4_;
      auVar47._28_4_ = auVar294._28_4_;
      auVar48._4_4_ = (float)local_3e8._4_4_ * fVar214;
      auVar48._0_4_ = (float)local_3e8._0_4_ * fVar191;
      auVar48._8_4_ = fStack_3e0 * fVar217;
      auVar48._12_4_ = fStack_3dc * fVar220;
      auVar48._16_4_ = fStack_3d8 * fVar223;
      auVar48._20_4_ = fStack_3d4 * fVar236;
      auVar48._24_4_ = fStack_3d0 * fVar237;
      auVar48._28_4_ = local_b8._28_4_;
      auVar25 = vsubps_avx(auVar47,auVar48);
      auVar49._4_4_ = local_78._4_4_ * fVar108;
      auVar49._0_4_ = local_78._0_4_ * fVar69;
      auVar49._8_4_ = local_78._8_4_ * fVar109;
      auVar49._12_4_ = local_78._12_4_ * fVar171;
      auVar49._16_4_ = local_78._16_4_ * fVar185;
      auVar49._20_4_ = local_78._20_4_ * fVar187;
      auVar49._24_4_ = local_78._24_4_ * fVar189;
      auVar49._28_4_ = auVar17._28_4_ + auVar15._28_4_;
      auVar50._4_4_ = auVar103._4_4_ * fVar214;
      auVar50._0_4_ = auVar103._0_4_ * fVar191;
      auVar50._8_4_ = auVar103._8_4_ * fVar217;
      auVar50._12_4_ = auVar103._12_4_ * fVar220;
      auVar50._16_4_ = auVar103._16_4_ * fVar223;
      auVar50._20_4_ = auVar103._20_4_ * fVar236;
      auVar50._24_4_ = auVar103._24_4_ * fVar237;
      auVar50._28_4_ = auVar18._28_4_ + fVar264;
      auVar26 = vsubps_avx(auVar49,auVar50);
      auVar15 = vminps_avx(auVar19,auVar20);
      auVar17 = vmaxps_avx(auVar19,auVar20);
      auVar16 = vminps_avx(auVar21,auVar22);
      auVar16 = vminps_avx(auVar15,auVar16);
      auVar15 = vmaxps_avx(auVar21,auVar22);
      auVar17 = vmaxps_avx(auVar17,auVar15);
      auVar18 = vminps_avx(auVar23,auVar24);
      auVar15 = vmaxps_avx(auVar23,auVar24);
      auVar103 = vminps_avx(auVar25,auVar26);
      auVar18 = vminps_avx(auVar18,auVar103);
      auVar18 = vminps_avx(auVar16,auVar18);
      auVar16 = vmaxps_avx(auVar25,auVar26);
      auVar15 = vmaxps_avx(auVar15,auVar16);
      auVar15 = vmaxps_avx(auVar17,auVar15);
      auVar17 = vcmpps_avx(auVar18,local_198,2);
      auVar15 = vcmpps_avx(auVar15,local_1b8,5);
      auVar17 = vandps_avx(auVar15,auVar17);
      auVar102 = vandps_avx(local_158,auVar102);
      auVar15 = auVar102 & auVar17;
      if ((((((((auVar15 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar15 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar15 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar15 >> 0x7f,0) != '\0') ||
            (auVar15 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar15 >> 0xbf,0) != '\0') ||
          (auVar15 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar15[0x1f] < '\0') {
        auVar102 = vandps_avx(auVar17,auVar102);
        uVar65 = vmovmskps_avx(auVar102);
        if (uVar65 != 0) {
          auStack_288[uVar60] = uVar65 & 0xff;
          uVar5 = vmovlps_avx(auVar90);
          *(undefined8 *)(afStack_178 + uVar60 * 2) = uVar5;
          uVar68 = vmovlps_avx(auVar86);
          auStack_58[uVar60] = uVar68;
          uVar60 = (ulong)((int)uVar60 + 1);
        }
      }
    }
LAB_00fb508e:
    do {
      do {
        do {
          do {
            if ((int)uVar60 == 0) {
              if (bVar64) {
                return bVar64;
              }
              fVar264 = ray->tfar;
              auVar101._4_4_ = fVar264;
              auVar101._0_4_ = fVar264;
              auVar101._8_4_ = fVar264;
              auVar101._12_4_ = fVar264;
              auVar90 = vcmpps_avx(local_208,auVar101,2);
              uVar65 = vmovmskps_avx(auVar90);
              uVar59 = uVar59 & SUB84(auVar67,0) & uVar65;
              if (uVar59 == 0) {
                return bVar64;
              }
              goto LAB_00fb3e09;
            }
            uVar62 = (int)uVar60 - 1;
            uVar63 = (ulong)uVar62;
            uVar65 = auStack_288[uVar63];
            fVar264 = afStack_178[uVar63 * 2];
            fVar69 = afStack_178[uVar63 * 2 + 1];
            auVar86._8_8_ = 0;
            auVar86._0_8_ = auStack_58[uVar63];
            uVar68 = 0;
            if (uVar65 != 0) {
              for (; (uVar65 >> uVar68 & 1) == 0; uVar68 = uVar68 + 1) {
              }
            }
            uVar65 = uVar65 - 1 & uVar65;
            auStack_288[uVar63] = uVar65;
            if (uVar65 == 0) {
              uVar60 = (ulong)uVar62;
            }
            fVar109 = (float)(uVar68 + 1) * 0.14285715;
            fVar108 = (1.0 - (float)uVar68 * 0.14285715) * fVar264 +
                      fVar69 * (float)uVar68 * 0.14285715;
            fVar264 = (1.0 - fVar109) * fVar264 + fVar69 * fVar109;
            fVar69 = fVar264 - fVar108;
            if (0.16666667 <= fVar69) {
              auVar90 = vinsertps_avx(ZEXT416((uint)fVar108),ZEXT416((uint)fVar264),0x10);
              goto LAB_00fb4a15;
            }
            auVar90 = vshufps_avx(auVar86,auVar86,0x50);
            auVar121._8_4_ = 0x3f800000;
            auVar121._0_8_ = 0x3f8000003f800000;
            auVar121._12_4_ = 0x3f800000;
            auVar247 = vsubps_avx(auVar121,auVar90);
            fVar109 = auVar90._0_4_;
            fVar171 = auVar90._4_4_;
            fVar185 = auVar90._8_4_;
            fVar187 = auVar90._12_4_;
            fVar189 = auVar247._0_4_;
            fVar191 = auVar247._4_4_;
            fVar214 = auVar247._8_4_;
            fVar217 = auVar247._12_4_;
            auVar154._0_4_ = fVar109 * (float)local_328._0_4_ + fVar189 * (float)local_4e8._0_4_;
            auVar154._4_4_ = fVar171 * (float)local_328._4_4_ + fVar191 * (float)local_4e8._4_4_;
            auVar154._8_4_ = fVar185 * fStack_320 + fVar214 * (float)local_4e8._0_4_;
            auVar154._12_4_ = fVar187 * fStack_31c + fVar217 * (float)local_4e8._4_4_;
            auVar201._0_4_ = fVar109 * (float)local_338._0_4_ + fVar189 * (float)local_478._0_4_;
            auVar201._4_4_ = fVar171 * (float)local_338._4_4_ + fVar191 * (float)local_478._4_4_;
            auVar201._8_4_ = fVar185 * fStack_330 + fVar214 * fStack_470;
            auVar201._12_4_ = fVar187 * fStack_32c + fVar217 * fStack_46c;
            auVar227._0_4_ = fVar109 * (float)local_348._0_4_ + fVar189 * (float)local_488._0_4_;
            auVar227._4_4_ = fVar171 * (float)local_348._4_4_ + fVar191 * (float)local_488._4_4_;
            auVar227._8_4_ = fVar185 * fStack_340 + fVar214 * fStack_480;
            auVar227._12_4_ = fVar187 * fStack_33c + fVar217 * fStack_47c;
            auVar87._0_4_ = fVar109 * (float)local_358._0_4_ + fVar189 * (float)local_318._0_4_;
            auVar87._4_4_ = fVar171 * (float)local_358._4_4_ + fVar191 * (float)local_318._4_4_;
            auVar87._8_4_ = fVar185 * fStack_350 + fVar214 * fStack_310;
            auVar87._12_4_ = fVar187 * fStack_34c + fVar217 * fStack_30c;
            auVar140._16_16_ = auVar154;
            auVar140._0_16_ = auVar154;
            auVar169._16_16_ = auVar201;
            auVar169._0_16_ = auVar201;
            auVar213._16_16_ = auVar227;
            auVar213._0_16_ = auVar227;
            _local_4a8 = ZEXT432((uint)fVar108);
            _local_428 = ZEXT416((uint)fVar264);
            auVar102 = ZEXT2032(CONCAT416(fVar264,ZEXT416((uint)fVar108)));
            auVar102 = vshufps_avx(auVar102,auVar102,0);
            auVar17 = vsubps_avx(auVar169,auVar140);
            fVar109 = auVar102._0_4_;
            fVar171 = auVar102._4_4_;
            fVar185 = auVar102._8_4_;
            fVar187 = auVar102._12_4_;
            fVar189 = auVar102._16_4_;
            fVar191 = auVar102._20_4_;
            fVar214 = auVar102._24_4_;
            auVar141._0_4_ = auVar154._0_4_ + auVar17._0_4_ * fVar109;
            auVar141._4_4_ = auVar154._4_4_ + auVar17._4_4_ * fVar171;
            auVar141._8_4_ = auVar154._8_4_ + auVar17._8_4_ * fVar185;
            auVar141._12_4_ = auVar154._12_4_ + auVar17._12_4_ * fVar187;
            auVar141._16_4_ = auVar154._0_4_ + auVar17._16_4_ * fVar189;
            auVar141._20_4_ = auVar154._4_4_ + auVar17._20_4_ * fVar191;
            auVar141._24_4_ = auVar154._8_4_ + auVar17._24_4_ * fVar214;
            auVar141._28_4_ = auVar154._12_4_ + auVar17._28_4_;
            auVar102 = vsubps_avx(auVar213,auVar169);
            auVar170._0_4_ = auVar201._0_4_ + auVar102._0_4_ * fVar109;
            auVar170._4_4_ = auVar201._4_4_ + auVar102._4_4_ * fVar171;
            auVar170._8_4_ = auVar201._8_4_ + auVar102._8_4_ * fVar185;
            auVar170._12_4_ = auVar201._12_4_ + auVar102._12_4_ * fVar187;
            auVar170._16_4_ = auVar201._0_4_ + auVar102._16_4_ * fVar189;
            auVar170._20_4_ = auVar201._4_4_ + auVar102._20_4_ * fVar191;
            auVar170._24_4_ = auVar201._8_4_ + auVar102._24_4_ * fVar214;
            auVar170._28_4_ = auVar201._12_4_ + auVar102._28_4_;
            auVar90 = vsubps_avx(auVar87,auVar227);
            auVar106._0_4_ = auVar227._0_4_ + auVar90._0_4_ * fVar109;
            auVar106._4_4_ = auVar227._4_4_ + auVar90._4_4_ * fVar171;
            auVar106._8_4_ = auVar227._8_4_ + auVar90._8_4_ * fVar185;
            auVar106._12_4_ = auVar227._12_4_ + auVar90._12_4_ * fVar187;
            auVar106._16_4_ = auVar227._0_4_ + auVar90._0_4_ * fVar189;
            auVar106._20_4_ = auVar227._4_4_ + auVar90._4_4_ * fVar191;
            auVar106._24_4_ = auVar227._8_4_ + auVar90._8_4_ * fVar214;
            auVar106._28_4_ = auVar227._12_4_ + auVar90._12_4_;
            auVar102 = vsubps_avx(auVar170,auVar141);
            auVar142._0_4_ = auVar141._0_4_ + fVar109 * auVar102._0_4_;
            auVar142._4_4_ = auVar141._4_4_ + fVar171 * auVar102._4_4_;
            auVar142._8_4_ = auVar141._8_4_ + fVar185 * auVar102._8_4_;
            auVar142._12_4_ = auVar141._12_4_ + fVar187 * auVar102._12_4_;
            auVar142._16_4_ = auVar141._16_4_ + fVar189 * auVar102._16_4_;
            auVar142._20_4_ = auVar141._20_4_ + fVar191 * auVar102._20_4_;
            auVar142._24_4_ = auVar141._24_4_ + fVar214 * auVar102._24_4_;
            auVar142._28_4_ = auVar141._28_4_ + auVar102._28_4_;
            auVar102 = vsubps_avx(auVar106,auVar170);
            auVar107._0_4_ = auVar170._0_4_ + fVar109 * auVar102._0_4_;
            auVar107._4_4_ = auVar170._4_4_ + fVar171 * auVar102._4_4_;
            auVar107._8_4_ = auVar170._8_4_ + fVar185 * auVar102._8_4_;
            auVar107._12_4_ = auVar170._12_4_ + fVar187 * auVar102._12_4_;
            auVar107._16_4_ = auVar170._16_4_ + fVar189 * auVar102._16_4_;
            auVar107._20_4_ = auVar170._20_4_ + fVar191 * auVar102._20_4_;
            auVar107._24_4_ = auVar170._24_4_ + fVar214 * auVar102._24_4_;
            auVar107._28_4_ = auVar170._28_4_ + auVar102._28_4_;
            auVar102 = vsubps_avx(auVar107,auVar142);
            auVar248._0_4_ = auVar142._0_4_ + fVar109 * auVar102._0_4_;
            auVar248._4_4_ = auVar142._4_4_ + fVar171 * auVar102._4_4_;
            auVar248._8_4_ = auVar142._8_4_ + fVar185 * auVar102._8_4_;
            auVar248._12_4_ = auVar142._12_4_ + fVar187 * auVar102._12_4_;
            auVar250._16_4_ = auVar142._16_4_ + fVar189 * auVar102._16_4_;
            auVar250._0_16_ = auVar248;
            auVar250._20_4_ = auVar142._20_4_ + fVar191 * auVar102._20_4_;
            auVar250._24_4_ = auVar142._24_4_ + fVar214 * auVar102._24_4_;
            auVar250._28_4_ = auVar142._28_4_ + auVar170._28_4_;
            auVar252 = auVar250._16_16_;
            auVar123 = vshufps_avx(ZEXT416((uint)(fVar69 * 0.33333334)),
                                   ZEXT416((uint)(fVar69 * 0.33333334)),0);
            auVar228._0_4_ = auVar248._0_4_ + auVar123._0_4_ * auVar102._0_4_ * 3.0;
            auVar228._4_4_ = auVar248._4_4_ + auVar123._4_4_ * auVar102._4_4_ * 3.0;
            auVar228._8_4_ = auVar248._8_4_ + auVar123._8_4_ * auVar102._8_4_ * 3.0;
            auVar228._12_4_ = auVar248._12_4_ + auVar123._12_4_ * auVar102._12_4_ * 3.0;
            auVar167 = vshufpd_avx(auVar248,auVar248,3);
            auVar134 = vshufpd_avx(auVar252,auVar252,3);
            _local_308 = auVar167;
            auVar90 = vsubps_avx(auVar167,auVar248);
            _local_468 = auVar134;
            auVar247 = vsubps_avx(auVar134,auVar252);
            auVar88._0_4_ = auVar90._0_4_ + auVar247._0_4_;
            auVar88._4_4_ = auVar90._4_4_ + auVar247._4_4_;
            auVar88._8_4_ = auVar90._8_4_ + auVar247._8_4_;
            auVar88._12_4_ = auVar90._12_4_ + auVar247._12_4_;
            auVar90 = vmovshdup_avx(auVar248);
            auVar247 = vmovshdup_avx(auVar228);
            auVar157 = vshufps_avx(auVar88,auVar88,0);
            auVar124 = vshufps_avx(auVar88,auVar88,0x55);
            fVar109 = auVar124._0_4_;
            fVar171 = auVar124._4_4_;
            fVar185 = auVar124._8_4_;
            fVar187 = auVar124._12_4_;
            fVar189 = auVar157._0_4_;
            fVar191 = auVar157._4_4_;
            fVar214 = auVar157._8_4_;
            fVar217 = auVar157._12_4_;
            auVar89._0_4_ = fVar189 * auVar248._0_4_ + auVar90._0_4_ * fVar109;
            auVar89._4_4_ = fVar191 * auVar248._4_4_ + auVar90._4_4_ * fVar171;
            auVar89._8_4_ = fVar214 * auVar248._8_4_ + auVar90._8_4_ * fVar185;
            auVar89._12_4_ = fVar217 * auVar248._12_4_ + auVar90._12_4_ * fVar187;
            _local_3e8 = auVar228;
            auVar155._0_4_ = fVar189 * auVar228._0_4_ + auVar247._0_4_ * fVar109;
            auVar155._4_4_ = fVar191 * auVar228._4_4_ + auVar247._4_4_ * fVar171;
            auVar155._8_4_ = fVar214 * auVar228._8_4_ + auVar247._8_4_ * fVar185;
            auVar155._12_4_ = fVar217 * auVar228._12_4_ + auVar247._12_4_ * fVar187;
            auVar247 = vshufps_avx(auVar89,auVar89,0xe8);
            auVar157 = vshufps_avx(auVar155,auVar155,0xe8);
            auVar90 = vcmpps_avx(auVar247,auVar157,1);
            uVar65 = vextractps_avx(auVar90,0);
            auVar124 = auVar155;
            if ((uVar65 & 1) == 0) {
              auVar124 = auVar89;
            }
            auVar122._0_4_ = auVar123._0_4_ * auVar102._16_4_ * 3.0;
            auVar122._4_4_ = auVar123._4_4_ * auVar102._20_4_ * 3.0;
            auVar122._8_4_ = auVar123._8_4_ * auVar102._24_4_ * 3.0;
            auVar122._12_4_ = auVar123._12_4_ * 0.0;
            auVar14 = vsubps_avx(auVar252,auVar122);
            auVar123 = vmovshdup_avx(auVar14);
            auVar252 = vmovshdup_avx(auVar252);
            fVar220 = auVar14._0_4_;
            fVar223 = auVar14._4_4_;
            auVar202._0_4_ = fVar220 * fVar189 + auVar123._0_4_ * fVar109;
            auVar202._4_4_ = fVar223 * fVar191 + auVar123._4_4_ * fVar171;
            auVar202._8_4_ = auVar14._8_4_ * fVar214 + auVar123._8_4_ * fVar185;
            auVar202._12_4_ = auVar14._12_4_ * fVar217 + auVar123._12_4_ * fVar187;
            auVar229._0_4_ = fVar189 * auVar250._16_4_ + auVar252._0_4_ * fVar109;
            auVar229._4_4_ = fVar191 * auVar250._20_4_ + auVar252._4_4_ * fVar171;
            auVar229._8_4_ = fVar214 * auVar250._24_4_ + auVar252._8_4_ * fVar185;
            auVar229._12_4_ = fVar217 * auVar250._28_4_ + auVar252._12_4_ * fVar187;
            auVar252 = vshufps_avx(auVar202,auVar202,0xe8);
            auVar274 = vshufps_avx(auVar229,auVar229,0xe8);
            auVar123 = vcmpps_avx(auVar252,auVar274,1);
            uVar65 = vextractps_avx(auVar123,0);
            auVar302 = auVar229;
            if ((uVar65 & 1) == 0) {
              auVar302 = auVar202;
            }
            auVar124 = vmaxss_avx(auVar302,auVar124);
            auVar247 = vminps_avx(auVar247,auVar157);
            auVar157 = vminps_avx(auVar252,auVar274);
            auVar157 = vminps_avx(auVar247,auVar157);
            auVar90 = vshufps_avx(auVar90,auVar90,0x55);
            auVar90 = vblendps_avx(auVar90,auVar123,2);
            auVar123 = vpslld_avx(auVar90,0x1f);
            auVar90 = vshufpd_avx(auVar155,auVar155,1);
            auVar90 = vinsertps_avx(auVar90,auVar229,0x9c);
            auVar247 = vshufpd_avx(auVar89,auVar89,1);
            auVar247 = vinsertps_avx(auVar247,auVar202,0x9c);
            auVar90 = vblendvps_avx(auVar247,auVar90,auVar123);
            auVar247 = vmovshdup_avx(auVar90);
            auVar90 = vmaxss_avx(auVar247,auVar90);
            fVar185 = auVar157._0_4_;
            auVar247 = vmovshdup_avx(auVar157);
            fVar171 = auVar90._0_4_;
            fVar187 = auVar247._0_4_;
            fVar109 = auVar124._0_4_;
            if ((fVar185 < 0.0001) && (-0.0001 < fVar171)) break;
            if ((fVar187 < 0.0001 && -0.0001 < fVar109) || (fVar185 < 0.0001 && -0.0001 < fVar109))
            break;
            auVar123 = vcmpps_avx(SUB6416(ZEXT464(0xb8d1b717),0),auVar90,1);
            auVar247 = vcmpps_avx(auVar247,SUB6416(ZEXT464(0x38d1b717),0),1);
            auVar247 = vandps_avx(auVar247,auVar123);
          } while ((auVar247 & (undefined1  [16])0x1) == (undefined1  [16])0x0);
          auVar123 = vcmpps_avx(auVar157,_DAT_01f7aa10,1);
          auVar247 = vcmpss_avx(auVar124,ZEXT416(0),1);
          auVar156._8_4_ = 0x3f800000;
          auVar156._0_8_ = 0x3f8000003f800000;
          auVar156._12_4_ = 0x3f800000;
          auVar203._8_4_ = 0xbf800000;
          auVar203._0_8_ = 0xbf800000bf800000;
          auVar203._12_4_ = 0xbf800000;
          auVar247 = vblendvps_avx(auVar156,auVar203,auVar247);
          auVar123 = vblendvps_avx(auVar156,auVar203,auVar123);
          auVar157 = vcmpss_avx(auVar123,auVar247,4);
          auVar157 = vpshufd_avx(ZEXT416(auVar157._0_4_ & 1),0x50);
          auVar157 = vpslld_avx(auVar157,0x1f);
          auVar157 = vpsrad_avx(auVar157,0x1f);
          auVar157 = vpandn_avx(auVar157,_DAT_01fafeb0);
          auVar124 = vmovshdup_avx(auVar123);
          fVar189 = auVar124._0_4_;
          if ((auVar123._0_4_ != fVar189) || (NAN(auVar123._0_4_) || NAN(fVar189))) {
            if ((fVar187 != fVar185) || (NAN(fVar187) || NAN(fVar185))) {
              fVar185 = -fVar185 / (fVar187 - fVar185);
              auVar123 = vmovsldup_avx(ZEXT416((uint)((1.0 - fVar185) * 0.0 + fVar185)));
            }
            else {
              auVar123 = ZEXT816(0x3f80000000000000);
              if ((fVar185 != 0.0) || (NAN(fVar185))) {
                auVar123 = ZEXT816(0xff8000007f800000);
              }
            }
            auVar252 = vcmpps_avx(auVar157,auVar123,1);
            auVar124 = vblendps_avx(auVar157,auVar123,2);
            auVar123 = vblendps_avx(auVar123,auVar157,2);
            auVar157 = vblendvps_avx(auVar123,auVar124,auVar252);
          }
          auVar90 = vcmpss_avx(auVar90,ZEXT416(0),1);
          auVar158._8_4_ = 0x3f800000;
          auVar158._0_8_ = 0x3f8000003f800000;
          auVar158._12_4_ = 0x3f800000;
          auVar204._8_4_ = 0xbf800000;
          auVar204._0_8_ = 0xbf800000bf800000;
          auVar204._12_4_ = 0xbf800000;
          auVar90 = vblendvps_avx(auVar158,auVar204,auVar90);
          fVar185 = auVar90._0_4_;
          if ((auVar247._0_4_ != fVar185) || (NAN(auVar247._0_4_) || NAN(fVar185))) {
            if ((fVar171 != fVar109) || (NAN(fVar171) || NAN(fVar109))) {
              fVar109 = -fVar109 / (fVar171 - fVar109);
              auVar90 = vmovsldup_avx(ZEXT416((uint)((1.0 - fVar109) * 0.0 + fVar109)));
            }
            else {
              auVar90 = ZEXT816(0x3f80000000000000);
              if ((fVar109 != 0.0) || (NAN(fVar109))) {
                auVar90 = ZEXT816(0xff8000007f800000);
              }
            }
            auVar123 = vcmpps_avx(auVar157,auVar90,1);
            auVar247 = vblendps_avx(auVar157,auVar90,2);
            auVar90 = vblendps_avx(auVar90,auVar157,2);
            auVar157 = vblendvps_avx(auVar90,auVar247,auVar123);
          }
          if ((fVar189 != fVar185) || (NAN(fVar189) || NAN(fVar185))) {
            auVar91._8_4_ = 0x3f800000;
            auVar91._0_8_ = 0x3f8000003f800000;
            auVar91._12_4_ = 0x3f800000;
            auVar90 = vcmpps_avx(auVar157,auVar91,1);
            auVar247 = vinsertps_avx(auVar157,SUB6416(ZEXT464(0x3f800000),0),0x10);
            auVar159._4_12_ = auVar157._4_12_;
            auVar159._0_4_ = 0x3f800000;
            auVar157 = vblendvps_avx(auVar159,auVar247,auVar90);
          }
          auVar90 = vcmpps_avx(auVar157,_DAT_01f7b6f0,1);
          auVar52._12_4_ = 0;
          auVar52._0_12_ = auVar157._4_12_;
          auVar247 = vinsertps_avx(auVar157,ZEXT416(0x3f800000),0x10);
          auVar90 = vblendvps_avx(auVar247,auVar52 << 0x20,auVar90);
          auVar247 = vmovshdup_avx(auVar90);
        } while (auVar247._0_4_ < auVar90._0_4_);
        auVar92._0_4_ = auVar90._0_4_ + -0.1;
        auVar92._4_4_ = auVar90._4_4_ + 0.1;
        auVar92._8_4_ = auVar90._8_4_ + 0.0;
        auVar92._12_4_ = auVar90._12_4_ + 0.0;
        auVar123 = vshufpd_avx(auVar228,auVar228,3);
        register0x00001388 = 0x3f80000000000000;
        local_3e8 = 0x3f80000000000000;
        auVar90 = vcmpps_avx(auVar92,_local_3e8,1);
        auVar51._12_4_ = 0;
        auVar51._0_12_ = auVar92._4_12_;
        auVar247 = vinsertps_avx(auVar92,SUB6416(ZEXT464(0x3f800000),0),0x10);
        auVar90 = vblendvps_avx(auVar247,auVar51 << 0x20,auVar90);
        auVar247 = vshufpd_avx(auVar14,auVar14,3);
        auVar157 = vshufps_avx(auVar90,auVar90,0x50);
        auVar249._8_4_ = 0x3f800000;
        auVar249._0_8_ = 0x3f8000003f800000;
        auVar249._12_4_ = 0x3f800000;
        auVar124 = vsubps_avx(auVar249,auVar157);
        local_308._0_4_ = auVar167._0_4_;
        local_308._4_4_ = auVar167._4_4_;
        fStack_300 = auVar167._8_4_;
        fStack_2fc = auVar167._12_4_;
        fVar109 = auVar157._0_4_;
        fVar171 = auVar157._4_4_;
        fVar185 = auVar157._8_4_;
        fVar187 = auVar157._12_4_;
        local_468._0_4_ = auVar134._0_4_;
        local_468._4_4_ = auVar134._4_4_;
        fStack_460 = auVar134._8_4_;
        fStack_45c = auVar134._12_4_;
        fVar189 = auVar124._0_4_;
        fVar191 = auVar124._4_4_;
        fVar214 = auVar124._8_4_;
        fVar217 = auVar124._12_4_;
        auVar93._0_4_ = fVar109 * (float)local_308._0_4_ + fVar189 * auVar248._0_4_;
        auVar93._4_4_ = fVar171 * (float)local_308._4_4_ + fVar191 * auVar248._4_4_;
        auVar93._8_4_ = fVar185 * fStack_300 + fVar214 * auVar248._0_4_;
        auVar93._12_4_ = fVar187 * fStack_2fc + fVar217 * auVar248._4_4_;
        auVar160._0_4_ = fVar109 * auVar123._0_4_ + fVar189 * auVar228._0_4_;
        auVar160._4_4_ = fVar171 * auVar123._4_4_ + fVar191 * auVar228._4_4_;
        auVar160._8_4_ = fVar185 * auVar123._8_4_ + fVar214 * auVar228._0_4_;
        auVar160._12_4_ = fVar187 * auVar123._12_4_ + fVar217 * auVar228._4_4_;
        auVar230._0_4_ = fVar109 * auVar247._0_4_ + fVar189 * fVar220;
        auVar230._4_4_ = fVar171 * auVar247._4_4_ + fVar191 * fVar223;
        auVar230._8_4_ = fVar185 * auVar247._8_4_ + fVar214 * fVar220;
        auVar230._12_4_ = fVar187 * auVar247._12_4_ + fVar217 * fVar223;
        auVar261._0_4_ = fVar109 * (float)local_468._0_4_ + fVar189 * auVar250._16_4_;
        auVar261._4_4_ = fVar171 * (float)local_468._4_4_ + fVar191 * auVar250._20_4_;
        auVar261._8_4_ = fVar185 * fStack_460 + fVar214 * auVar250._16_4_;
        auVar261._12_4_ = fVar187 * fStack_45c + fVar217 * auVar250._20_4_;
        auVar134 = vsubps_avx(auVar249,auVar90);
        auVar247 = vmovshdup_avx(auVar86);
        auVar167 = vmovsldup_avx(auVar86);
        auVar86._0_4_ = auVar167._0_4_ * auVar134._0_4_ + auVar90._0_4_ * auVar247._0_4_;
        auVar86._4_4_ = auVar167._4_4_ * auVar134._4_4_ + auVar90._4_4_ * auVar247._4_4_;
        auVar86._8_4_ = auVar167._8_4_ * auVar134._8_4_ + auVar90._8_4_ * auVar247._8_4_;
        auVar86._12_4_ = auVar167._12_4_ * auVar134._12_4_ + auVar90._12_4_ * auVar247._12_4_;
        _local_468 = vmovshdup_avx(auVar86);
        auVar90 = vsubps_avx(auVar160,auVar93);
        auVar182._0_4_ = auVar90._0_4_ * 3.0;
        auVar182._4_4_ = auVar90._4_4_ * 3.0;
        auVar182._8_4_ = auVar90._8_4_ * 3.0;
        auVar182._12_4_ = auVar90._12_4_ * 3.0;
        auVar90 = vsubps_avx(auVar230,auVar160);
        auVar279._0_4_ = auVar90._0_4_ * 3.0;
        auVar279._4_4_ = auVar90._4_4_ * 3.0;
        auVar279._8_4_ = auVar90._8_4_ * 3.0;
        auVar279._12_4_ = auVar90._12_4_ * 3.0;
        auVar90 = vsubps_avx(auVar261,auVar230);
        auVar288._0_4_ = auVar90._0_4_ * 3.0;
        auVar288._4_4_ = auVar90._4_4_ * 3.0;
        auVar288._8_4_ = auVar90._8_4_ * 3.0;
        auVar288._12_4_ = auVar90._12_4_ * 3.0;
        auVar247 = vminps_avx(auVar279,auVar288);
        auVar90 = vmaxps_avx(auVar279,auVar288);
        auVar247 = vminps_avx(auVar182,auVar247);
        auVar90 = vmaxps_avx(auVar182,auVar90);
        auVar167 = vshufpd_avx(auVar247,auVar247,3);
        auVar134 = vshufpd_avx(auVar90,auVar90,3);
        auVar247 = vminps_avx(auVar247,auVar167);
        auVar90 = vmaxps_avx(auVar90,auVar134);
        auVar167 = vshufps_avx(ZEXT416((uint)(1.0 / fVar69)),ZEXT416((uint)(1.0 / fVar69)),0);
        auVar280._0_4_ = auVar247._0_4_ * auVar167._0_4_;
        auVar280._4_4_ = auVar247._4_4_ * auVar167._4_4_;
        auVar280._8_4_ = auVar247._8_4_ * auVar167._8_4_;
        auVar280._12_4_ = auVar247._12_4_ * auVar167._12_4_;
        auVar289._0_4_ = auVar167._0_4_ * auVar90._0_4_;
        auVar289._4_4_ = auVar167._4_4_ * auVar90._4_4_;
        auVar289._8_4_ = auVar167._8_4_ * auVar90._8_4_;
        auVar289._12_4_ = auVar167._12_4_ * auVar90._12_4_;
        auVar124 = ZEXT416((uint)(1.0 / (local_468._0_4_ - auVar86._0_4_)));
        auVar90 = vshufpd_avx(auVar93,auVar93,3);
        auVar247 = vshufpd_avx(auVar160,auVar160,3);
        auVar167 = vshufpd_avx(auVar230,auVar230,3);
        auVar134 = vshufpd_avx(auVar261,auVar261,3);
        auVar90 = vsubps_avx(auVar90,auVar93);
        auVar123 = vsubps_avx(auVar247,auVar160);
        auVar157 = vsubps_avx(auVar167,auVar230);
        auVar134 = vsubps_avx(auVar134,auVar261);
        auVar247 = vminps_avx(auVar90,auVar123);
        auVar90 = vmaxps_avx(auVar90,auVar123);
        auVar167 = vminps_avx(auVar157,auVar134);
        auVar167 = vminps_avx(auVar247,auVar167);
        auVar247 = vmaxps_avx(auVar157,auVar134);
        auVar90 = vmaxps_avx(auVar90,auVar247);
        auVar247 = vshufps_avx(auVar124,auVar124,0);
        auVar325._0_4_ = auVar247._0_4_ * auVar167._0_4_;
        auVar325._4_4_ = auVar247._4_4_ * auVar167._4_4_;
        auVar325._8_4_ = auVar247._8_4_ * auVar167._8_4_;
        auVar325._12_4_ = auVar247._12_4_ * auVar167._12_4_;
        auVar330._0_4_ = auVar247._0_4_ * auVar90._0_4_;
        auVar330._4_4_ = auVar247._4_4_ * auVar90._4_4_;
        auVar330._8_4_ = auVar247._8_4_ * auVar90._8_4_;
        auVar330._12_4_ = auVar247._12_4_ * auVar90._12_4_;
        auVar90 = vmovsldup_avx(auVar86);
        auVar303._4_12_ = auVar90._4_12_;
        auVar303._0_4_ = fVar108;
        auVar308._4_12_ = auVar86._4_12_;
        auVar308._0_4_ = fVar264;
        auVar183._0_4_ = (fVar108 + fVar264) * 0.5;
        auVar183._4_4_ = (auVar90._4_4_ + auVar86._4_4_) * 0.5;
        auVar183._8_4_ = (auVar90._8_4_ + auVar86._8_4_) * 0.5;
        auVar183._12_4_ = (auVar90._12_4_ + auVar86._12_4_) * 0.5;
        auVar90 = vshufps_avx(auVar183,auVar183,0);
        fVar109 = auVar90._0_4_;
        fVar171 = auVar90._4_4_;
        fVar185 = auVar90._8_4_;
        fVar187 = auVar90._12_4_;
        local_4c8._0_4_ = auVar275._0_4_;
        local_4c8._4_4_ = auVar275._4_4_;
        fStack_4c0 = auVar275._8_4_;
        fStack_4bc = auVar275._12_4_;
        auVar125._0_4_ = fVar109 * (float)local_1c8._0_4_ + (float)local_4c8._0_4_;
        auVar125._4_4_ = fVar171 * (float)local_1c8._4_4_ + (float)local_4c8._4_4_;
        auVar125._8_4_ = fVar185 * fStack_1c0 + fStack_4c0;
        auVar125._12_4_ = fVar187 * fStack_1bc + fStack_4bc;
        auVar161._0_4_ = fVar109 * (float)local_1d8._0_4_ + (float)local_438._0_4_;
        auVar161._4_4_ = fVar171 * (float)local_1d8._4_4_ + (float)local_438._4_4_;
        auVar161._8_4_ = fVar185 * fStack_1d0 + fStack_430;
        auVar161._12_4_ = fVar187 * fStack_1cc + fStack_42c;
        auVar231._0_4_ = fVar109 * (float)local_1e8._0_4_ + (float)local_448._0_4_;
        auVar231._4_4_ = fVar171 * (float)local_1e8._4_4_ + (float)local_448._4_4_;
        auVar231._8_4_ = fVar185 * fStack_1e0 + fStack_440;
        auVar231._12_4_ = fVar187 * fStack_1dc + fStack_43c;
        auVar90 = vsubps_avx(auVar161,auVar125);
        auVar126._0_4_ = auVar125._0_4_ + fVar109 * auVar90._0_4_;
        auVar126._4_4_ = auVar125._4_4_ + fVar171 * auVar90._4_4_;
        auVar126._8_4_ = auVar125._8_4_ + fVar185 * auVar90._8_4_;
        auVar126._12_4_ = auVar125._12_4_ + fVar187 * auVar90._12_4_;
        auVar90 = vsubps_avx(auVar231,auVar161);
        auVar162._0_4_ = auVar161._0_4_ + fVar109 * auVar90._0_4_;
        auVar162._4_4_ = auVar161._4_4_ + fVar171 * auVar90._4_4_;
        auVar162._8_4_ = auVar161._8_4_ + fVar185 * auVar90._8_4_;
        auVar162._12_4_ = auVar161._12_4_ + fVar187 * auVar90._12_4_;
        auVar90 = vsubps_avx(auVar162,auVar126);
        fVar109 = auVar126._0_4_ + fVar109 * auVar90._0_4_;
        fVar171 = auVar126._4_4_ + fVar171 * auVar90._4_4_;
        auVar94._0_8_ = CONCAT44(fVar171,fVar109);
        auVar94._8_4_ = auVar126._8_4_ + fVar185 * auVar90._8_4_;
        auVar94._12_4_ = auVar126._12_4_ + fVar187 * auVar90._12_4_;
        fVar185 = auVar90._0_4_ * 3.0;
        fVar187 = auVar90._4_4_ * 3.0;
        auVar127._0_8_ = CONCAT44(fVar187,fVar185);
        auVar127._8_4_ = auVar90._8_4_ * 3.0;
        auVar127._12_4_ = auVar90._12_4_ * 3.0;
        auVar163._8_8_ = auVar94._0_8_;
        auVar163._0_8_ = auVar94._0_8_;
        auVar90 = vshufpd_avx(auVar94,auVar94,3);
        auVar247 = vshufps_avx(auVar183,auVar183,0x55);
        auVar157 = vsubps_avx(auVar90,auVar163);
        auVar317._0_4_ = auVar157._0_4_ * auVar247._0_4_ + fVar109;
        auVar317._4_4_ = auVar157._4_4_ * auVar247._4_4_ + fVar171;
        auVar317._8_4_ = auVar157._8_4_ * auVar247._8_4_ + fVar109;
        auVar317._12_4_ = auVar157._12_4_ * auVar247._12_4_ + fVar171;
        auVar164._8_8_ = auVar127._0_8_;
        auVar164._0_8_ = auVar127._0_8_;
        auVar90 = vshufpd_avx(auVar127,auVar127,1);
        auVar90 = vsubps_avx(auVar90,auVar164);
        auVar128._0_4_ = auVar90._0_4_ * auVar247._0_4_ + fVar185;
        auVar128._4_4_ = auVar90._4_4_ * auVar247._4_4_ + fVar187;
        auVar128._8_4_ = auVar90._8_4_ * auVar247._8_4_ + fVar185;
        auVar128._12_4_ = auVar90._12_4_ * auVar247._12_4_ + fVar187;
        auVar247 = vmovshdup_avx(auVar128);
        auVar232._0_8_ = auVar247._0_8_ ^ 0x8000000080000000;
        auVar232._8_4_ = auVar247._8_4_ ^ 0x80000000;
        auVar232._12_4_ = auVar247._12_4_ ^ 0x80000000;
        auVar167 = vmovshdup_avx(auVar157);
        auVar90 = vunpcklps_avx(auVar167,auVar232);
        auVar134 = vshufps_avx(auVar90,auVar232,4);
        auVar95._0_8_ = auVar157._0_8_ ^ 0x8000000080000000;
        auVar95._8_4_ = -auVar157._8_4_;
        auVar95._12_4_ = -auVar157._12_4_;
        auVar90 = vmovlhps_avx(auVar95,auVar128);
        auVar123 = vshufps_avx(auVar90,auVar128,8);
        auVar90 = ZEXT416((uint)(auVar128._0_4_ * auVar167._0_4_ - auVar157._0_4_ * auVar247._0_4_))
        ;
        auVar247 = vshufps_avx(auVar90,auVar90,0);
        auVar90 = vdivps_avx(auVar134,auVar247);
        auVar247 = vdivps_avx(auVar123,auVar247);
        auVar123 = vinsertps_avx(auVar280,auVar325,0x1c);
        auVar157 = vinsertps_avx(auVar289,auVar330,0x1c);
        auVar124 = vinsertps_avx(auVar325,auVar280,0x4c);
        auVar252 = vinsertps_avx(auVar330,auVar289,0x4c);
        auVar167 = vmovsldup_avx(auVar90);
        auVar290._0_4_ = auVar123._0_4_ * auVar167._0_4_;
        auVar290._4_4_ = auVar123._4_4_ * auVar167._4_4_;
        auVar290._8_4_ = auVar123._8_4_ * auVar167._8_4_;
        auVar290._12_4_ = auVar123._12_4_ * auVar167._12_4_;
        auVar129._0_4_ = auVar167._0_4_ * auVar157._0_4_;
        auVar129._4_4_ = auVar167._4_4_ * auVar157._4_4_;
        auVar129._8_4_ = auVar167._8_4_ * auVar157._8_4_;
        auVar129._12_4_ = auVar167._12_4_ * auVar157._12_4_;
        auVar134 = vminps_avx(auVar290,auVar129);
        auVar167 = vmaxps_avx(auVar129,auVar290);
        auVar274 = vmovsldup_avx(auVar247);
        auVar331._0_4_ = auVar274._0_4_ * auVar124._0_4_;
        auVar331._4_4_ = auVar274._4_4_ * auVar124._4_4_;
        auVar331._8_4_ = auVar274._8_4_ * auVar124._8_4_;
        auVar331._12_4_ = auVar274._12_4_ * auVar124._12_4_;
        auVar291._0_4_ = auVar274._0_4_ * auVar252._0_4_;
        auVar291._4_4_ = auVar274._4_4_ * auVar252._4_4_;
        auVar291._8_4_ = auVar274._8_4_ * auVar252._8_4_;
        auVar291._12_4_ = auVar274._12_4_ * auVar252._12_4_;
        auVar274 = vminps_avx(auVar331,auVar291);
        auVar205._0_4_ = auVar134._0_4_ + auVar274._0_4_;
        auVar205._4_4_ = auVar134._4_4_ + auVar274._4_4_;
        auVar205._8_4_ = auVar134._8_4_ + auVar274._8_4_;
        auVar205._12_4_ = auVar134._12_4_ + auVar274._12_4_;
        auVar134 = vmaxps_avx(auVar291,auVar331);
        auVar274 = vsubps_avx(auVar303,auVar183);
        auVar14 = vsubps_avx(auVar308,auVar183);
        auVar130._0_4_ = auVar134._0_4_ + auVar167._0_4_;
        auVar130._4_4_ = auVar134._4_4_ + auVar167._4_4_;
        auVar130._8_4_ = auVar134._8_4_ + auVar167._8_4_;
        auVar130._12_4_ = auVar134._12_4_ + auVar167._12_4_;
        auVar309._8_8_ = 0x3f800000;
        auVar309._0_8_ = 0x3f800000;
        auVar167 = vsubps_avx(auVar309,auVar130);
        auVar134 = vsubps_avx(auVar309,auVar205);
        fVar214 = auVar274._0_4_;
        auVar310._0_4_ = fVar214 * auVar167._0_4_;
        fVar217 = auVar274._4_4_;
        auVar310._4_4_ = fVar217 * auVar167._4_4_;
        fVar220 = auVar274._8_4_;
        auVar310._8_4_ = fVar220 * auVar167._8_4_;
        fVar223 = auVar274._12_4_;
        auVar310._12_4_ = fVar223 * auVar167._12_4_;
        fVar185 = auVar14._0_4_;
        auVar131._0_4_ = fVar185 * auVar167._0_4_;
        fVar187 = auVar14._4_4_;
        auVar131._4_4_ = fVar187 * auVar167._4_4_;
        fVar189 = auVar14._8_4_;
        auVar131._8_4_ = fVar189 * auVar167._8_4_;
        fVar191 = auVar14._12_4_;
        auVar131._12_4_ = fVar191 * auVar167._12_4_;
        auVar326._0_4_ = fVar214 * auVar134._0_4_;
        auVar326._4_4_ = fVar217 * auVar134._4_4_;
        auVar326._8_4_ = fVar220 * auVar134._8_4_;
        auVar326._12_4_ = fVar223 * auVar134._12_4_;
        auVar206._0_4_ = fVar185 * auVar134._0_4_;
        auVar206._4_4_ = fVar187 * auVar134._4_4_;
        auVar206._8_4_ = fVar189 * auVar134._8_4_;
        auVar206._12_4_ = fVar191 * auVar134._12_4_;
        auVar167 = vminps_avx(auVar310,auVar326);
        auVar134 = vminps_avx(auVar131,auVar206);
        auVar274 = vminps_avx(auVar167,auVar134);
        auVar167 = vmaxps_avx(auVar326,auVar310);
        auVar134 = vmaxps_avx(auVar206,auVar131);
        auVar14 = vshufps_avx(auVar183,auVar183,0x54);
        auVar134 = vmaxps_avx(auVar134,auVar167);
        auVar302 = vshufps_avx(auVar317,auVar317,0);
        auVar70 = vshufps_avx(auVar317,auVar317,0x55);
        auVar167 = vhaddps_avx(auVar274,auVar274);
        auVar134 = vhaddps_avx(auVar134,auVar134);
        auVar207._0_4_ = auVar70._0_4_ * auVar247._0_4_ + auVar302._0_4_ * auVar90._0_4_;
        auVar207._4_4_ = auVar70._4_4_ * auVar247._4_4_ + auVar302._4_4_ * auVar90._4_4_;
        auVar207._8_4_ = auVar70._8_4_ * auVar247._8_4_ + auVar302._8_4_ * auVar90._8_4_;
        auVar207._12_4_ = auVar70._12_4_ * auVar247._12_4_ + auVar302._12_4_ * auVar90._12_4_;
        auVar274 = vsubps_avx(auVar14,auVar207);
        fVar109 = auVar274._0_4_ + auVar167._0_4_;
        fVar171 = auVar274._0_4_ + auVar134._0_4_;
        auVar167 = vmaxss_avx(ZEXT416((uint)fVar108),ZEXT416((uint)fVar109));
        auVar134 = vminss_avx(ZEXT416((uint)fVar171),ZEXT416((uint)fVar264));
      } while (auVar134._0_4_ < auVar167._0_4_);
      auVar167 = vmovshdup_avx(auVar90);
      auVar208._0_4_ = auVar123._0_4_ * auVar167._0_4_;
      auVar208._4_4_ = auVar123._4_4_ * auVar167._4_4_;
      auVar208._8_4_ = auVar123._8_4_ * auVar167._8_4_;
      auVar208._12_4_ = auVar123._12_4_ * auVar167._12_4_;
      auVar132._0_4_ = auVar167._0_4_ * auVar157._0_4_;
      auVar132._4_4_ = auVar167._4_4_ * auVar157._4_4_;
      auVar132._8_4_ = auVar167._8_4_ * auVar157._8_4_;
      auVar132._12_4_ = auVar167._12_4_ * auVar157._12_4_;
      auVar134 = vminps_avx(auVar208,auVar132);
      auVar167 = vmaxps_avx(auVar132,auVar208);
      auVar123 = vmovshdup_avx(auVar247);
      auVar96._0_4_ = auVar123._0_4_ * auVar124._0_4_;
      auVar96._4_4_ = auVar123._4_4_ * auVar124._4_4_;
      auVar96._8_4_ = auVar123._8_4_ * auVar124._8_4_;
      auVar96._12_4_ = auVar123._12_4_ * auVar124._12_4_;
      auVar209._0_4_ = auVar252._0_4_ * auVar123._0_4_;
      auVar209._4_4_ = auVar252._4_4_ * auVar123._4_4_;
      auVar209._8_4_ = auVar252._8_4_ * auVar123._8_4_;
      auVar209._12_4_ = auVar252._12_4_ * auVar123._12_4_;
      auVar123 = vminps_avx(auVar96,auVar209);
      auVar165._0_4_ = auVar134._0_4_ + auVar123._0_4_;
      auVar165._4_4_ = auVar134._4_4_ + auVar123._4_4_;
      auVar165._8_4_ = auVar134._8_4_ + auVar123._8_4_;
      auVar165._12_4_ = auVar134._12_4_ + auVar123._12_4_;
      auVar134 = vmaxps_avx(auVar209,auVar96);
      auVar97._0_4_ = auVar167._0_4_ + auVar134._0_4_;
      auVar97._4_4_ = auVar167._4_4_ + auVar134._4_4_;
      auVar97._8_4_ = auVar167._8_4_ + auVar134._8_4_;
      auVar97._12_4_ = auVar167._12_4_ + auVar134._12_4_;
      auVar167 = vsubps_avx(_local_3e8,auVar97);
      auVar134 = vsubps_avx(_local_3e8,auVar165);
      auVar166._0_4_ = fVar214 * auVar167._0_4_;
      auVar166._4_4_ = fVar217 * auVar167._4_4_;
      auVar166._8_4_ = fVar220 * auVar167._8_4_;
      auVar166._12_4_ = fVar223 * auVar167._12_4_;
      auVar210._0_4_ = fVar214 * auVar134._0_4_;
      auVar210._4_4_ = fVar217 * auVar134._4_4_;
      auVar210._8_4_ = fVar220 * auVar134._8_4_;
      auVar210._12_4_ = fVar223 * auVar134._12_4_;
      auVar98._0_4_ = fVar185 * auVar167._0_4_;
      auVar98._4_4_ = fVar187 * auVar167._4_4_;
      auVar98._8_4_ = fVar189 * auVar167._8_4_;
      auVar98._12_4_ = fVar191 * auVar167._12_4_;
      auVar133._0_4_ = fVar185 * auVar134._0_4_;
      auVar133._4_4_ = fVar187 * auVar134._4_4_;
      auVar133._8_4_ = fVar189 * auVar134._8_4_;
      auVar133._12_4_ = fVar191 * auVar134._12_4_;
      auVar167 = vminps_avx(auVar166,auVar210);
      auVar134 = vminps_avx(auVar98,auVar133);
      auVar167 = vminps_avx(auVar167,auVar134);
      auVar134 = vmaxps_avx(auVar210,auVar166);
      auVar123 = vmaxps_avx(auVar133,auVar98);
      auVar167 = vhaddps_avx(auVar167,auVar167);
      auVar134 = vmaxps_avx(auVar123,auVar134);
      auVar134 = vhaddps_avx(auVar134,auVar134);
      auVar123 = vmovshdup_avx(auVar274);
      auVar157 = ZEXT416((uint)(auVar123._0_4_ + auVar167._0_4_));
      auVar167 = vmaxss_avx(auVar86,auVar157);
      auVar123 = ZEXT416((uint)(auVar123._0_4_ + auVar134._0_4_));
      auVar134 = vminss_avx(auVar123,_local_468);
      auVar332._8_4_ = 0x7fffffff;
      auVar332._0_8_ = 0x7fffffff7fffffff;
      auVar332._12_4_ = 0x7fffffff;
    } while (auVar134._0_4_ < auVar167._0_4_);
    uVar65 = 0;
    if ((fVar108 < fVar109) && (fVar171 < fVar264)) {
      auVar167 = vcmpps_avx(auVar123,_local_468,1);
      auVar134 = vcmpps_avx(auVar86,auVar157,1);
      auVar167 = vandps_avx(auVar134,auVar167);
      uVar65 = auVar167._0_4_;
    }
    if ((3 < (uint)uVar60 || fVar69 < 0.001) || (uVar65 & 1) != 0) {
      lVar61 = 200;
      do {
        fVar69 = auVar274._0_4_;
        fVar264 = 1.0 - fVar69;
        auVar167 = ZEXT416((uint)(fVar264 * fVar264 * fVar264));
        auVar167 = vshufps_avx(auVar167,auVar167,0);
        auVar134 = ZEXT416((uint)(fVar69 * 3.0 * fVar264 * fVar264));
        auVar134 = vshufps_avx(auVar134,auVar134,0);
        auVar123 = ZEXT416((uint)(fVar264 * fVar69 * fVar69 * 3.0));
        auVar123 = vshufps_avx(auVar123,auVar123,0);
        auVar157 = ZEXT416((uint)(fVar69 * fVar69 * fVar69));
        auVar157 = vshufps_avx(auVar157,auVar157,0);
        fVar264 = (float)local_4c8._0_4_ * auVar167._0_4_ +
                  (float)local_438._0_4_ * auVar134._0_4_ +
                  (float)local_298._0_4_ * auVar157._0_4_ + (float)local_448._0_4_ * auVar123._0_4_;
        fVar69 = (float)local_4c8._4_4_ * auVar167._4_4_ +
                 (float)local_438._4_4_ * auVar134._4_4_ +
                 (float)local_298._4_4_ * auVar157._4_4_ + (float)local_448._4_4_ * auVar123._4_4_;
        auVar99._0_8_ = CONCAT44(fVar69,fVar264);
        auVar99._8_4_ =
             fStack_4c0 * auVar167._8_4_ +
             fStack_430 * auVar134._8_4_ + fStack_290 * auVar157._8_4_ + fStack_440 * auVar123._8_4_
        ;
        auVar99._12_4_ =
             fStack_4bc * auVar167._12_4_ +
             fStack_42c * auVar134._12_4_ +
             fStack_28c * auVar157._12_4_ + fStack_43c * auVar123._12_4_;
        auVar135._8_8_ = auVar99._0_8_;
        auVar135._0_8_ = auVar99._0_8_;
        auVar134 = vshufpd_avx(auVar99,auVar99,1);
        auVar167 = vmovshdup_avx(auVar274);
        auVar134 = vsubps_avx(auVar134,auVar135);
        auVar100._0_4_ = auVar167._0_4_ * auVar134._0_4_ + fVar264;
        auVar100._4_4_ = auVar167._4_4_ * auVar134._4_4_ + fVar69;
        auVar100._8_4_ = auVar167._8_4_ * auVar134._8_4_ + fVar264;
        auVar100._12_4_ = auVar167._12_4_ * auVar134._12_4_ + fVar69;
        auVar167 = vshufps_avx(auVar100,auVar100,0);
        auVar134 = vshufps_avx(auVar100,auVar100,0x55);
        auVar136._0_4_ = auVar90._0_4_ * auVar167._0_4_ + auVar247._0_4_ * auVar134._0_4_;
        auVar136._4_4_ = auVar90._4_4_ * auVar167._4_4_ + auVar247._4_4_ * auVar134._4_4_;
        auVar136._8_4_ = auVar90._8_4_ * auVar167._8_4_ + auVar247._8_4_ * auVar134._8_4_;
        auVar136._12_4_ = auVar90._12_4_ * auVar167._12_4_ + auVar247._12_4_ * auVar134._12_4_;
        auVar274 = vsubps_avx(auVar274,auVar136);
        auVar167 = vandps_avx(auVar332,auVar100);
        auVar134 = vshufps_avx(auVar167,auVar167,0xf5);
        auVar167 = vmaxss_avx(auVar134,auVar167);
        if (auVar167._0_4_ < (float)local_2a8._0_4_) {
          fVar264 = auVar274._0_4_;
          if ((0.0 <= fVar264) && (fVar264 <= 1.0)) {
            auVar90 = vmovshdup_avx(auVar274);
            fVar69 = auVar90._0_4_;
            if ((0.0 <= fVar69) && (fVar69 <= 1.0)) {
              auVar90 = vinsertps_avx(ZEXT416((uint)(pre->ray_space).vx.field_0.m128[2]),
                                      ZEXT416((uint)(pre->ray_space).vy.field_0.m128[2]),0x1c);
              auVar252 = vinsertps_avx(auVar90,ZEXT416((uint)(pre->ray_space).vz.field_0.m128[2]),
                                       0x28);
              aVar6 = (ray->org).field_0;
              auVar90 = vsubps_avx(_local_368,(undefined1  [16])aVar6);
              auVar90 = vdpps_avx(auVar90,auVar252,0x7f);
              auVar247 = vsubps_avx(_local_378,(undefined1  [16])aVar6);
              auVar247 = vdpps_avx(auVar247,auVar252,0x7f);
              auVar167 = vsubps_avx(_local_388,(undefined1  [16])aVar6);
              auVar167 = vdpps_avx(auVar167,auVar252,0x7f);
              auVar55._4_4_ = fStack_3f4;
              auVar55._0_4_ = local_3f8;
              auVar55._8_4_ = fStack_3f0;
              auVar55._12_4_ = fStack_3ec;
              auVar134 = vsubps_avx(auVar55,(undefined1  [16])aVar6);
              auVar134 = vdpps_avx(auVar134,auVar252,0x7f);
              auVar123 = vsubps_avx(_local_398,(undefined1  [16])aVar6);
              auVar123 = vdpps_avx(auVar123,auVar252,0x7f);
              auVar157 = vsubps_avx(_local_3a8,(undefined1  [16])aVar6);
              auVar157 = vdpps_avx(auVar157,auVar252,0x7f);
              auVar57._4_4_ = fStack_3b4;
              auVar57._0_4_ = local_3b8;
              auVar57._8_4_ = fStack_3b0;
              auVar57._12_4_ = fStack_3ac;
              auVar124 = vsubps_avx(auVar57,(undefined1  [16])aVar6);
              auVar124 = vdpps_avx(auVar124,auVar252,0x7f);
              auVar14 = vsubps_avx(_local_3c8,(undefined1  [16])aVar6);
              auVar252 = vdpps_avx(auVar14,auVar252,0x7f);
              fVar187 = 1.0 - fVar69;
              fVar189 = 1.0 - fVar264;
              fVar108 = auVar274._4_4_;
              fVar109 = auVar274._8_4_;
              fVar171 = auVar274._12_4_;
              fVar185 = fVar189 * fVar264 * fVar264 * 3.0;
              auVar233._0_4_ = fVar264 * fVar264 * fVar264;
              auVar233._4_4_ = fVar108 * fVar108 * fVar108;
              auVar233._8_4_ = fVar109 * fVar109 * fVar109;
              auVar233._12_4_ = fVar171 * fVar171 * fVar171;
              fVar108 = fVar264 * 3.0 * fVar189 * fVar189;
              fVar109 = fVar189 * fVar189 * fVar189;
              fVar264 = (fVar187 * auVar90._0_4_ + auVar123._0_4_ * fVar69) * fVar109 +
                        fVar108 * (auVar157._0_4_ * fVar69 + fVar187 * auVar247._0_4_) +
                        fVar185 * (auVar124._0_4_ * fVar69 + fVar187 * auVar167._0_4_) +
                        auVar233._0_4_ * (fVar187 * auVar134._0_4_ + fVar69 * auVar252._0_4_);
              if (((ray->org).field_0.m128[3] <= fVar264) && (fVar69 = ray->tfar, fVar264 <= fVar69)
                 ) {
                pGVar8 = (context->scene->geometries).items[local_400].ptr;
                if ((pGVar8->mask & ray->mask) == 0) {
LAB_00fb5f63:
                  bVar58 = 0;
                }
                else if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                        (bVar58 = 1, pGVar8->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                  auVar90 = vshufps_avx(auVar274,auVar274,0x55);
                  auVar281._8_4_ = 0x3f800000;
                  auVar281._0_8_ = 0x3f8000003f800000;
                  auVar281._12_4_ = 0x3f800000;
                  auVar247 = vsubps_avx(auVar281,auVar90);
                  fVar171 = auVar90._0_4_;
                  fVar187 = auVar90._4_4_;
                  fVar191 = auVar90._8_4_;
                  fVar214 = auVar90._12_4_;
                  fVar217 = auVar247._0_4_;
                  fVar220 = auVar247._4_4_;
                  fVar223 = auVar247._8_4_;
                  fVar236 = auVar247._12_4_;
                  auVar292._0_4_ =
                       fVar171 * (float)local_398._0_4_ + fVar217 * (float)local_368._0_4_;
                  auVar292._4_4_ =
                       fVar187 * (float)local_398._4_4_ + fVar220 * (float)local_368._4_4_;
                  auVar292._8_4_ = fVar191 * fStack_390 + fVar223 * fStack_360;
                  auVar292._12_4_ = fVar214 * fStack_38c + fVar236 * fStack_35c;
                  auVar304._0_4_ =
                       fVar171 * (float)local_3a8._0_4_ + fVar217 * (float)local_378._0_4_;
                  auVar304._4_4_ =
                       fVar187 * (float)local_3a8._4_4_ + fVar220 * (float)local_378._4_4_;
                  auVar304._8_4_ = fVar191 * fStack_3a0 + fVar223 * fStack_370;
                  auVar304._12_4_ = fVar214 * fStack_39c + fVar236 * fStack_36c;
                  auVar311._0_4_ = fVar171 * local_3b8 + fVar217 * (float)local_388._0_4_;
                  auVar311._4_4_ = fVar187 * fStack_3b4 + fVar220 * (float)local_388._4_4_;
                  auVar311._8_4_ = fVar191 * fStack_3b0 + fVar223 * fStack_380;
                  auVar311._12_4_ = fVar214 * fStack_3ac + fVar236 * fStack_37c;
                  auVar262._0_4_ = fVar217 * local_3f8 + fVar171 * (float)local_3c8._0_4_;
                  auVar262._4_4_ = fVar220 * fStack_3f4 + fVar187 * (float)local_3c8._4_4_;
                  auVar262._8_4_ = fVar223 * fStack_3f0 + fVar191 * fStack_3c0;
                  auVar262._12_4_ = fVar236 * fStack_3ec + fVar214 * fStack_3bc;
                  auVar134 = vsubps_avx(auVar304,auVar292);
                  auVar123 = vsubps_avx(auVar311,auVar304);
                  auVar157 = vsubps_avx(auVar262,auVar311);
                  auVar90 = vshufps_avx(auVar274,auVar274,0);
                  fVar214 = auVar90._0_4_;
                  fVar217 = auVar90._4_4_;
                  fVar220 = auVar90._8_4_;
                  fVar223 = auVar90._12_4_;
                  auVar90 = vshufps_avx(ZEXT416((uint)fVar189),ZEXT416((uint)fVar189),0);
                  fVar171 = auVar90._0_4_;
                  fVar187 = auVar90._4_4_;
                  fVar189 = auVar90._8_4_;
                  fVar191 = auVar90._12_4_;
                  auVar90 = vshufps_avx(auVar233,auVar233,0);
                  auVar247 = vshufps_avx(ZEXT416((uint)fVar185),ZEXT416((uint)fVar185),0);
                  auVar167 = vshufps_avx(ZEXT416((uint)fVar108),ZEXT416((uint)fVar108),0);
                  auVar211._0_4_ =
                       ((auVar134._0_4_ * fVar171 + fVar214 * auVar123._0_4_) * fVar171 +
                       fVar214 * (auVar123._0_4_ * fVar171 + fVar214 * auVar157._0_4_)) * 3.0;
                  auVar211._4_4_ =
                       ((auVar134._4_4_ * fVar187 + fVar217 * auVar123._4_4_) * fVar187 +
                       fVar217 * (auVar123._4_4_ * fVar187 + fVar217 * auVar157._4_4_)) * 3.0;
                  auVar211._8_4_ =
                       ((auVar134._8_4_ * fVar189 + fVar220 * auVar123._8_4_) * fVar189 +
                       fVar220 * (auVar123._8_4_ * fVar189 + fVar220 * auVar157._8_4_)) * 3.0;
                  auVar211._12_4_ =
                       ((auVar134._12_4_ * fVar191 + fVar223 * auVar123._12_4_) * fVar191 +
                       fVar223 * (auVar123._12_4_ * fVar191 + fVar223 * auVar157._12_4_)) * 3.0;
                  auVar134 = vshufps_avx(ZEXT416((uint)fVar109),ZEXT416((uint)fVar109),0);
                  auVar137._0_4_ =
                       auVar134._0_4_ * (float)local_218._0_4_ +
                       auVar167._0_4_ * (float)local_228._0_4_ +
                       auVar90._0_4_ * (float)local_248._0_4_ +
                       auVar247._0_4_ * (float)local_238._0_4_;
                  auVar137._4_4_ =
                       auVar134._4_4_ * (float)local_218._4_4_ +
                       auVar167._4_4_ * (float)local_228._4_4_ +
                       auVar90._4_4_ * (float)local_248._4_4_ +
                       auVar247._4_4_ * (float)local_238._4_4_;
                  auVar137._8_4_ =
                       auVar134._8_4_ * fStack_210 +
                       auVar167._8_4_ * fStack_220 +
                       auVar90._8_4_ * fStack_240 + auVar247._8_4_ * fStack_230;
                  auVar137._12_4_ =
                       auVar134._12_4_ * fStack_20c +
                       auVar167._12_4_ * fStack_21c +
                       auVar90._12_4_ * fStack_23c + auVar247._12_4_ * fStack_22c;
                  auVar90 = vshufps_avx(auVar211,auVar211,0xc9);
                  auVar168._0_4_ = auVar137._0_4_ * auVar90._0_4_;
                  auVar168._4_4_ = auVar137._4_4_ * auVar90._4_4_;
                  auVar168._8_4_ = auVar137._8_4_ * auVar90._8_4_;
                  auVar168._12_4_ = auVar137._12_4_ * auVar90._12_4_;
                  auVar90 = vshufps_avx(auVar137,auVar137,0xc9);
                  auVar138._0_4_ = auVar211._0_4_ * auVar90._0_4_;
                  auVar138._4_4_ = auVar211._4_4_ * auVar90._4_4_;
                  auVar138._8_4_ = auVar211._8_4_ * auVar90._8_4_;
                  auVar138._12_4_ = auVar211._12_4_ * auVar90._12_4_;
                  auVar247 = vsubps_avx(auVar138,auVar168);
                  auVar90 = vshufps_avx(auVar247,auVar247,0xe9);
                  local_278 = vmovlps_avx(auVar90);
                  local_270 = auVar247._0_4_;
                  local_26c = vmovlps_avx(auVar274);
                  local_264 = (int)local_2e8;
                  local_260 = (int)local_400;
                  local_25c = context->user->instID[0];
                  local_258 = context->user->instPrimID[0];
                  ray->tfar = fVar264;
                  local_4ac = -1;
                  local_2d8.valid = &local_4ac;
                  local_2d8.geometryUserPtr = pGVar8->userPtr;
                  local_2d8.context = context->user;
                  local_2d8.hit = (RTCHitN *)&local_278;
                  local_2d8.N = 1;
                  local_2d8.ray = (RTCRayN *)ray;
                  if (pGVar8->occlusionFilterN == (RTCFilterFunctionN)0x0) {
LAB_00fb5f0f:
                    p_Var13 = context->args->filter;
                    if ((p_Var13 == (RTCFilterFunctionN)0x0) ||
                       ((((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) ==
                          RTC_RAY_QUERY_FLAG_INCOHERENT &&
                         (((pGVar8->field_8).field_0x2 & 0x40) == 0)) ||
                        ((*p_Var13)(&local_2d8), *local_2d8.valid != 0)))) {
                      bVar58 = 1;
                      goto LAB_00fb5f65;
                    }
                  }
                  else {
                    _local_4a8 = ZEXT832((ulong)auVar67);
                    (*pGVar8->occlusionFilterN)(&local_2d8);
                    auVar67 = local_4a8;
                    if (*local_2d8.valid != 0) goto LAB_00fb5f0f;
                  }
                  ray->tfar = fVar69;
                  goto LAB_00fb5f63;
                }
LAB_00fb5f65:
                bVar64 = (bool)(bVar64 | bVar58);
              }
            }
          }
          break;
        }
        lVar61 = lVar61 + -1;
      } while (lVar61 != 0);
      goto LAB_00fb508e;
    }
    auVar90 = vinsertps_avx(ZEXT416((uint)fVar108),ZEXT416((uint)fVar264),0x10);
  } while( true );
}

Assistant:

static __forceinline bool occluded_n(const Precalculations& pre, Ray& ray, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          const TensorLinearCubicBezierSurface3fa curve = geom->getNormalOrientedCurve<typename Intersector::SourceCurve3ff, typename Intersector::SourceCurve3fa, TensorLinearCubicBezierSurface3fa>(context, ray.org, primID,ray.time());

          if (Intersector().intersect(pre,ray,context,geom,primID,curve,Epilog(ray,context,geomID,primID)))
              return true;

          mask &= movemask(tNear <= vfloat<M>(ray.tfar));
        }
        return false;
      }